

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined8 uVar4;
  ulong uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  uint uVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  uint uVar85;
  byte bVar87;
  undefined4 uVar88;
  undefined8 unaff_RBP;
  long lVar89;
  long lVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar102 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar127;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  undefined1 auVar153 [32];
  undefined1 auVar133 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar134 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vfloat4 a0_1;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float t1;
  float fVar195;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar213;
  float fVar214;
  float fVar238;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar234;
  float fVar236;
  float fVar240;
  float fVar241;
  undefined1 auVar230 [32];
  float fVar242;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar243;
  float fVar255;
  float fVar256;
  vfloat4 b0;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar258;
  float fVar259;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar260;
  float fVar261;
  float fVar272;
  float fVar274;
  undefined1 auVar262 [16];
  float fVar273;
  float fVar275;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar276;
  float fVar278;
  float fVar279;
  undefined1 auVar269 [32];
  undefined1 auVar277 [16];
  undefined1 auVar271 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [64];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar301 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [64];
  undefined1 auVar313 [16];
  float fVar312;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar314 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  __m128 a;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar330 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [64];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  float fVar367;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar371;
  undefined1 auVar365 [64];
  undefined1 auVar372 [16];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar377;
  undefined1 auVar376 [64];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  float fVar387;
  undefined1 auVar385 [32];
  float fVar392;
  vfloat4 a0;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  int local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 auStack_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  ulong local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 auStack_318 [16];
  Primitive *local_300;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  uint auStack_2b8 [4];
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_29c;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float afStack_1d8 [8];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar86;
  undefined1 auVar270 [32];
  undefined1 auVar386 [32];
  
  PVar15 = prim[1];
  uVar83 = (ulong)(byte)PVar15;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar328 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 10)));
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar355 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 10)));
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  lVar90 = uVar83 * 0x25;
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 10)));
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 10)));
  auVar277 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar15 * 0x10 + 6)));
  auVar324 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar15 * 0x10 + 10)));
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 6)));
  auVar360 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x11 + 10)));
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 10)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 10)));
  auVar363._16_16_ = auVar328;
  auVar363._0_16_ = auVar106;
  auVar190._16_16_ = auVar355;
  auVar190._0_16_ = auVar188;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar328 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 10)));
  auVar230._16_16_ = auVar136;
  auVar230._0_16_ = auVar148;
  fVar213 = *(float *)(prim + lVar90 + 0x12);
  auVar251._16_16_ = auVar137;
  auVar251._0_16_ = auVar174;
  auVar188 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar90 + 6));
  local_4e8._4_4_ = fVar213 * auVar188._4_4_;
  local_4e8._0_4_ = fVar213 * auVar188._0_4_;
  fStack_4e0 = fVar213 * auVar188._8_4_;
  fStack_4dc = fVar213 * auVar188._12_4_;
  auVar262._0_4_ = fVar213 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar262._4_4_ = fVar213 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar262._8_4_ = fVar213 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar262._12_4_ = fVar213 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar118 = vcvtdq2ps_avx(auVar190);
  auVar22 = vcvtdq2ps_avx(auVar230);
  auVar305._16_16_ = auVar324;
  auVar305._0_16_ = auVar277;
  auVar23 = vcvtdq2ps_avx(auVar305);
  auVar289._16_16_ = auVar360;
  auVar289._0_16_ = auVar30;
  auVar24 = vcvtdq2ps_avx(auVar289);
  auVar345._16_16_ = auVar32;
  auVar345._0_16_ = auVar31;
  auVar373._16_16_ = auVar34;
  auVar373._0_16_ = auVar33;
  auVar306._16_16_ = auVar328;
  auVar306._0_16_ = auVar106;
  auVar106 = vshufps_avx(auVar262,auVar262,0x55);
  auVar328 = vshufps_avx(auVar262,auVar262,0xaa);
  fVar212 = auVar328._0_4_;
  fVar238 = auVar328._4_4_;
  fVar257 = auVar328._8_4_;
  fVar127 = auVar328._12_4_;
  fVar255 = auVar106._0_4_;
  fVar195 = auVar106._4_4_;
  fVar236 = auVar106._8_4_;
  fVar256 = auVar106._12_4_;
  auVar25 = vcvtdq2ps_avx(auVar363);
  auVar26 = vcvtdq2ps_avx(auVar251);
  auVar27 = vcvtdq2ps_avx(auVar345);
  auVar28 = vcvtdq2ps_avx(auVar373);
  auVar29 = vcvtdq2ps_avx(auVar306);
  auVar106 = vshufps_avx(auVar262,auVar262,0);
  fVar387 = auVar34._12_4_ + auVar32._12_4_;
  fVar213 = auVar106._0_4_;
  fVar243 = auVar106._4_4_;
  fVar161 = auVar106._8_4_;
  fVar234 = auVar106._12_4_;
  auVar374._0_4_ = auVar25._0_4_ * fVar213 + fVar255 * auVar118._0_4_ + fVar212 * auVar22._0_4_;
  auVar374._4_4_ = auVar25._4_4_ * fVar243 + fVar195 * auVar118._4_4_ + fVar238 * auVar22._4_4_;
  auVar374._8_4_ = auVar25._8_4_ * fVar161 + fVar236 * auVar118._8_4_ + fVar257 * auVar22._8_4_;
  auVar374._12_4_ = auVar25._12_4_ * fVar234 + fVar256 * auVar118._12_4_ + fVar127 * auVar22._12_4_;
  auVar374._16_4_ = auVar25._16_4_ * fVar213 + fVar255 * auVar118._16_4_ + fVar212 * auVar22._16_4_;
  auVar374._20_4_ = auVar25._20_4_ * fVar243 + fVar195 * auVar118._20_4_ + fVar238 * auVar22._20_4_;
  auVar374._24_4_ = auVar25._24_4_ * fVar161 + fVar236 * auVar118._24_4_ + fVar257 * auVar22._24_4_;
  auVar374._28_4_ = auVar32._12_4_ + 0.0;
  auVar346._0_4_ = auVar26._0_4_ * fVar213 + fVar212 * auVar24._0_4_ + fVar255 * auVar23._0_4_;
  auVar346._4_4_ = auVar26._4_4_ * fVar243 + fVar238 * auVar24._4_4_ + fVar195 * auVar23._4_4_;
  auVar346._8_4_ = auVar26._8_4_ * fVar161 + fVar257 * auVar24._8_4_ + fVar236 * auVar23._8_4_;
  auVar346._12_4_ = auVar26._12_4_ * fVar234 + fVar127 * auVar24._12_4_ + fVar256 * auVar23._12_4_;
  auVar346._16_4_ = auVar26._16_4_ * fVar213 + fVar212 * auVar24._16_4_ + fVar255 * auVar23._16_4_;
  auVar346._20_4_ = auVar26._20_4_ * fVar243 + fVar238 * auVar24._20_4_ + fVar195 * auVar23._20_4_;
  auVar346._24_4_ = auVar26._24_4_ * fVar161 + fVar257 * auVar24._24_4_ + fVar236 * auVar23._24_4_;
  auVar346._28_4_ = 0;
  auVar269._0_4_ = fVar255 * auVar28._0_4_ + fVar212 * auVar29._0_4_ + fVar213 * auVar27._0_4_;
  auVar269._4_4_ = fVar195 * auVar28._4_4_ + fVar238 * auVar29._4_4_ + fVar243 * auVar27._4_4_;
  auVar269._8_4_ = fVar236 * auVar28._8_4_ + fVar257 * auVar29._8_4_ + fVar161 * auVar27._8_4_;
  auVar269._12_4_ = fVar256 * auVar28._12_4_ + fVar127 * auVar29._12_4_ + fVar234 * auVar27._12_4_;
  auVar269._16_4_ = fVar255 * auVar28._16_4_ + fVar212 * auVar29._16_4_ + fVar213 * auVar27._16_4_;
  auVar269._20_4_ = fVar195 * auVar28._20_4_ + fVar238 * auVar29._20_4_ + fVar243 * auVar27._20_4_;
  auVar269._24_4_ = fVar236 * auVar28._24_4_ + fVar257 * auVar29._24_4_ + fVar161 * auVar27._24_4_;
  auVar269._28_4_ = fVar387 + 0.0;
  auVar106 = vshufps_avx(_local_4e8,_local_4e8,0x55);
  auVar328 = vshufps_avx(_local_4e8,_local_4e8,0xaa);
  fVar212 = auVar328._0_4_;
  fVar238 = auVar328._4_4_;
  fVar257 = auVar328._8_4_;
  fVar127 = auVar328._12_4_;
  fVar255 = auVar106._0_4_;
  fVar195 = auVar106._4_4_;
  fVar236 = auVar106._8_4_;
  fVar256 = auVar106._12_4_;
  fVar242 = auVar24._28_4_ + auVar22._28_4_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar328._8_8_ = 0;
  auVar328._0_8_ = *(ulong *)(prim + uVar83 * 7 + 0xe);
  auVar328 = vpmovsxwd_avx(auVar328);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar355._8_8_ = 0;
  auVar355._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 0xe);
  auVar355 = vpmovsxwd_avx(auVar355);
  auVar148 = vshufps_avx(_local_4e8,_local_4e8,0);
  fVar213 = auVar148._0_4_;
  fVar243 = auVar148._4_4_;
  fVar161 = auVar148._8_4_;
  fVar234 = auVar148._12_4_;
  auVar153._0_4_ = auVar25._0_4_ * fVar213 + fVar255 * auVar118._0_4_ + fVar212 * auVar22._0_4_;
  auVar153._4_4_ = auVar25._4_4_ * fVar243 + fVar195 * auVar118._4_4_ + fVar238 * auVar22._4_4_;
  auVar153._8_4_ = auVar25._8_4_ * fVar161 + fVar236 * auVar118._8_4_ + fVar257 * auVar22._8_4_;
  auVar153._12_4_ = auVar25._12_4_ * fVar234 + fVar256 * auVar118._12_4_ + fVar127 * auVar22._12_4_;
  auVar153._16_4_ = auVar25._16_4_ * fVar213 + fVar255 * auVar118._16_4_ + fVar212 * auVar22._16_4_;
  auVar153._20_4_ = auVar25._20_4_ * fVar243 + fVar195 * auVar118._20_4_ + fVar238 * auVar22._20_4_;
  auVar153._24_4_ = auVar25._24_4_ * fVar161 + fVar236 * auVar118._24_4_ + fVar257 * auVar22._24_4_;
  auVar153._28_4_ = fVar256 + fVar242;
  local_508._4_4_ = fVar195 * auVar23._4_4_ + fVar238 * auVar24._4_4_ + auVar26._4_4_ * fVar243;
  local_508._0_4_ = fVar255 * auVar23._0_4_ + fVar212 * auVar24._0_4_ + auVar26._0_4_ * fVar213;
  fStack_500 = fVar236 * auVar23._8_4_ + fVar257 * auVar24._8_4_ + auVar26._8_4_ * fVar161;
  fStack_4fc = fVar256 * auVar23._12_4_ + fVar127 * auVar24._12_4_ + auVar26._12_4_ * fVar234;
  fStack_4f8 = fVar255 * auVar23._16_4_ + fVar212 * auVar24._16_4_ + auVar26._16_4_ * fVar213;
  fStack_4f4 = fVar195 * auVar23._20_4_ + fVar238 * auVar24._20_4_ + auVar26._20_4_ * fVar243;
  fStack_4f0 = fVar236 * auVar23._24_4_ + fVar257 * auVar24._24_4_ + auVar26._24_4_ * fVar161;
  fStack_4ec = auVar29._28_4_ + fVar387 + fVar242;
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar231._16_4_ = 0x7fffffff;
  auVar231._20_4_ = 0x7fffffff;
  auVar231._24_4_ = 0x7fffffff;
  auVar231._28_4_ = 0x7fffffff;
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar252._16_4_ = 0x219392ef;
  auVar252._20_4_ = 0x219392ef;
  auVar252._24_4_ = 0x219392ef;
  auVar252._28_4_ = 0x219392ef;
  auVar118 = vandps_avx(auVar374,auVar231);
  auVar118 = vcmpps_avx(auVar118,auVar252,1);
  auVar22 = vblendvps_avx(auVar374,auVar252,auVar118);
  auVar118 = vandps_avx(auVar346,auVar231);
  auVar118 = vcmpps_avx(auVar118,auVar252,1);
  auVar23 = vblendvps_avx(auVar346,auVar252,auVar118);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar148 = vpmovsxwd_avx(auVar148);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar83 * 9 + 0xe);
  auVar136 = vpmovsxwd_avx(auVar136);
  auVar118 = vandps_avx(auVar269,auVar231);
  auVar24 = vcmpps_avx(auVar118,auVar252,1);
  auVar118 = vblendvps_avx(auVar269,auVar252,auVar24);
  auVar191._0_4_ = fVar213 * auVar27._0_4_ + auVar28._0_4_ * fVar255 + auVar29._0_4_ * fVar212;
  auVar191._4_4_ = fVar243 * auVar27._4_4_ + auVar28._4_4_ * fVar195 + auVar29._4_4_ * fVar238;
  auVar191._8_4_ = fVar161 * auVar27._8_4_ + auVar28._8_4_ * fVar236 + auVar29._8_4_ * fVar257;
  auVar191._12_4_ = fVar234 * auVar27._12_4_ + auVar28._12_4_ * fVar256 + auVar29._12_4_ * fVar127;
  auVar191._16_4_ = fVar213 * auVar27._16_4_ + auVar28._16_4_ * fVar255 + auVar29._16_4_ * fVar212;
  auVar191._20_4_ = fVar243 * auVar27._20_4_ + auVar28._20_4_ * fVar195 + auVar29._20_4_ * fVar238;
  auVar191._24_4_ = fVar161 * auVar27._24_4_ + auVar28._24_4_ * fVar236 + auVar29._24_4_ * fVar257;
  auVar191._28_4_ = fVar234 + fVar256 + fVar127;
  auVar25 = vrcpps_avx(auVar22);
  fVar213 = auVar25._0_4_;
  fVar234 = auVar25._4_4_;
  auVar26._4_4_ = auVar22._4_4_ * fVar234;
  auVar26._0_4_ = auVar22._0_4_ * fVar213;
  fVar236 = auVar25._8_4_;
  auVar26._8_4_ = auVar22._8_4_ * fVar236;
  fVar238 = auVar25._12_4_;
  auVar26._12_4_ = auVar22._12_4_ * fVar238;
  fVar242 = auVar25._16_4_;
  auVar26._16_4_ = auVar22._16_4_ * fVar242;
  fVar240 = auVar25._20_4_;
  auVar26._20_4_ = auVar22._20_4_ * fVar240;
  fVar241 = auVar25._24_4_;
  auVar26._24_4_ = auVar22._24_4_ * fVar241;
  auVar26._28_4_ = auVar24._28_4_;
  auVar307._8_4_ = 0x3f800000;
  auVar307._0_8_ = 0x3f8000003f800000;
  auVar307._12_4_ = 0x3f800000;
  auVar307._16_4_ = 0x3f800000;
  auVar307._20_4_ = 0x3f800000;
  auVar307._24_4_ = 0x3f800000;
  auVar307._28_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar307,auVar26);
  auVar24 = vrcpps_avx(auVar23);
  fVar213 = fVar213 + fVar213 * auVar26._0_4_;
  fVar234 = fVar234 + fVar234 * auVar26._4_4_;
  fVar236 = fVar236 + fVar236 * auVar26._8_4_;
  fVar238 = fVar238 + fVar238 * auVar26._12_4_;
  fVar242 = fVar242 + fVar242 * auVar26._16_4_;
  fVar240 = fVar240 + fVar240 * auVar26._20_4_;
  fVar241 = fVar241 + fVar241 * auVar26._24_4_;
  fVar243 = auVar24._0_4_;
  fVar255 = auVar24._4_4_;
  auVar22._4_4_ = auVar23._4_4_ * fVar255;
  auVar22._0_4_ = auVar23._0_4_ * fVar243;
  fVar256 = auVar24._8_4_;
  auVar22._8_4_ = auVar23._8_4_ * fVar256;
  fVar257 = auVar24._12_4_;
  auVar22._12_4_ = auVar23._12_4_ * fVar257;
  fVar387 = auVar24._16_4_;
  auVar22._16_4_ = auVar23._16_4_ * fVar387;
  fVar258 = auVar24._20_4_;
  auVar22._20_4_ = auVar23._20_4_ * fVar258;
  fVar259 = auVar24._24_4_;
  auVar22._24_4_ = auVar23._24_4_ * fVar259;
  auVar22._28_4_ = auVar25._28_4_;
  auVar23 = vsubps_avx(auVar307,auVar22);
  fVar243 = fVar243 + fVar243 * auVar23._0_4_;
  fVar255 = fVar255 + fVar255 * auVar23._4_4_;
  fVar256 = fVar256 + fVar256 * auVar23._8_4_;
  fVar257 = fVar257 + fVar257 * auVar23._12_4_;
  fVar387 = fVar387 + fVar387 * auVar23._16_4_;
  fVar258 = fVar258 + fVar258 * auVar23._20_4_;
  fVar259 = fVar259 + fVar259 * auVar23._24_4_;
  auVar22 = vrcpps_avx(auVar118);
  fVar260 = auVar22._0_4_;
  fVar272 = auVar22._4_4_;
  auVar27._4_4_ = fVar272 * auVar118._4_4_;
  auVar27._0_4_ = fVar260 * auVar118._0_4_;
  fVar274 = auVar22._8_4_;
  auVar27._8_4_ = fVar274 * auVar118._8_4_;
  fVar275 = auVar22._12_4_;
  auVar27._12_4_ = fVar275 * auVar118._12_4_;
  fVar276 = auVar22._16_4_;
  auVar27._16_4_ = fVar276 * auVar118._16_4_;
  fVar278 = auVar22._20_4_;
  auVar27._20_4_ = fVar278 * auVar118._20_4_;
  fVar279 = auVar22._24_4_;
  auVar27._24_4_ = fVar279 * auVar118._24_4_;
  auVar27._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(auVar307,auVar27);
  fVar260 = fVar260 + fVar260 * auVar118._0_4_;
  fVar272 = fVar272 + fVar272 * auVar118._4_4_;
  fVar274 = fVar274 + fVar274 * auVar118._8_4_;
  fVar275 = fVar275 + fVar275 * auVar118._12_4_;
  fVar276 = fVar276 + fVar276 * auVar118._16_4_;
  fVar278 = fVar278 + fVar278 * auVar118._20_4_;
  fVar279 = fVar279 + fVar279 * auVar118._24_4_;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar174 = vpmovsxwd_avx(auVar174);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 0xe);
  auVar137 = vpmovsxwd_avx(auVar137);
  auVar290._16_16_ = auVar328;
  auVar290._0_16_ = auVar106;
  auVar347._16_16_ = auVar355;
  auVar347._0_16_ = auVar188;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar106 = vpmovsxwd_avx(auVar277);
  auVar324._8_8_ = 0;
  auVar324._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 0xe);
  auVar328 = vpmovsxwd_avx(auVar324);
  auVar188 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar90 + 0x16)) * *(float *)(prim + lVar90 + 0x1a)));
  auVar188 = vshufps_avx(auVar188,auVar188,0);
  auVar118 = vcvtdq2ps_avx(auVar290);
  auVar22 = vcvtdq2ps_avx(auVar347);
  auVar22 = vsubps_avx(auVar22,auVar118);
  fVar161 = auVar188._0_4_;
  fVar195 = auVar188._4_4_;
  fVar212 = auVar188._8_4_;
  fVar127 = auVar188._12_4_;
  auVar291._0_4_ = auVar22._0_4_ * fVar161 + auVar118._0_4_;
  auVar291._4_4_ = auVar22._4_4_ * fVar195 + auVar118._4_4_;
  auVar291._8_4_ = auVar22._8_4_ * fVar212 + auVar118._8_4_;
  auVar291._12_4_ = auVar22._12_4_ * fVar127 + auVar118._12_4_;
  auVar291._16_4_ = auVar22._16_4_ * fVar161 + auVar118._16_4_;
  auVar291._20_4_ = auVar22._20_4_ * fVar195 + auVar118._20_4_;
  auVar291._24_4_ = auVar22._24_4_ * fVar212 + auVar118._24_4_;
  auVar291._28_4_ = auVar22._28_4_ + auVar118._28_4_;
  auVar318._16_16_ = auVar136;
  auVar318._0_16_ = auVar148;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 6);
  auVar188 = vpmovsxwd_avx(auVar30);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = *(ulong *)(prim + uVar83 * 0x16 + 0xe);
  auVar355 = vpmovsxwd_avx(auVar360);
  auVar118 = vcvtdq2ps_avx(auVar318);
  auVar117._16_16_ = auVar137;
  auVar117._0_16_ = auVar174;
  auVar22 = vcvtdq2ps_avx(auVar117);
  auVar22 = vsubps_avx(auVar22,auVar118);
  auVar308._0_4_ = auVar118._0_4_ + fVar161 * auVar22._0_4_;
  auVar308._4_4_ = auVar118._4_4_ + fVar195 * auVar22._4_4_;
  auVar308._8_4_ = auVar118._8_4_ + fVar212 * auVar22._8_4_;
  auVar308._12_4_ = auVar118._12_4_ + fVar127 * auVar22._12_4_;
  auVar308._16_4_ = auVar118._16_4_ + fVar161 * auVar22._16_4_;
  auVar308._20_4_ = auVar118._20_4_ + fVar195 * auVar22._20_4_;
  auVar308._24_4_ = auVar118._24_4_ + fVar212 * auVar22._24_4_;
  auVar308._28_4_ = auVar118._28_4_ + auVar22._28_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar148 = vpmovsxwd_avx(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 0xe);
  auVar136 = vpmovsxwd_avx(auVar32);
  auVar319._16_16_ = auVar328;
  auVar319._0_16_ = auVar106;
  auVar334._16_16_ = auVar355;
  auVar334._0_16_ = auVar188;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar106 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 0xe);
  auVar328 = vpmovsxwd_avx(auVar34);
  auVar118 = vcvtdq2ps_avx(auVar319);
  auVar22 = vcvtdq2ps_avx(auVar334);
  auVar22 = vsubps_avx(auVar22,auVar118);
  auVar320._0_4_ = auVar118._0_4_ + auVar22._0_4_ * fVar161;
  auVar320._4_4_ = auVar118._4_4_ + auVar22._4_4_ * fVar195;
  auVar320._8_4_ = auVar118._8_4_ + auVar22._8_4_ * fVar212;
  auVar320._12_4_ = auVar118._12_4_ + auVar22._12_4_ * fVar127;
  auVar320._16_4_ = auVar118._16_4_ + auVar22._16_4_ * fVar161;
  auVar320._20_4_ = auVar118._20_4_ + auVar22._20_4_ * fVar195;
  auVar320._24_4_ = auVar118._24_4_ + auVar22._24_4_ * fVar212;
  auVar320._28_4_ = auVar118._28_4_ + auVar22._28_4_;
  auVar118._16_16_ = auVar136;
  auVar118._0_16_ = auVar148;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar188 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 0xe);
  auVar355 = vpmovsxwd_avx(auVar8);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar348._16_16_ = auVar328;
  auVar348._0_16_ = auVar106;
  auVar22 = vcvtdq2ps_avx(auVar348);
  auVar22 = vsubps_avx(auVar22,auVar118);
  auVar119._0_4_ = auVar22._0_4_ * fVar161 + auVar118._0_4_;
  auVar119._4_4_ = auVar22._4_4_ * fVar195 + auVar118._4_4_;
  auVar119._8_4_ = auVar22._8_4_ * fVar212 + auVar118._8_4_;
  auVar119._12_4_ = auVar22._12_4_ * fVar127 + auVar118._12_4_;
  auVar119._16_4_ = auVar22._16_4_ * fVar161 + auVar118._16_4_;
  auVar119._20_4_ = auVar22._20_4_ * fVar195 + auVar118._20_4_;
  auVar119._24_4_ = auVar22._24_4_ * fVar212 + auVar118._24_4_;
  auVar119._28_4_ = auVar22._28_4_ + auVar118._28_4_;
  auVar335._16_16_ = auVar355;
  auVar335._0_16_ = auVar188;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 6);
  auVar106 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar83 * 0x21 + 0xe);
  auVar328 = vpmovsxwd_avx(auVar10);
  auVar118 = vcvtdq2ps_avx(auVar335);
  auVar349._16_16_ = auVar328;
  auVar349._0_16_ = auVar106;
  auVar22 = vcvtdq2ps_avx(auVar349);
  auVar22 = vsubps_avx(auVar22,auVar118);
  auVar336._0_4_ = auVar118._0_4_ + auVar22._0_4_ * fVar161;
  auVar336._4_4_ = auVar118._4_4_ + auVar22._4_4_ * fVar195;
  auVar336._8_4_ = auVar118._8_4_ + auVar22._8_4_ * fVar212;
  auVar336._12_4_ = auVar118._12_4_ + auVar22._12_4_ * fVar127;
  auVar336._16_4_ = auVar118._16_4_ + auVar22._16_4_ * fVar161;
  auVar336._20_4_ = auVar118._20_4_ + auVar22._20_4_ * fVar195;
  auVar336._24_4_ = auVar118._24_4_ + auVar22._24_4_ * fVar212;
  auVar336._28_4_ = auVar118._28_4_ + auVar22._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 6);
  auVar106 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 * 0x1f + 0xe);
  auVar328 = vpmovsxwd_avx(auVar12);
  auVar350._16_16_ = auVar328;
  auVar350._0_16_ = auVar106;
  auVar118 = vcvtdq2ps_avx(auVar350);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar106 = vpmovsxwd_avx(auVar13);
  local_300 = prim;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 0xe);
  auVar328 = vpmovsxwd_avx(auVar14);
  auVar364._16_16_ = auVar328;
  auVar364._0_16_ = auVar106;
  auVar22 = vcvtdq2ps_avx(auVar364);
  auVar22 = vsubps_avx(auVar22,auVar118);
  auVar351._0_4_ = auVar118._0_4_ + auVar22._0_4_ * fVar161;
  auVar351._4_4_ = auVar118._4_4_ + auVar22._4_4_ * fVar195;
  auVar351._8_4_ = auVar118._8_4_ + auVar22._8_4_ * fVar212;
  auVar351._12_4_ = auVar118._12_4_ + auVar22._12_4_ * fVar127;
  auVar351._16_4_ = auVar118._16_4_ + auVar22._16_4_ * fVar161;
  auVar351._20_4_ = auVar118._20_4_ + auVar22._20_4_ * fVar195;
  auVar351._24_4_ = auVar118._24_4_ + auVar22._24_4_ * fVar212;
  auVar351._28_4_ = auVar118._28_4_ + fVar127;
  auVar118 = vsubps_avx(auVar291,auVar153);
  auVar196._0_4_ = fVar213 * auVar118._0_4_;
  auVar196._4_4_ = fVar234 * auVar118._4_4_;
  auVar196._8_4_ = fVar236 * auVar118._8_4_;
  auVar196._12_4_ = fVar238 * auVar118._12_4_;
  auVar28._16_4_ = fVar242 * auVar118._16_4_;
  auVar28._0_16_ = auVar196;
  auVar28._20_4_ = fVar240 * auVar118._20_4_;
  auVar28._24_4_ = fVar241 * auVar118._24_4_;
  auVar28._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(auVar308,auVar153);
  auVar215._0_4_ = fVar213 * auVar118._0_4_;
  auVar215._4_4_ = fVar234 * auVar118._4_4_;
  auVar215._8_4_ = fVar236 * auVar118._8_4_;
  auVar215._12_4_ = fVar238 * auVar118._12_4_;
  auVar29._16_4_ = fVar242 * auVar118._16_4_;
  auVar29._0_16_ = auVar215;
  auVar29._20_4_ = fVar240 * auVar118._20_4_;
  auVar29._24_4_ = fVar241 * auVar118._24_4_;
  auVar29._28_4_ = auVar25._28_4_ + auVar26._28_4_;
  auVar118 = vsubps_avx(auVar320,_local_508);
  auVar128._0_4_ = fVar243 * auVar118._0_4_;
  auVar128._4_4_ = fVar255 * auVar118._4_4_;
  auVar128._8_4_ = fVar256 * auVar118._8_4_;
  auVar128._12_4_ = fVar257 * auVar118._12_4_;
  auVar25._16_4_ = fVar387 * auVar118._16_4_;
  auVar25._0_16_ = auVar128;
  auVar25._20_4_ = fVar258 * auVar118._20_4_;
  auVar25._24_4_ = fVar259 * auVar118._24_4_;
  auVar25._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(auVar119,_local_508);
  auVar244._0_4_ = fVar243 * auVar118._0_4_;
  auVar244._4_4_ = fVar255 * auVar118._4_4_;
  auVar244._8_4_ = fVar256 * auVar118._8_4_;
  auVar244._12_4_ = fVar257 * auVar118._12_4_;
  auVar35._16_4_ = fVar387 * auVar118._16_4_;
  auVar35._0_16_ = auVar244;
  auVar35._20_4_ = fVar258 * auVar118._20_4_;
  auVar35._24_4_ = fVar259 * auVar118._24_4_;
  auVar35._28_4_ = auVar24._28_4_ + auVar23._28_4_;
  auVar118 = vsubps_avx(auVar336,auVar191);
  auVar91._0_4_ = fVar260 * auVar118._0_4_;
  auVar91._4_4_ = fVar272 * auVar118._4_4_;
  auVar91._8_4_ = fVar274 * auVar118._8_4_;
  auVar91._12_4_ = fVar275 * auVar118._12_4_;
  auVar23._16_4_ = fVar276 * auVar118._16_4_;
  auVar23._0_16_ = auVar91;
  auVar23._20_4_ = fVar278 * auVar118._20_4_;
  auVar23._24_4_ = fVar279 * auVar118._24_4_;
  auVar23._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(auVar351,auVar191);
  auVar162._0_4_ = fVar260 * auVar118._0_4_;
  auVar162._4_4_ = fVar272 * auVar118._4_4_;
  auVar162._8_4_ = fVar274 * auVar118._8_4_;
  auVar162._12_4_ = fVar275 * auVar118._12_4_;
  auVar24._16_4_ = fVar276 * auVar118._16_4_;
  auVar24._0_16_ = auVar162;
  auVar24._20_4_ = fVar278 * auVar118._20_4_;
  auVar24._24_4_ = fVar279 * auVar118._24_4_;
  auVar24._28_4_ = auVar118._28_4_;
  auVar106 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar328 = vpminsd_avx(auVar196,auVar215);
  auVar337._16_16_ = auVar106;
  auVar337._0_16_ = auVar328;
  auVar106 = vpminsd_avx(auVar25._16_16_,auVar35._16_16_);
  auVar328 = vpminsd_avx(auVar128,auVar244);
  auVar352._16_16_ = auVar106;
  auVar352._0_16_ = auVar328;
  auVar118 = vmaxps_avx(auVar337,auVar352);
  auVar106 = vpminsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar328 = vpminsd_avx(auVar91,auVar162);
  auVar375._16_16_ = auVar106;
  auVar375._0_16_ = auVar328;
  uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar385._4_4_ = uVar88;
  auVar385._0_4_ = uVar88;
  auVar385._8_4_ = uVar88;
  auVar385._12_4_ = uVar88;
  auVar385._16_4_ = uVar88;
  auVar385._20_4_ = uVar88;
  auVar385._24_4_ = uVar88;
  auVar385._28_4_ = uVar88;
  auVar22 = vmaxps_avx(auVar375,auVar385);
  auVar118 = vmaxps_avx(auVar118,auVar22);
  local_1b8._4_4_ = auVar118._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar118._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar118._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar118._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar118._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar118._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar118._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar118._28_4_;
  auVar106 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar328 = vpmaxsd_avx(auVar196,auVar215);
  auVar209._16_16_ = auVar106;
  auVar209._0_16_ = auVar328;
  auVar106 = vpmaxsd_avx(auVar25._16_16_,auVar35._16_16_);
  auVar328 = vpmaxsd_avx(auVar128,auVar244);
  auVar154._16_16_ = auVar106;
  auVar154._0_16_ = auVar328;
  auVar118 = vminps_avx(auVar209,auVar154);
  auVar106 = vpmaxsd_avx(auVar23._16_16_,auVar24._16_16_);
  auVar328 = vpmaxsd_avx(auVar91,auVar162);
  fVar213 = (ray->super_RayK<1>).tfar;
  auVar192._4_4_ = fVar213;
  auVar192._0_4_ = fVar213;
  auVar192._8_4_ = fVar213;
  auVar192._12_4_ = fVar213;
  auVar192._16_4_ = fVar213;
  auVar192._20_4_ = fVar213;
  auVar192._24_4_ = fVar213;
  auVar192._28_4_ = fVar213;
  auVar120._16_16_ = auVar106;
  auVar120._0_16_ = auVar328;
  auVar22 = vminps_avx(auVar120,auVar192);
  auVar118 = vminps_avx(auVar118,auVar22);
  auVar36._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar118._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar118._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar118._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar118._28_4_;
  auVar118 = vcmpps_avx(local_1b8,auVar36,2);
  auVar106 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar155._16_16_ = auVar106;
  auVar155._0_16_ = auVar106;
  auVar22 = vcvtdq2ps_avx(auVar155);
  auVar22 = vcmpps_avx(_DAT_01f7b060,auVar22,1);
  auVar118 = vandps_avx(auVar118,auVar22);
  auVar156._16_16_ = mm_lookupmask_ps._240_16_;
  auVar156._0_16_ = mm_lookupmask_ps._240_16_;
  uVar88 = vmovmskps_avx(auVar118);
  uVar83 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar88);
  local_198 = vblendps_avx(auVar156,ZEXT832(0) << 0x20,0x80);
  auVar106 = (undefined1  [16])0x0;
LAB_00b4fd11:
  if (uVar83 == 0) {
    return;
  }
  lVar90 = 0;
  if (uVar83 != 0) {
    for (; (uVar83 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  uVar82 = *(uint *)(local_300 + 2);
  pGVar16 = (context->scene->geometries).items[uVar82].ptr;
  fVar213 = (pGVar16->time_range).lower;
  fVar213 = pGVar16->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar213) /
            ((pGVar16->time_range).upper - fVar213));
  auVar328 = vroundss_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),9);
  auVar328 = vminss_avx(auVar328,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
  auVar106 = vmaxss_avx(auVar106,auVar328);
  local_410 = (ulong)*(uint *)(local_300 + lVar90 * 4 + 6);
  uVar84 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                           (ulong)*(uint *)(local_300 + lVar90 * 4 + 6) *
                           pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar106._0_4_ * 0x38;
  lVar18 = *(long *)(_Var17 + lVar89);
  lVar19 = *(long *)(_Var17 + 0x10 + lVar89);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar84);
  fVar243 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar255 = pfVar3[3];
  lVar90 = uVar84 + 1;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar90);
  fVar195 = *pfVar3;
  fVar236 = pfVar3[1];
  fVar256 = pfVar3[2];
  fVar212 = pfVar3[3];
  lVar1 = uVar84 + 2;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar238 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar127 = pfVar3[2];
  fVar242 = pfVar3[3];
  lVar2 = uVar84 + 3;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar387 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar258 = pfVar3[2];
  fVar241 = pfVar3[3];
  lVar18 = *(long *)&pGVar16[4].fnumTimeSegments;
  lVar19 = *(long *)(lVar18 + lVar89);
  lVar20 = *(long *)(lVar18 + 0x10 + lVar89);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar84);
  fVar259 = *pfVar3;
  fVar260 = pfVar3[1];
  fVar272 = pfVar3[2];
  fVar274 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar90);
  fVar275 = *pfVar3;
  fVar276 = pfVar3[1];
  fVar278 = pfVar3[2];
  fVar279 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar366 = *pfVar3;
  fVar311 = pfVar3[1];
  fVar367 = pfVar3[2];
  fVar312 = pfVar3[3];
  fVar213 = fVar213 - auVar106._0_4_;
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar214 = *pfVar3;
  fVar235 = pfVar3[1];
  fVar237 = pfVar3[2];
  fVar239 = pfVar3[3];
  auVar92._0_4_ = fVar195 * 0.0 + fVar238 * 0.5 + fVar387 * 0.0;
  auVar92._4_4_ = fVar236 * 0.0 + fVar257 * 0.5 + fVar240 * 0.0;
  auVar92._8_4_ = fVar256 * 0.0 + fVar127 * 0.5 + fVar258 * 0.0;
  auVar92._12_4_ = fVar212 * 0.0 + fVar242 * 0.5 + fVar241 * 0.0;
  auVar163._0_4_ = fVar243 * 0.5;
  auVar163._4_4_ = fVar161 * 0.5;
  auVar163._8_4_ = fVar234 * 0.5;
  auVar163._12_4_ = fVar255 * 0.5;
  auVar174 = vsubps_avx(auVar92,auVar163);
  auVar93._0_4_ = fVar275 * 0.0 + fVar366 * 0.5 + fVar214 * 0.0;
  auVar93._4_4_ = fVar276 * 0.0 + fVar311 * 0.5 + fVar235 * 0.0;
  auVar93._8_4_ = fVar278 * 0.0 + fVar367 * 0.5 + fVar237 * 0.0;
  auVar93._12_4_ = fVar279 * 0.0 + fVar312 * 0.5 + fVar239 * 0.0;
  auVar378._0_4_ = fVar259 * 0.5;
  auVar378._4_4_ = fVar260 * 0.5;
  auVar378._8_4_ = fVar272 * 0.5;
  auVar378._12_4_ = fVar274 * 0.5;
  auVar355 = vsubps_avx(auVar93,auVar378);
  local_4e8._0_4_ = fVar243 * -0.0 + fVar238 * 0.0 + fVar387 * -0.0 + fVar195;
  local_4e8._4_4_ = fVar161 * -0.0 + fVar257 * 0.0 + fVar240 * -0.0 + fVar236;
  fStack_4e0 = fVar234 * -0.0 + fVar127 * 0.0 + fVar258 * -0.0 + fVar256;
  fStack_4dc = fVar255 * -0.0 + fVar242 * 0.0 + fVar241 * -0.0 + fVar212;
  local_4c8._0_4_ = fVar243 * -0.0 + fVar195 * 0.0 + fVar238 + fVar387 * -0.0;
  local_4c8._4_4_ = fVar161 * -0.0 + fVar236 * 0.0 + fVar257 + fVar240 * -0.0;
  fStack_4c0 = fVar234 * -0.0 + fVar256 * 0.0 + fVar127 + fVar258 * -0.0;
  fStack_4bc = fVar255 * -0.0 + fVar212 * 0.0 + fVar242 + fVar241 * -0.0;
  auVar294._0_4_ = fVar238 * 0.0 + fVar387 * 0.5;
  auVar294._4_4_ = fVar257 * 0.0 + fVar240 * 0.5;
  auVar294._8_4_ = fVar127 * 0.0 + fVar258 * 0.5;
  auVar294._12_4_ = fVar242 * 0.0 + fVar241 * 0.5;
  auVar216._0_4_ = fVar195 * 0.5;
  auVar216._4_4_ = fVar236 * 0.5;
  auVar216._8_4_ = fVar256 * 0.5;
  auVar216._12_4_ = fVar212 * 0.5;
  auVar106 = vsubps_avx(auVar294,auVar216);
  auVar388._0_4_ = fVar259 * -0.0 + fVar366 * 0.0 + fVar214 * -0.0 + fVar275;
  auVar388._4_4_ = fVar260 * -0.0 + fVar311 * 0.0 + fVar235 * -0.0 + fVar276;
  auVar388._8_4_ = fVar272 * -0.0 + fVar367 * 0.0 + fVar237 * -0.0 + fVar278;
  auVar388._12_4_ = fVar274 * -0.0 + fVar312 * 0.0 + fVar239 * -0.0 + fVar279;
  auVar313._0_4_ = fVar243 * 0.0 + auVar106._0_4_;
  auVar313._4_4_ = fVar161 * 0.0 + auVar106._4_4_;
  auVar313._8_4_ = fVar234 * 0.0 + auVar106._8_4_;
  auVar313._12_4_ = fVar255 * 0.0 + auVar106._12_4_;
  auVar197._0_4_ = fVar259 * -0.0 + fVar275 * 0.0 + fVar366 + fVar214 * -0.0;
  auVar197._4_4_ = fVar260 * -0.0 + fVar276 * 0.0 + fVar311 + fVar235 * -0.0;
  auVar197._8_4_ = fVar272 * -0.0 + fVar278 * 0.0 + fVar367 + fVar237 * -0.0;
  auVar197._12_4_ = fVar274 * -0.0 + fVar279 * 0.0 + fVar312 + fVar239 * -0.0;
  auVar217._0_4_ = fVar366 * 0.0 + fVar214 * 0.5;
  auVar217._4_4_ = fVar311 * 0.0 + fVar235 * 0.5;
  auVar217._8_4_ = fVar367 * 0.0 + fVar237 * 0.5;
  auVar217._12_4_ = fVar312 * 0.0 + fVar239 * 0.5;
  auVar280._0_4_ = fVar275 * 0.5;
  auVar280._4_4_ = fVar276 * 0.5;
  auVar280._8_4_ = fVar278 * 0.5;
  auVar280._12_4_ = fVar279 * 0.5;
  auVar106 = vsubps_avx(auVar217,auVar280);
  auVar218._0_4_ = fVar259 * 0.0 + auVar106._0_4_;
  auVar218._4_4_ = fVar260 * 0.0 + auVar106._4_4_;
  auVar218._8_4_ = fVar272 * 0.0 + auVar106._8_4_;
  auVar218._12_4_ = fVar274 * 0.0 + auVar106._12_4_;
  auVar106 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar328 = vshufps_avx(auVar388,auVar388,0xc9);
  fVar261 = auVar174._0_4_;
  auVar281._0_4_ = fVar261 * auVar328._0_4_;
  fVar273 = auVar174._4_4_;
  auVar281._4_4_ = fVar273 * auVar328._4_4_;
  fVar368 = auVar174._8_4_;
  auVar281._8_4_ = fVar368 * auVar328._8_4_;
  fVar369 = auVar174._12_4_;
  auVar281._12_4_ = fVar369 * auVar328._12_4_;
  auVar295._0_4_ = auVar388._0_4_ * auVar106._0_4_;
  auVar295._4_4_ = auVar388._4_4_ * auVar106._4_4_;
  auVar295._8_4_ = auVar388._8_4_ * auVar106._8_4_;
  auVar295._12_4_ = auVar388._12_4_ * auVar106._12_4_;
  auVar328 = vsubps_avx(auVar295,auVar281);
  auVar188 = vshufps_avx(auVar328,auVar328,0xc9);
  auVar328 = vshufps_avx(auVar355,auVar355,0xc9);
  auVar296._0_4_ = auVar328._0_4_ * fVar261;
  auVar296._4_4_ = auVar328._4_4_ * fVar273;
  auVar296._8_4_ = auVar328._8_4_ * fVar368;
  auVar296._12_4_ = auVar328._12_4_ * fVar369;
  auVar94._0_4_ = auVar106._0_4_ * auVar355._0_4_;
  auVar94._4_4_ = auVar106._4_4_ * auVar355._4_4_;
  auVar94._8_4_ = auVar106._8_4_ * auVar355._8_4_;
  auVar94._12_4_ = auVar106._12_4_ * auVar355._12_4_;
  auVar106 = vsubps_avx(auVar94,auVar296);
  auVar355 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar106 = vshufps_avx(auVar313,auVar313,0xc9);
  auVar328 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar297._0_4_ = auVar313._0_4_ * auVar328._0_4_;
  auVar297._4_4_ = auVar313._4_4_ * auVar328._4_4_;
  auVar297._8_4_ = auVar313._8_4_ * auVar328._8_4_;
  auVar297._12_4_ = auVar313._12_4_ * auVar328._12_4_;
  auVar198._0_4_ = auVar106._0_4_ * auVar197._0_4_;
  auVar198._4_4_ = auVar106._4_4_ * auVar197._4_4_;
  auVar198._8_4_ = auVar106._8_4_ * auVar197._8_4_;
  auVar198._12_4_ = auVar106._12_4_ * auVar197._12_4_;
  auVar328 = vsubps_avx(auVar198,auVar297);
  auVar148 = vshufps_avx(auVar328,auVar328,0xc9);
  auVar328 = vshufps_avx(auVar218,auVar218,0xc9);
  auVar298._0_4_ = auVar313._0_4_ * auVar328._0_4_;
  auVar298._4_4_ = auVar313._4_4_ * auVar328._4_4_;
  auVar298._8_4_ = auVar313._8_4_ * auVar328._8_4_;
  auVar298._12_4_ = auVar313._12_4_ * auVar328._12_4_;
  auVar219._0_4_ = auVar106._0_4_ * auVar218._0_4_;
  auVar219._4_4_ = auVar106._4_4_ * auVar218._4_4_;
  auVar219._8_4_ = auVar106._8_4_ * auVar218._8_4_;
  auVar219._12_4_ = auVar106._12_4_ * auVar218._12_4_;
  auVar137 = vsubps_avx(auVar219,auVar298);
  auVar106 = vdpps_avx(auVar188,auVar188,0x7f);
  fVar161 = auVar106._0_4_;
  auVar324 = ZEXT416((uint)fVar161);
  auVar328 = vrsqrtss_avx(auVar324,auVar324);
  fVar243 = auVar328._0_4_;
  auVar328 = vdpps_avx(auVar188,auVar355,0x7f);
  auVar136 = ZEXT416((uint)(fVar243 * 1.5 - fVar161 * 0.5 * fVar243 * fVar243 * fVar243));
  auVar136 = vshufps_avx(auVar136,auVar136,0);
  fVar275 = auVar136._0_4_ * auVar188._0_4_;
  fVar276 = auVar136._4_4_ * auVar188._4_4_;
  fVar278 = auVar136._8_4_ * auVar188._8_4_;
  fVar279 = auVar136._12_4_ * auVar188._12_4_;
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar95._0_4_ = auVar106._0_4_ * auVar355._0_4_;
  auVar95._4_4_ = auVar106._4_4_ * auVar355._4_4_;
  auVar95._8_4_ = auVar106._8_4_ * auVar355._8_4_;
  auVar95._12_4_ = auVar106._12_4_ * auVar355._12_4_;
  auVar106 = vshufps_avx(auVar328,auVar328,0);
  auVar282._0_4_ = auVar106._0_4_ * auVar188._0_4_;
  auVar282._4_4_ = auVar106._4_4_ * auVar188._4_4_;
  auVar282._8_4_ = auVar106._8_4_ * auVar188._8_4_;
  auVar282._12_4_ = auVar106._12_4_ * auVar188._12_4_;
  auVar277 = vsubps_avx(auVar95,auVar282);
  auVar106 = vrcpss_avx(auVar324,auVar324);
  auVar106 = ZEXT416((uint)((2.0 - fVar161 * auVar106._0_4_) * auVar106._0_4_));
  auVar188 = vshufps_avx(auVar106,auVar106,0);
  auVar106 = vdpps_avx(auVar148,auVar148,0x7f);
  fVar366 = auVar106._0_4_;
  auVar355 = ZEXT416((uint)fVar366);
  auVar328 = vrsqrtss_avx(auVar355,auVar355);
  fVar259 = auVar328._0_4_;
  lVar19 = *(long *)(_Var17 + 0x38 + lVar89);
  lVar20 = *(long *)(_Var17 + 0x48 + lVar89);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar84);
  fVar243 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar234 = pfVar3[2];
  fVar255 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar90);
  fVar195 = *pfVar3;
  fVar236 = pfVar3[1];
  fVar256 = pfVar3[2];
  fVar212 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar238 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar127 = pfVar3[2];
  fVar242 = pfVar3[3];
  auVar328 = vshufps_avx(auVar137,auVar137,0xc9);
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar379._0_4_ = auVar106._0_4_ * auVar328._0_4_;
  auVar379._4_4_ = auVar106._4_4_ * auVar328._4_4_;
  auVar379._8_4_ = auVar106._8_4_ * auVar328._8_4_;
  auVar379._12_4_ = auVar106._12_4_ * auVar328._12_4_;
  auVar106 = vdpps_avx(auVar148,auVar328,0x7f);
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar96._0_4_ = auVar106._0_4_ * auVar148._0_4_;
  auVar96._4_4_ = auVar106._4_4_ * auVar148._4_4_;
  auVar96._8_4_ = auVar106._8_4_ * auVar148._8_4_;
  auVar96._12_4_ = auVar106._12_4_ * auVar148._12_4_;
  auVar137 = vsubps_avx(auVar379,auVar96);
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar387 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar258 = pfVar3[2];
  fVar241 = pfVar3[3];
  lVar19 = *(long *)(lVar18 + 0x38 + lVar89);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar89);
  auVar106 = ZEXT416((uint)(fVar259 * 1.5 - fVar259 * fVar259 * fVar259 * fVar366 * 0.5));
  auVar328 = vshufps_avx(auVar106,auVar106,0);
  fVar259 = auVar148._0_4_ * auVar328._0_4_;
  fVar260 = auVar148._4_4_ * auVar328._4_4_;
  fVar272 = auVar148._8_4_ * auVar328._8_4_;
  fVar274 = auVar148._12_4_ * auVar328._12_4_;
  auVar106 = vrcpss_avx(auVar355,auVar355);
  auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - fVar366 * auVar106._0_4_)));
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar355 = vshufps_avx(_local_4e8,_local_4e8,0xff);
  auVar356._0_4_ = auVar355._0_4_ * fVar275;
  auVar356._4_4_ = auVar355._4_4_ * fVar276;
  auVar356._8_4_ = auVar355._8_4_ * fVar278;
  auVar356._12_4_ = auVar355._12_4_ * fVar279;
  auVar148 = vshufps_avx(auVar174,auVar174,0xff);
  auVar324 = vsubps_avx(_local_4e8,auVar356);
  auVar283._0_4_ =
       auVar148._0_4_ * fVar275 + auVar355._0_4_ * auVar136._0_4_ * auVar277._0_4_ * auVar188._0_4_;
  auVar283._4_4_ =
       auVar148._4_4_ * fVar276 + auVar355._4_4_ * auVar136._4_4_ * auVar277._4_4_ * auVar188._4_4_;
  auVar283._8_4_ =
       auVar148._8_4_ * fVar278 + auVar355._8_4_ * auVar136._8_4_ * auVar277._8_4_ * auVar188._8_4_;
  auVar283._12_4_ =
       auVar148._12_4_ * fVar279 +
       auVar355._12_4_ * auVar136._12_4_ * auVar277._12_4_ * auVar188._12_4_;
  auVar277 = vsubps_avx(auVar174,auVar283);
  local_4e8._0_4_ = auVar356._0_4_ + (float)local_4e8._0_4_;
  local_4e8._4_4_ = auVar356._4_4_ + (float)local_4e8._4_4_;
  fStack_4e0 = auVar356._8_4_ + fStack_4e0;
  fStack_4dc = auVar356._12_4_ + fStack_4dc;
  auVar188 = vshufps_avx(_local_4c8,_local_4c8,0xff);
  auVar164._0_4_ = auVar188._0_4_ * fVar259;
  auVar164._4_4_ = auVar188._4_4_ * fVar260;
  auVar164._8_4_ = auVar188._8_4_ * fVar272;
  auVar164._12_4_ = auVar188._12_4_ * fVar274;
  auVar355 = vshufps_avx(auVar313,auVar313,0xff);
  auVar30 = vsubps_avx(_local_4c8,auVar164);
  auVar97._0_4_ =
       auVar355._0_4_ * fVar259 + auVar188._0_4_ * auVar328._0_4_ * auVar106._0_4_ * auVar137._0_4_;
  auVar97._4_4_ =
       auVar355._4_4_ * fVar260 + auVar188._4_4_ * auVar328._4_4_ * auVar106._4_4_ * auVar137._4_4_;
  auVar97._8_4_ =
       auVar355._8_4_ * fVar272 + auVar188._8_4_ * auVar328._8_4_ * auVar106._8_4_ * auVar137._8_4_;
  auVar97._12_4_ =
       auVar355._12_4_ * fVar274 +
       auVar188._12_4_ * auVar328._12_4_ * auVar106._12_4_ * auVar137._12_4_;
  auVar360 = vsubps_avx(auVar313,auVar97);
  local_4c8._0_4_ = (float)local_4c8._0_4_ + auVar164._0_4_;
  local_4c8._4_4_ = (float)local_4c8._4_4_ + auVar164._4_4_;
  fStack_4c0 = fStack_4c0 + auVar164._8_4_;
  fStack_4bc = fStack_4bc + auVar164._12_4_;
  auVar98._0_4_ = fVar195 * 0.0 + fVar238 * 0.5 + fVar387 * 0.0;
  auVar98._4_4_ = fVar236 * 0.0 + fVar257 * 0.5 + fVar240 * 0.0;
  auVar98._8_4_ = fVar256 * 0.0 + fVar127 * 0.5 + fVar258 * 0.0;
  auVar98._12_4_ = fVar212 * 0.0 + fVar242 * 0.5 + fVar241 * 0.0;
  auVar129._0_4_ = fVar243 * 0.5;
  auVar129._4_4_ = fVar161 * 0.5;
  auVar129._8_4_ = fVar234 * 0.5;
  auVar129._12_4_ = fVar255 * 0.5;
  auVar31 = vsubps_avx(auVar98,auVar129);
  pfVar3 = (float *)(lVar19 + lVar1 * lVar18);
  fVar259 = *pfVar3;
  fVar260 = pfVar3[1];
  fVar272 = pfVar3[2];
  fVar274 = pfVar3[3];
  auVar106 = *(undefined1 (*) [16])(lVar19 + lVar18 * lVar2);
  fVar214 = auVar106._0_4_;
  fVar235 = auVar106._4_4_;
  fVar237 = auVar106._8_4_;
  fVar239 = auVar106._12_4_;
  pfVar3 = (float *)(lVar19 + lVar90 * lVar18);
  fVar275 = *pfVar3;
  fVar276 = pfVar3[1];
  fVar278 = pfVar3[2];
  fVar279 = pfVar3[3];
  auVar263._0_4_ = fVar275 * 0.0 + fVar214 * 0.0 + fVar259 * 0.5;
  auVar263._4_4_ = fVar276 * 0.0 + fVar235 * 0.0 + fVar260 * 0.5;
  auVar263._8_4_ = fVar278 * 0.0 + fVar237 * 0.0 + fVar272 * 0.5;
  auVar263._12_4_ = fVar279 * 0.0 + fVar239 * 0.0 + fVar274 * 0.5;
  pfVar3 = (float *)(lVar19 + uVar84 * lVar18);
  fVar366 = *pfVar3;
  fVar311 = pfVar3[1];
  fVar367 = pfVar3[2];
  fVar312 = pfVar3[3];
  auVar299._0_4_ = fVar366 * 0.5;
  auVar299._4_4_ = fVar311 * 0.5;
  auVar299._8_4_ = fVar367 * 0.5;
  auVar299._12_4_ = fVar312 * 0.5;
  auVar328 = vsubps_avx(auVar263,auVar299);
  auVar300._0_4_ = fVar243 * -0.0 + fVar195 + fVar238 * 0.0 + fVar387 * -0.0;
  auVar300._4_4_ = fVar161 * -0.0 + fVar236 + fVar257 * 0.0 + fVar240 * -0.0;
  auVar300._8_4_ = fVar234 * -0.0 + fVar256 + fVar127 * 0.0 + fVar258 * -0.0;
  auVar300._12_4_ = fVar255 * -0.0 + fVar212 + fVar242 * 0.0 + fVar241 * -0.0;
  auVar284._0_4_ = fVar243 * -0.0 + fVar195 * 0.0 + fVar238 + fVar387 * -0.0;
  auVar284._4_4_ = fVar161 * -0.0 + fVar236 * 0.0 + fVar257 + fVar240 * -0.0;
  auVar284._8_4_ = fVar234 * -0.0 + fVar256 * 0.0 + fVar127 + fVar258 * -0.0;
  auVar284._12_4_ = fVar255 * -0.0 + fVar212 * 0.0 + fVar242 + fVar241 * -0.0;
  auVar325._0_4_ = fVar238 * 0.0 + fVar387 * 0.5;
  auVar325._4_4_ = fVar257 * 0.0 + fVar240 * 0.5;
  auVar325._8_4_ = fVar127 * 0.0 + fVar258 * 0.5;
  auVar325._12_4_ = fVar242 * 0.0 + fVar241 * 0.5;
  auVar357._0_4_ = fVar195 * 0.5;
  auVar357._4_4_ = fVar236 * 0.5;
  auVar357._8_4_ = fVar256 * 0.5;
  auVar357._12_4_ = fVar212 * 0.5;
  auVar106 = vsubps_avx(auVar325,auVar357);
  auVar340._0_4_ = fVar243 * 0.0 + auVar106._0_4_;
  auVar340._4_4_ = fVar161 * 0.0 + auVar106._4_4_;
  auVar340._8_4_ = fVar234 * 0.0 + auVar106._8_4_;
  auVar340._12_4_ = fVar255 * 0.0 + auVar106._12_4_;
  auVar326._0_4_ = fVar366 * -0.0 + fVar275 + fVar214 * -0.0 + fVar259 * 0.0;
  auVar326._4_4_ = fVar311 * -0.0 + fVar276 + fVar235 * -0.0 + fVar260 * 0.0;
  auVar326._8_4_ = fVar367 * -0.0 + fVar278 + fVar237 * -0.0 + fVar272 * 0.0;
  auVar326._12_4_ = fVar312 * -0.0 + fVar279 + fVar239 * -0.0 + fVar274 * 0.0;
  auVar130._0_4_ = fVar366 * -0.0 + fVar214 * -0.0 + fVar259 + fVar275 * 0.0;
  auVar130._4_4_ = fVar311 * -0.0 + fVar235 * -0.0 + fVar260 + fVar276 * 0.0;
  auVar130._8_4_ = fVar367 * -0.0 + fVar237 * -0.0 + fVar272 + fVar278 * 0.0;
  auVar130._12_4_ = fVar312 * -0.0 + fVar239 * -0.0 + fVar274 + fVar279 * 0.0;
  auVar165._0_4_ = fVar259 * 0.0 + fVar214 * 0.5;
  auVar165._4_4_ = fVar260 * 0.0 + fVar235 * 0.5;
  auVar165._8_4_ = fVar272 * 0.0 + fVar237 * 0.5;
  auVar165._12_4_ = fVar274 * 0.0 + fVar239 * 0.5;
  auVar199._0_4_ = fVar275 * 0.5;
  auVar199._4_4_ = fVar276 * 0.5;
  auVar199._8_4_ = fVar278 * 0.5;
  auVar199._12_4_ = fVar279 * 0.5;
  auVar106 = vsubps_avx(auVar165,auVar199);
  auVar99._0_4_ = fVar366 * 0.0 + auVar106._0_4_;
  auVar99._4_4_ = fVar311 * 0.0 + auVar106._4_4_;
  auVar99._8_4_ = fVar367 * 0.0 + auVar106._8_4_;
  auVar99._12_4_ = fVar312 * 0.0 + auVar106._12_4_;
  auVar106 = vshufps_avx(auVar326,auVar326,0xc9);
  fVar238 = auVar31._0_4_;
  auVar166._0_4_ = fVar238 * auVar106._0_4_;
  fVar257 = auVar31._4_4_;
  auVar166._4_4_ = fVar257 * auVar106._4_4_;
  fVar127 = auVar31._8_4_;
  auVar166._8_4_ = fVar127 * auVar106._8_4_;
  fVar242 = auVar31._12_4_;
  auVar166._12_4_ = fVar242 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar327._0_4_ = auVar326._0_4_ * auVar106._0_4_;
  auVar327._4_4_ = auVar326._4_4_ * auVar106._4_4_;
  auVar327._8_4_ = auVar326._8_4_ * auVar106._8_4_;
  auVar327._12_4_ = auVar326._12_4_ * auVar106._12_4_;
  auVar188 = vsubps_avx(auVar327,auVar166);
  auVar200._0_4_ = auVar106._0_4_ * auVar328._0_4_;
  auVar200._4_4_ = auVar106._4_4_ * auVar328._4_4_;
  auVar200._8_4_ = auVar106._8_4_ * auVar328._8_4_;
  auVar200._12_4_ = auVar106._12_4_ * auVar328._12_4_;
  auVar106 = vshufps_avx(auVar328,auVar328,0xc9);
  auVar264._0_4_ = fVar238 * auVar106._0_4_;
  auVar264._4_4_ = fVar257 * auVar106._4_4_;
  auVar264._8_4_ = fVar127 * auVar106._8_4_;
  auVar264._12_4_ = fVar242 * auVar106._12_4_;
  auVar355 = vsubps_avx(auVar200,auVar264);
  auVar106 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar265._0_4_ = auVar340._0_4_ * auVar106._0_4_;
  auVar265._4_4_ = auVar340._4_4_ * auVar106._4_4_;
  auVar265._8_4_ = auVar340._8_4_ * auVar106._8_4_;
  auVar265._12_4_ = auVar340._12_4_ * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar340,auVar340,0xc9);
  auVar131._0_4_ = auVar106._0_4_ * auVar130._0_4_;
  auVar131._4_4_ = auVar106._4_4_ * auVar130._4_4_;
  auVar131._8_4_ = auVar106._8_4_ * auVar130._8_4_;
  auVar131._12_4_ = auVar106._12_4_ * auVar130._12_4_;
  auVar148 = vsubps_avx(auVar131,auVar265);
  auVar188 = vshufps_avx(auVar188,auVar188,0xc9);
  auVar167._0_4_ = auVar106._0_4_ * auVar99._0_4_;
  auVar167._4_4_ = auVar106._4_4_ * auVar99._4_4_;
  auVar167._8_4_ = auVar106._8_4_ * auVar99._8_4_;
  auVar167._12_4_ = auVar106._12_4_ * auVar99._12_4_;
  auVar106 = vdpps_avx(auVar188,auVar188,0x7f);
  auVar328 = vshufps_avx(auVar99,auVar99,0xc9);
  auVar100._0_4_ = auVar340._0_4_ * auVar328._0_4_;
  auVar100._4_4_ = auVar340._4_4_ * auVar328._4_4_;
  auVar100._8_4_ = auVar340._8_4_ * auVar328._8_4_;
  auVar100._12_4_ = auVar340._12_4_ * auVar328._12_4_;
  auVar174 = vsubps_avx(auVar167,auVar100);
  fVar243 = auVar106._0_4_;
  auVar136 = ZEXT416((uint)fVar243);
  auVar328 = vrsqrtss_avx(auVar136,auVar136);
  fVar161 = auVar328._0_4_;
  auVar355 = vshufps_avx(auVar355,auVar355,0xc9);
  auVar328 = vdpps_avx(auVar188,auVar355,0x7f);
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar201._0_4_ = auVar106._0_4_ * auVar355._0_4_;
  auVar201._4_4_ = auVar106._4_4_ * auVar355._4_4_;
  auVar201._8_4_ = auVar106._8_4_ * auVar355._8_4_;
  auVar201._12_4_ = auVar106._12_4_ * auVar355._12_4_;
  auVar106 = vshufps_avx(auVar328,auVar328,0);
  auVar358._0_4_ = auVar106._0_4_ * auVar188._0_4_;
  auVar358._4_4_ = auVar106._4_4_ * auVar188._4_4_;
  auVar358._8_4_ = auVar106._8_4_ * auVar188._8_4_;
  auVar358._12_4_ = auVar106._12_4_ * auVar188._12_4_;
  auVar32 = vsubps_avx(auVar201,auVar358);
  auVar106 = vrcpss_avx(auVar136,auVar136);
  auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - fVar243 * auVar106._0_4_)));
  auVar355 = vshufps_avx(auVar106,auVar106,0);
  auVar148 = vshufps_avx(auVar148,auVar148,0xc9);
  auVar328 = vdpps_avx(auVar148,auVar148,0x7f);
  auVar106 = ZEXT416((uint)(fVar161 * 1.5 - fVar243 * 0.5 * fVar161 * fVar161 * fVar161));
  auVar136 = vshufps_avx(auVar106,auVar106,0);
  fVar243 = auVar188._0_4_ * auVar136._0_4_;
  fVar161 = auVar188._4_4_ * auVar136._4_4_;
  fVar234 = auVar188._8_4_ * auVar136._8_4_;
  fVar255 = auVar188._12_4_ * auVar136._12_4_;
  auVar106 = vblendps_avx(auVar328,_DAT_01f45a50,0xe);
  auVar188 = vrsqrtss_avx(auVar106,auVar106);
  fVar195 = auVar188._0_4_;
  auVar174 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar188 = vdpps_avx(auVar148,auVar174,0x7f);
  auVar137 = vshufps_avx(auVar328,auVar328,0);
  auVar101._0_4_ = auVar137._0_4_ * auVar174._0_4_;
  auVar101._4_4_ = auVar137._4_4_ * auVar174._4_4_;
  auVar101._8_4_ = auVar137._8_4_ * auVar174._8_4_;
  auVar101._12_4_ = auVar137._12_4_ * auVar174._12_4_;
  auVar188 = vshufps_avx(auVar188,auVar188,0);
  auVar359._0_4_ = auVar188._0_4_ * auVar148._0_4_;
  auVar359._4_4_ = auVar188._4_4_ * auVar148._4_4_;
  auVar359._8_4_ = auVar188._8_4_ * auVar148._8_4_;
  auVar359._12_4_ = auVar188._12_4_ * auVar148._12_4_;
  auVar174 = vsubps_avx(auVar101,auVar359);
  auVar106 = vrcpss_avx(auVar106,auVar106);
  auVar106 = ZEXT416((uint)(auVar106._0_4_ * (2.0 - auVar328._0_4_ * auVar106._0_4_)));
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar328 = ZEXT416((uint)(fVar195 * 1.5 - auVar328._0_4_ * 0.5 * fVar195 * fVar195 * fVar195));
  auVar328 = vshufps_avx(auVar328,auVar328,0);
  fVar195 = auVar148._0_4_ * auVar328._0_4_;
  fVar236 = auVar148._4_4_ * auVar328._4_4_;
  fVar256 = auVar148._8_4_ * auVar328._8_4_;
  fVar212 = auVar148._12_4_ * auVar328._12_4_;
  auVar188 = vshufps_avx(auVar31,auVar31,0xff);
  auVar148 = vshufps_avx(auVar300,auVar300,0xff);
  auVar132._0_4_ = auVar148._0_4_ * fVar243;
  auVar132._4_4_ = auVar148._4_4_ * fVar161;
  auVar132._8_4_ = auVar148._8_4_ * fVar234;
  auVar132._12_4_ = auVar148._12_4_ * fVar255;
  auVar168._0_4_ =
       auVar188._0_4_ * fVar243 + auVar136._0_4_ * auVar32._0_4_ * auVar355._0_4_ * auVar148._0_4_;
  auVar168._4_4_ =
       auVar188._4_4_ * fVar161 + auVar136._4_4_ * auVar32._4_4_ * auVar355._4_4_ * auVar148._4_4_;
  auVar168._8_4_ =
       auVar188._8_4_ * fVar234 + auVar136._8_4_ * auVar32._8_4_ * auVar355._8_4_ * auVar148._8_4_;
  auVar168._12_4_ =
       auVar188._12_4_ * fVar255 +
       auVar136._12_4_ * auVar32._12_4_ * auVar355._12_4_ * auVar148._12_4_;
  auVar148 = vsubps_avx(auVar300,auVar132);
  auVar136 = vsubps_avx(auVar31,auVar168);
  auVar188 = vshufps_avx(auVar340,auVar340,0xff);
  auVar355 = vshufps_avx(auVar284,auVar284,0xff);
  auVar202._0_4_ = auVar355._0_4_ * fVar195;
  auVar202._4_4_ = auVar355._4_4_ * fVar236;
  auVar202._8_4_ = auVar355._8_4_ * fVar256;
  auVar202._12_4_ = auVar355._12_4_ * fVar212;
  auVar169._0_4_ =
       auVar188._0_4_ * fVar195 + auVar355._0_4_ * auVar328._0_4_ * auVar174._0_4_ * auVar106._0_4_;
  auVar169._4_4_ =
       auVar188._4_4_ * fVar236 + auVar355._4_4_ * auVar328._4_4_ * auVar174._4_4_ * auVar106._4_4_;
  auVar169._8_4_ =
       auVar188._8_4_ * fVar256 + auVar355._8_4_ * auVar328._8_4_ * auVar174._8_4_ * auVar106._8_4_;
  auVar169._12_4_ =
       auVar188._12_4_ * fVar212 +
       auVar355._12_4_ * auVar328._12_4_ * auVar174._12_4_ * auVar106._12_4_;
  auVar188 = vsubps_avx(auVar284,auVar202);
  local_468._4_4_ = auVar284._4_4_ + auVar202._4_4_;
  local_468._0_4_ = auVar284._0_4_ + auVar202._0_4_;
  fStack_460 = auVar284._8_4_ + auVar202._8_4_;
  fStack_45c = auVar284._12_4_ + auVar202._12_4_;
  auVar355 = vsubps_avx(auVar340,auVar169);
  local_3e8._0_4_ = auVar277._0_4_;
  local_3e8._4_4_ = auVar277._4_4_;
  fStack_3e0 = auVar277._8_4_;
  fStack_3dc = auVar277._12_4_;
  local_328._0_4_ = auVar324._0_4_;
  local_328._4_4_ = auVar324._4_4_;
  fStack_320 = auVar324._8_4_;
  fStack_31c = auVar324._12_4_;
  auVar106 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
  auVar328 = vshufps_avx(ZEXT416((uint)(1.0 - fVar213)),ZEXT416((uint)(1.0 - fVar213)),0);
  fVar255 = auVar106._0_4_;
  fVar195 = auVar106._4_4_;
  fVar236 = auVar106._8_4_;
  fVar256 = auVar106._12_4_;
  fVar213 = auVar328._0_4_;
  fVar243 = auVar328._4_4_;
  fVar161 = auVar328._8_4_;
  fVar234 = auVar328._12_4_;
  local_388._0_4_ = fVar213 * (float)local_328._0_4_ + fVar255 * auVar148._0_4_;
  local_388._4_4_ = fVar243 * (float)local_328._4_4_ + fVar195 * auVar148._4_4_;
  fStack_380 = fVar161 * fStack_320 + fVar236 * auVar148._8_4_;
  fStack_37c = fVar234 * fStack_31c + fVar256 * auVar148._12_4_;
  local_3f8 = fVar213 * ((float)local_328._0_4_ + (float)local_3e8._0_4_ * 0.33333334) +
              fVar255 * (auVar148._0_4_ + auVar136._0_4_ * 0.33333334);
  fStack_3f4 = fVar243 * ((float)local_328._4_4_ + (float)local_3e8._4_4_ * 0.33333334) +
               fVar195 * (auVar148._4_4_ + auVar136._4_4_ * 0.33333334);
  fStack_3f0 = fVar161 * (fStack_320 + fStack_3e0 * 0.33333334) +
               fVar236 * (auVar148._8_4_ + auVar136._8_4_ * 0.33333334);
  fStack_3ec = fVar234 * (fStack_31c + fStack_3dc * 0.33333334) +
               fVar256 * (auVar148._12_4_ + auVar136._12_4_ * 0.33333334);
  local_488._0_4_ = auVar360._0_4_;
  local_488._4_4_ = auVar360._4_4_;
  fStack_480 = auVar360._8_4_;
  fStack_47c = auVar360._12_4_;
  auVar170._0_4_ = (float)local_488._0_4_ * 0.33333334;
  auVar170._4_4_ = (float)local_488._4_4_ * 0.33333334;
  auVar170._8_4_ = fStack_480 * 0.33333334;
  auVar170._12_4_ = fStack_47c * 0.33333334;
  auVar106 = vsubps_avx(auVar30,auVar170);
  auVar266._0_4_ = (auVar313._0_4_ + auVar97._0_4_) * 0.33333334;
  auVar266._4_4_ = (auVar313._4_4_ + auVar97._4_4_) * 0.33333334;
  auVar266._8_4_ = (auVar313._8_4_ + auVar97._8_4_) * 0.33333334;
  auVar266._12_4_ = (auVar313._12_4_ + auVar97._12_4_) * 0.33333334;
  auVar328 = vsubps_avx(_local_4c8,auVar266);
  auVar203._0_4_ = auVar355._0_4_ * 0.33333334;
  auVar203._4_4_ = auVar355._4_4_ * 0.33333334;
  auVar203._8_4_ = auVar355._8_4_ * 0.33333334;
  auVar203._12_4_ = auVar355._12_4_ * 0.33333334;
  auVar355 = vsubps_avx(auVar188,auVar203);
  auVar329._0_4_ = (auVar340._0_4_ + auVar169._0_4_) * 0.33333334;
  auVar329._4_4_ = (auVar340._4_4_ + auVar169._4_4_) * 0.33333334;
  auVar329._8_4_ = (auVar340._8_4_ + auVar169._8_4_) * 0.33333334;
  auVar329._12_4_ = (auVar340._12_4_ + auVar169._12_4_) * 0.33333334;
  auVar148 = vsubps_avx(_local_468,auVar329);
  local_398._0_4_ = fVar255 * auVar355._0_4_ + auVar106._0_4_ * fVar213;
  local_398._4_4_ = fVar195 * auVar355._4_4_ + auVar106._4_4_ * fVar243;
  fStack_390 = fVar236 * auVar355._8_4_ + auVar106._8_4_ * fVar161;
  fStack_38c = fVar256 * auVar355._12_4_ + auVar106._12_4_ * fVar234;
  local_408 = fVar255 * auVar188._0_4_ + fVar213 * auVar30._0_4_;
  fStack_404 = fVar195 * auVar188._4_4_ + fVar243 * auVar30._4_4_;
  fStack_400 = fVar236 * auVar188._8_4_ + fVar161 * auVar30._8_4_;
  fStack_3fc = fVar256 * auVar188._12_4_ + fVar234 * auVar30._12_4_;
  local_3a8._0_4_ = (float)local_4e8._0_4_ * fVar213 + fVar255 * (auVar300._0_4_ + auVar132._0_4_);
  local_3a8._4_4_ = (float)local_4e8._4_4_ * fVar243 + fVar195 * (auVar300._4_4_ + auVar132._4_4_);
  fStack_3a0 = fStack_4e0 * fVar161 + fVar236 * (auVar300._8_4_ + auVar132._8_4_);
  fStack_39c = fStack_4dc * fVar234 + fVar256 * (auVar300._12_4_ + auVar132._12_4_);
  local_3b8._0_4_ =
       fVar213 * ((float)local_4e8._0_4_ + (fVar261 + auVar283._0_4_) * 0.33333334) +
       fVar255 * (auVar300._0_4_ + auVar132._0_4_ + (fVar238 + auVar168._0_4_) * 0.33333334);
  local_3b8._4_4_ =
       fVar243 * ((float)local_4e8._4_4_ + (fVar273 + auVar283._4_4_) * 0.33333334) +
       fVar195 * (auVar300._4_4_ + auVar132._4_4_ + (fVar257 + auVar168._4_4_) * 0.33333334);
  fStack_3b0 = fVar161 * (fStack_4e0 + (fVar368 + auVar283._8_4_) * 0.33333334) +
               fVar236 * (auVar300._8_4_ + auVar132._8_4_ + (fVar127 + auVar168._8_4_) * 0.33333334)
  ;
  fStack_3ac = fVar234 * (fStack_4dc + (fVar369 + auVar283._12_4_) * 0.33333334) +
               fVar256 * (auVar300._12_4_ + auVar132._12_4_ +
                         (fVar242 + auVar168._12_4_) * 0.33333334);
  local_2c8._0_4_ = fVar213 * auVar328._0_4_ + fVar255 * auVar148._0_4_;
  local_2c8._4_4_ = fVar243 * auVar328._4_4_ + fVar195 * auVar148._4_4_;
  fStack_2c0 = fVar161 * auVar328._8_4_ + fVar236 * auVar148._8_4_;
  fStack_2bc = fVar234 * auVar328._12_4_ + fVar256 * auVar148._12_4_;
  local_3c8._0_4_ = (float)local_4c8._0_4_ * fVar213 + fVar255 * (auVar284._0_4_ + auVar202._0_4_);
  local_3c8._4_4_ = (float)local_4c8._4_4_ * fVar243 + fVar195 * (auVar284._4_4_ + auVar202._4_4_);
  fStack_3c0 = fStack_4c0 * fVar161 + fVar236 * (auVar284._8_4_ + auVar202._8_4_);
  fStack_3bc = fStack_4bc * fVar234 + fVar256 * (auVar284._12_4_ + auVar202._12_4_);
  aVar6 = (ray->super_RayK<1>).org.field_0;
  auVar188 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
  auVar328 = vmovsldup_avx(auVar188);
  auVar106 = vmovshdup_avx(auVar188);
  auVar188 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar213 = (pre->ray_space).vx.field_0.m128[0];
  fVar243 = (pre->ray_space).vx.field_0.m128[1];
  fVar161 = (pre->ray_space).vx.field_0.m128[2];
  fVar234 = (pre->ray_space).vx.field_0.m128[3];
  fVar255 = (pre->ray_space).vy.field_0.m128[0];
  fVar195 = (pre->ray_space).vy.field_0.m128[1];
  fVar236 = (pre->ray_space).vy.field_0.m128[2];
  fVar256 = (pre->ray_space).vy.field_0.m128[3];
  fVar212 = (pre->ray_space).vz.field_0.m128[0];
  fVar238 = (pre->ray_space).vz.field_0.m128[1];
  fVar257 = (pre->ray_space).vz.field_0.m128[2];
  fVar127 = (pre->ray_space).vz.field_0.m128[3];
  local_508._4_4_ = fVar243 * auVar328._4_4_ + fVar195 * auVar106._4_4_ + fVar238 * auVar188._4_4_;
  local_508._0_4_ = fVar213 * auVar328._0_4_ + fVar255 * auVar106._0_4_ + fVar212 * auVar188._0_4_;
  fStack_500 = fVar161 * auVar328._8_4_ + fVar236 * auVar106._8_4_ + fVar257 * auVar188._8_4_;
  fStack_4fc = fVar234 * auVar328._12_4_ + fVar256 * auVar106._12_4_ + fVar127 * auVar188._12_4_;
  auVar78._4_4_ = fStack_3f4;
  auVar78._0_4_ = local_3f8;
  auVar78._8_4_ = fStack_3f0;
  auVar78._12_4_ = fStack_3ec;
  auVar188 = vsubps_avx(auVar78,(undefined1  [16])aVar6);
  auVar328 = vmovsldup_avx(auVar188);
  auVar106 = vmovshdup_avx(auVar188);
  auVar188 = vshufps_avx(auVar188,auVar188,0xaa);
  auVar133._0_8_ =
       CONCAT44(fVar243 * auVar328._4_4_ + fVar195 * auVar106._4_4_ + fVar238 * auVar188._4_4_,
                fVar213 * auVar328._0_4_ + fVar255 * auVar106._0_4_ + fVar212 * auVar188._0_4_);
  auVar133._8_4_ = fVar161 * auVar328._8_4_ + fVar236 * auVar106._8_4_ + fVar257 * auVar188._8_4_;
  auVar133._12_4_ =
       fVar234 * auVar328._12_4_ + fVar256 * auVar106._12_4_ + fVar127 * auVar188._12_4_;
  auVar328 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar204._0_8_ =
       CONCAT44(fVar243 * auVar328._4_4_ + auVar106._4_4_ * fVar195 + fVar238 * auVar188._4_4_,
                fVar213 * auVar328._0_4_ + auVar106._0_4_ * fVar255 + fVar212 * auVar188._0_4_);
  auVar204._8_4_ = fVar161 * auVar328._8_4_ + auVar106._8_4_ * fVar236 + fVar257 * auVar188._8_4_;
  auVar204._12_4_ =
       fVar234 * auVar328._12_4_ + auVar106._12_4_ * fVar256 + fVar127 * auVar188._12_4_;
  auVar75._4_4_ = fStack_404;
  auVar75._0_4_ = local_408;
  auVar75._8_4_ = fStack_400;
  auVar75._12_4_ = fStack_3fc;
  auVar328 = vsubps_avx(auVar75,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar285._0_8_ =
       CONCAT44(auVar106._4_4_ * fVar195 + auVar188._4_4_ * fVar238 + fVar243 * auVar328._4_4_,
                auVar106._0_4_ * fVar255 + auVar188._0_4_ * fVar212 + fVar213 * auVar328._0_4_);
  auVar285._8_4_ = auVar106._8_4_ * fVar236 + auVar188._8_4_ * fVar257 + fVar161 * auVar328._8_4_;
  auVar285._12_4_ =
       auVar106._12_4_ * fVar256 + auVar188._12_4_ * fVar127 + fVar234 * auVar328._12_4_;
  auVar328 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar301._0_8_ =
       CONCAT44(auVar328._4_4_ * fVar243 + auVar106._4_4_ * fVar195 + auVar188._4_4_ * fVar238,
                auVar328._0_4_ * fVar213 + auVar106._0_4_ * fVar255 + auVar188._0_4_ * fVar212);
  auVar301._8_4_ = auVar328._8_4_ * fVar161 + auVar106._8_4_ * fVar236 + auVar188._8_4_ * fVar257;
  auVar301._12_4_ =
       auVar328._12_4_ * fVar234 + auVar106._12_4_ * fVar256 + auVar188._12_4_ * fVar127;
  auVar328 = vsubps_avx(_local_3b8,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar314._0_8_ =
       CONCAT44(auVar328._4_4_ * fVar243 + auVar106._4_4_ * fVar195 + auVar188._4_4_ * fVar238,
                auVar328._0_4_ * fVar213 + auVar106._0_4_ * fVar255 + auVar188._0_4_ * fVar212);
  auVar314._8_4_ = auVar328._8_4_ * fVar161 + auVar106._8_4_ * fVar236 + auVar188._8_4_ * fVar257;
  auVar314._12_4_ =
       auVar328._12_4_ * fVar234 + auVar106._12_4_ * fVar256 + auVar188._12_4_ * fVar127;
  auVar328 = vsubps_avx(_local_2c8,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar330._0_8_ =
       CONCAT44(auVar328._4_4_ * fVar243 + auVar106._4_4_ * fVar195 + auVar188._4_4_ * fVar238,
                auVar328._0_4_ * fVar213 + auVar106._0_4_ * fVar255 + auVar188._0_4_ * fVar212);
  auVar330._8_4_ = auVar328._8_4_ * fVar161 + auVar106._8_4_ * fVar236 + auVar188._8_4_ * fVar257;
  auVar330._12_4_ =
       auVar328._12_4_ * fVar234 + auVar106._12_4_ * fVar256 + auVar188._12_4_ * fVar127;
  auVar328 = vsubps_avx(_local_3c8,(undefined1  [16])aVar6);
  auVar188 = vshufps_avx(auVar328,auVar328,0xaa);
  auVar106 = vmovshdup_avx(auVar328);
  auVar328 = vmovsldup_avx(auVar328);
  auVar380._0_8_ =
       CONCAT44(fVar243 * auVar328._4_4_ + auVar106._4_4_ * fVar195 + auVar188._4_4_ * fVar238,
                fVar213 * auVar328._0_4_ + auVar106._0_4_ * fVar255 + auVar188._0_4_ * fVar212);
  auVar380._8_4_ = fVar161 * auVar328._8_4_ + auVar106._8_4_ * fVar236 + auVar188._8_4_ * fVar257;
  auVar380._12_4_ =
       fVar234 * auVar328._12_4_ + auVar106._12_4_ * fVar256 + auVar188._12_4_ * fVar127;
  auVar355 = vmovlhps_avx(_local_508,auVar301);
  _local_428 = vmovlhps_avx(auVar133,auVar314);
  _local_438 = vmovlhps_avx(auVar204,auVar330);
  _local_218 = vmovlhps_avx(auVar285,auVar380);
  auVar106 = vminps_avx(auVar355,_local_428);
  auVar328 = vminps_avx(_local_438,_local_218);
  auVar188 = vminps_avx(auVar106,auVar328);
  auVar106 = vmaxps_avx(auVar355,_local_428);
  auVar328 = vmaxps_avx(_local_438,_local_218);
  auVar106 = vmaxps_avx(auVar106,auVar328);
  auVar328 = vshufpd_avx(auVar188,auVar188,3);
  auVar188 = vminps_avx(auVar188,auVar328);
  auVar328 = vshufpd_avx(auVar106,auVar106,3);
  auVar328 = vmaxps_avx(auVar106,auVar328);
  auVar267._8_4_ = 0x7fffffff;
  auVar267._0_8_ = 0x7fffffff7fffffff;
  auVar267._12_4_ = 0x7fffffff;
  auVar106 = vandps_avx(auVar188,auVar267);
  auVar328 = vandps_avx(auVar328,auVar267);
  auVar106 = vmaxps_avx(auVar106,auVar328);
  auVar328 = vmovshdup_avx(auVar106);
  auVar106 = vmaxss_avx(auVar328,auVar106);
  fVar213 = auVar106._0_4_ * 9.536743e-07;
  local_448._8_8_ = local_508;
  local_448._0_8_ = local_508;
  auVar271 = ZEXT1664(local_448);
  local_458._8_8_ = auVar133._0_8_;
  local_458._0_8_ = auVar133._0_8_;
  auVar376 = ZEXT1664(local_458);
  register0x000012c8 = auVar204._0_8_;
  local_468 = (undefined1  [8])auVar204._0_8_;
  local_338._8_8_ = auVar285._0_8_;
  local_338._0_8_ = auVar285._0_8_;
  auVar293 = ZEXT1664(_local_468);
  register0x000012c8 = auVar301._0_8_;
  local_348 = auVar301._0_8_;
  auVar211 = ZEXT1664(_local_348);
  auVar310 = ZEXT1664(local_338);
  local_358._8_8_ = auVar314._0_8_;
  local_358._0_8_ = auVar314._0_8_;
  auVar323 = ZEXT1664(local_358);
  local_368._8_8_ = auVar330._0_8_;
  local_368._0_8_ = auVar330._0_8_;
  auVar339 = ZEXT1664(local_368);
  local_378._8_8_ = auVar380._0_8_;
  local_378._0_8_ = auVar380._0_8_;
  local_228 = ZEXT416((uint)fVar213);
  auVar106 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
  local_78._16_16_ = auVar106;
  local_78._0_16_ = auVar106;
  auVar102._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
  auVar102._8_4_ = auVar106._8_4_ ^ 0x80000000;
  auVar102._12_4_ = auVar106._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar102;
  local_98._0_16_ = auVar102;
  uVar84 = 0;
  _local_1e8 = vsubps_avx(_local_428,auVar355);
  auVar354 = ZEXT1664(local_378);
  _local_1f8 = vsubps_avx(_local_438,_local_428);
  _local_208 = vsubps_avx(_local_218,_local_438);
  _local_248 = vsubps_avx(_local_3a8,_local_388);
  auVar79._4_4_ = fStack_3f4;
  auVar79._0_4_ = local_3f8;
  auVar79._8_4_ = fStack_3f0;
  auVar79._12_4_ = fStack_3ec;
  _local_258 = vsubps_avx(_local_3b8,auVar79);
  _local_268 = vsubps_avx(_local_2c8,_local_398);
  auVar76._4_4_ = fStack_404;
  auVar76._0_4_ = local_408;
  auVar76._8_4_ = fStack_400;
  auVar76._12_4_ = fStack_3fc;
  _local_278 = vsubps_avx(_local_3c8,auVar76);
  auVar365 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar391 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00b5091a:
  do {
    local_238 = auVar391._0_16_;
    auVar360 = auVar365._0_16_;
    auVar106 = vshufps_avx(auVar360,auVar360,0x50);
    auVar381._8_4_ = 0x3f800000;
    auVar381._0_8_ = 0x3f8000003f800000;
    auVar381._12_4_ = 0x3f800000;
    auVar386._16_4_ = 0x3f800000;
    auVar386._0_16_ = auVar381;
    auVar386._20_4_ = 0x3f800000;
    auVar386._24_4_ = 0x3f800000;
    auVar386._28_4_ = 0x3f800000;
    auVar328 = vsubps_avx(auVar381,auVar106);
    fVar213 = auVar106._0_4_;
    fVar243 = auVar106._4_4_;
    fVar161 = auVar106._8_4_;
    fVar234 = auVar106._12_4_;
    fVar255 = auVar328._0_4_;
    fVar195 = auVar328._4_4_;
    fVar236 = auVar328._8_4_;
    fVar256 = auVar328._12_4_;
    auVar205._0_4_ = auVar211._0_4_ * fVar213 + fVar255 * auVar271._0_4_;
    auVar205._4_4_ = auVar211._4_4_ * fVar243 + fVar195 * auVar271._4_4_;
    auVar205._8_4_ = auVar211._8_4_ * fVar161 + fVar236 * auVar271._8_4_;
    auVar205._12_4_ = auVar211._12_4_ * fVar234 + fVar256 * auVar271._12_4_;
    auVar171._0_4_ = auVar323._0_4_ * fVar213 + auVar376._0_4_ * fVar255;
    auVar171._4_4_ = auVar323._4_4_ * fVar243 + auVar376._4_4_ * fVar195;
    auVar171._8_4_ = auVar323._8_4_ * fVar161 + auVar376._8_4_ * fVar236;
    auVar171._12_4_ = auVar323._12_4_ * fVar234 + auVar376._12_4_ * fVar256;
    auVar286._0_4_ = auVar339._0_4_ * fVar213 + fVar255 * auVar293._0_4_;
    auVar286._4_4_ = auVar339._4_4_ * fVar243 + fVar195 * auVar293._4_4_;
    auVar286._8_4_ = auVar339._8_4_ * fVar161 + fVar236 * auVar293._8_4_;
    auVar286._12_4_ = auVar339._12_4_ * fVar234 + fVar256 * auVar293._12_4_;
    auVar220._0_4_ = auVar354._0_4_ * fVar213 + auVar310._0_4_ * fVar255;
    auVar220._4_4_ = auVar354._4_4_ * fVar243 + auVar310._4_4_ * fVar195;
    auVar220._8_4_ = auVar354._8_4_ * fVar161 + auVar310._8_4_ * fVar236;
    auVar220._12_4_ = auVar354._12_4_ * fVar234 + auVar310._12_4_ * fVar256;
    auVar106 = vmovshdup_avx(local_238);
    auVar328 = vshufps_avx(local_238,local_238,0);
    auVar321._16_16_ = auVar328;
    auVar321._0_16_ = auVar328;
    auVar188 = vshufps_avx(local_238,local_238,0x55);
    auVar121._16_16_ = auVar188;
    auVar121._0_16_ = auVar188;
    auVar118 = vsubps_avx(auVar121,auVar321);
    auVar188 = vshufps_avx(auVar205,auVar205,0);
    auVar148 = vshufps_avx(auVar205,auVar205,0x55);
    auVar136 = vshufps_avx(auVar171,auVar171,0);
    auVar174 = vshufps_avx(auVar171,auVar171,0x55);
    auVar137 = vshufps_avx(auVar286,auVar286,0);
    auVar277 = vshufps_avx(auVar286,auVar286,0x55);
    auVar324 = vshufps_avx(auVar220,auVar220,0);
    auVar30 = vshufps_avx(auVar220,auVar220,0x55);
    auVar106 = ZEXT416((uint)((auVar106._0_4_ - auVar391._0_4_) * 0.04761905));
    auVar106 = vshufps_avx(auVar106,auVar106,0);
    auVar338._0_4_ = auVar328._0_4_ + auVar118._0_4_ * 0.0;
    auVar338._4_4_ = auVar328._4_4_ + auVar118._4_4_ * 0.14285715;
    auVar338._8_4_ = auVar328._8_4_ + auVar118._8_4_ * 0.2857143;
    auVar338._12_4_ = auVar328._12_4_ + auVar118._12_4_ * 0.42857146;
    auVar338._16_4_ = auVar328._0_4_ + auVar118._16_4_ * 0.5714286;
    auVar338._20_4_ = auVar328._4_4_ + auVar118._20_4_ * 0.71428573;
    auVar338._24_4_ = auVar328._8_4_ + auVar118._24_4_ * 0.8571429;
    auVar338._28_4_ = auVar328._12_4_ + auVar118._28_4_;
    auVar23 = vsubps_avx(auVar386,auVar338);
    fVar213 = auVar136._0_4_;
    fVar161 = auVar136._4_4_;
    fVar255 = auVar136._8_4_;
    fVar236 = auVar136._12_4_;
    fVar312 = auVar23._0_4_;
    fVar214 = auVar23._4_4_;
    fVar235 = auVar23._8_4_;
    fVar237 = auVar23._12_4_;
    fVar239 = auVar23._16_4_;
    fVar261 = auVar23._20_4_;
    fVar273 = auVar23._24_4_;
    fVar274 = auVar174._0_4_;
    fVar276 = auVar174._4_4_;
    fVar279 = auVar174._8_4_;
    fVar311 = auVar174._12_4_;
    fVar377 = auVar148._12_4_ + 1.0;
    fVar241 = auVar137._0_4_;
    fVar259 = auVar137._4_4_;
    fVar260 = auVar137._8_4_;
    fVar272 = auVar137._12_4_;
    fVar212 = fVar241 * auVar338._0_4_ + fVar312 * fVar213;
    fVar238 = fVar259 * auVar338._4_4_ + fVar214 * fVar161;
    fVar257 = fVar260 * auVar338._8_4_ + fVar235 * fVar255;
    fVar127 = fVar272 * auVar338._12_4_ + fVar237 * fVar236;
    fVar242 = fVar241 * auVar338._16_4_ + fVar239 * fVar213;
    fVar387 = fVar259 * auVar338._20_4_ + fVar261 * fVar161;
    fVar240 = fVar260 * auVar338._24_4_ + fVar273 * fVar255;
    fVar243 = auVar277._0_4_;
    fVar234 = auVar277._4_4_;
    fVar195 = auVar277._8_4_;
    fVar256 = auVar277._12_4_;
    fVar275 = fVar274 * fVar312 + auVar338._0_4_ * fVar243;
    fVar278 = fVar276 * fVar214 + auVar338._4_4_ * fVar234;
    fVar366 = fVar279 * fVar235 + auVar338._8_4_ * fVar195;
    fVar367 = fVar311 * fVar237 + auVar338._12_4_ * fVar256;
    fVar368 = fVar274 * fVar239 + auVar338._16_4_ * fVar243;
    fVar369 = fVar276 * fVar261 + auVar338._20_4_ * fVar234;
    fVar370 = fVar279 * fVar273 + auVar338._24_4_ * fVar195;
    fVar371 = fVar311 + fVar236;
    auVar328 = vshufps_avx(auVar205,auVar205,0xaa);
    auVar136 = vshufps_avx(auVar205,auVar205,0xff);
    fVar258 = fVar272 + 0.0;
    auVar174 = vshufps_avx(auVar171,auVar171,0xaa);
    auVar137 = vshufps_avx(auVar171,auVar171,0xff);
    auVar232._0_4_ =
         fVar312 * (auVar338._0_4_ * fVar213 + fVar312 * auVar188._0_4_) + auVar338._0_4_ * fVar212;
    auVar232._4_4_ =
         fVar214 * (auVar338._4_4_ * fVar161 + fVar214 * auVar188._4_4_) + auVar338._4_4_ * fVar238;
    auVar232._8_4_ =
         fVar235 * (auVar338._8_4_ * fVar255 + fVar235 * auVar188._8_4_) + auVar338._8_4_ * fVar257;
    auVar232._12_4_ =
         fVar237 * (auVar338._12_4_ * fVar236 + fVar237 * auVar188._12_4_) +
         auVar338._12_4_ * fVar127;
    auVar232._16_4_ =
         fVar239 * (auVar338._16_4_ * fVar213 + fVar239 * auVar188._0_4_) +
         auVar338._16_4_ * fVar242;
    auVar232._20_4_ =
         fVar261 * (auVar338._20_4_ * fVar161 + fVar261 * auVar188._4_4_) +
         auVar338._20_4_ * fVar387;
    auVar232._24_4_ =
         fVar273 * (auVar338._24_4_ * fVar255 + fVar273 * auVar188._8_4_) +
         auVar338._24_4_ * fVar240;
    auVar232._28_4_ = auVar188._12_4_ + 1.0 + fVar256;
    auVar253._0_4_ =
         fVar312 * (fVar274 * auVar338._0_4_ + auVar148._0_4_ * fVar312) + auVar338._0_4_ * fVar275;
    auVar253._4_4_ =
         fVar214 * (fVar276 * auVar338._4_4_ + auVar148._4_4_ * fVar214) + auVar338._4_4_ * fVar278;
    auVar253._8_4_ =
         fVar235 * (fVar279 * auVar338._8_4_ + auVar148._8_4_ * fVar235) + auVar338._8_4_ * fVar366;
    auVar253._12_4_ =
         fVar237 * (fVar311 * auVar338._12_4_ + auVar148._12_4_ * fVar237) +
         auVar338._12_4_ * fVar367;
    auVar253._16_4_ =
         fVar239 * (fVar274 * auVar338._16_4_ + auVar148._0_4_ * fVar239) +
         auVar338._16_4_ * fVar368;
    auVar253._20_4_ =
         fVar261 * (fVar276 * auVar338._20_4_ + auVar148._4_4_ * fVar261) +
         auVar338._20_4_ * fVar369;
    auVar253._24_4_ =
         fVar273 * (fVar279 * auVar338._24_4_ + auVar148._8_4_ * fVar273) +
         auVar338._24_4_ * fVar370;
    auVar253._28_4_ = auVar30._12_4_ + fVar256;
    auVar122._0_4_ =
         fVar312 * fVar212 + auVar338._0_4_ * (fVar241 * fVar312 + auVar324._0_4_ * auVar338._0_4_);
    auVar122._4_4_ =
         fVar214 * fVar238 + auVar338._4_4_ * (fVar259 * fVar214 + auVar324._4_4_ * auVar338._4_4_);
    auVar122._8_4_ =
         fVar235 * fVar257 + auVar338._8_4_ * (fVar260 * fVar235 + auVar324._8_4_ * auVar338._8_4_);
    auVar122._12_4_ =
         fVar237 * fVar127 +
         auVar338._12_4_ * (fVar272 * fVar237 + auVar324._12_4_ * auVar338._12_4_);
    auVar122._16_4_ =
         fVar239 * fVar242 +
         auVar338._16_4_ * (fVar241 * fVar239 + auVar324._0_4_ * auVar338._16_4_);
    auVar122._20_4_ =
         fVar261 * fVar387 +
         auVar338._20_4_ * (fVar259 * fVar261 + auVar324._4_4_ * auVar338._20_4_);
    auVar122._24_4_ =
         fVar273 * fVar240 +
         auVar338._24_4_ * (fVar260 * fVar273 + auVar324._8_4_ * auVar338._24_4_);
    auVar122._28_4_ = fVar236 + 1.0 + fVar258;
    auVar353._0_4_ =
         fVar312 * fVar275 + auVar338._0_4_ * (auVar30._0_4_ * auVar338._0_4_ + fVar312 * fVar243);
    auVar353._4_4_ =
         fVar214 * fVar278 + auVar338._4_4_ * (auVar30._4_4_ * auVar338._4_4_ + fVar214 * fVar234);
    auVar353._8_4_ =
         fVar235 * fVar366 + auVar338._8_4_ * (auVar30._8_4_ * auVar338._8_4_ + fVar235 * fVar195);
    auVar353._12_4_ =
         fVar237 * fVar367 +
         auVar338._12_4_ * (auVar30._12_4_ * auVar338._12_4_ + fVar237 * fVar256);
    auVar353._16_4_ =
         fVar239 * fVar368 + auVar338._16_4_ * (auVar30._0_4_ * auVar338._16_4_ + fVar239 * fVar243)
    ;
    auVar353._20_4_ =
         fVar261 * fVar369 + auVar338._20_4_ * (auVar30._4_4_ * auVar338._20_4_ + fVar261 * fVar234)
    ;
    auVar353._24_4_ =
         fVar273 * fVar370 + auVar338._24_4_ * (auVar30._8_4_ * auVar338._24_4_ + fVar273 * fVar195)
    ;
    auVar353._28_4_ = fVar258 + fVar256 + 0.0;
    local_d8._0_4_ = fVar312 * auVar232._0_4_ + auVar338._0_4_ * auVar122._0_4_;
    local_d8._4_4_ = fVar214 * auVar232._4_4_ + auVar338._4_4_ * auVar122._4_4_;
    local_d8._8_4_ = fVar235 * auVar232._8_4_ + auVar338._8_4_ * auVar122._8_4_;
    local_d8._12_4_ = fVar237 * auVar232._12_4_ + auVar338._12_4_ * auVar122._12_4_;
    local_d8._16_4_ = fVar239 * auVar232._16_4_ + auVar338._16_4_ * auVar122._16_4_;
    local_d8._20_4_ = fVar261 * auVar232._20_4_ + auVar338._20_4_ * auVar122._20_4_;
    local_d8._24_4_ = fVar273 * auVar232._24_4_ + auVar338._24_4_ * auVar122._24_4_;
    local_d8._28_4_ = fVar371 + fVar256 + 0.0;
    auVar210._0_4_ = fVar312 * auVar253._0_4_ + auVar338._0_4_ * auVar353._0_4_;
    auVar210._4_4_ = fVar214 * auVar253._4_4_ + auVar338._4_4_ * auVar353._4_4_;
    auVar210._8_4_ = fVar235 * auVar253._8_4_ + auVar338._8_4_ * auVar353._8_4_;
    auVar210._12_4_ = fVar237 * auVar253._12_4_ + auVar338._12_4_ * auVar353._12_4_;
    auVar210._16_4_ = fVar239 * auVar253._16_4_ + auVar338._16_4_ * auVar353._16_4_;
    auVar210._20_4_ = fVar261 * auVar253._20_4_ + auVar338._20_4_ * auVar353._20_4_;
    auVar210._24_4_ = fVar273 * auVar253._24_4_ + auVar338._24_4_ * auVar353._24_4_;
    auVar210._28_4_ = fVar371 + fVar258;
    auVar24 = vsubps_avx(auVar122,auVar232);
    auVar118 = vsubps_avx(auVar353,auVar253);
    local_3e8._0_4_ = auVar106._0_4_;
    local_3e8._4_4_ = auVar106._4_4_;
    fStack_3e0 = auVar106._8_4_;
    fStack_3dc = auVar106._12_4_;
    local_118 = (float)local_3e8._0_4_ * auVar24._0_4_ * 3.0;
    fStack_114 = (float)local_3e8._4_4_ * auVar24._4_4_ * 3.0;
    auVar37._4_4_ = fStack_114;
    auVar37._0_4_ = local_118;
    fStack_110 = fStack_3e0 * auVar24._8_4_ * 3.0;
    auVar37._8_4_ = fStack_110;
    fStack_10c = fStack_3dc * auVar24._12_4_ * 3.0;
    auVar37._12_4_ = fStack_10c;
    fStack_108 = (float)local_3e8._0_4_ * auVar24._16_4_ * 3.0;
    auVar37._16_4_ = fStack_108;
    fStack_104 = (float)local_3e8._4_4_ * auVar24._20_4_ * 3.0;
    auVar37._20_4_ = fStack_104;
    fStack_100 = fStack_3e0 * auVar24._24_4_ * 3.0;
    auVar37._24_4_ = fStack_100;
    auVar37._28_4_ = auVar24._28_4_;
    local_138 = (float)local_3e8._0_4_ * auVar118._0_4_ * 3.0;
    fStack_134 = (float)local_3e8._4_4_ * auVar118._4_4_ * 3.0;
    auVar38._4_4_ = fStack_134;
    auVar38._0_4_ = local_138;
    fStack_130 = fStack_3e0 * auVar118._8_4_ * 3.0;
    auVar38._8_4_ = fStack_130;
    fStack_12c = fStack_3dc * auVar118._12_4_ * 3.0;
    auVar38._12_4_ = fStack_12c;
    fStack_128 = (float)local_3e8._0_4_ * auVar118._16_4_ * 3.0;
    auVar38._16_4_ = fStack_128;
    fStack_124 = (float)local_3e8._4_4_ * auVar118._20_4_ * 3.0;
    auVar38._20_4_ = fStack_124;
    fStack_120 = fStack_3e0 * auVar118._24_4_ * 3.0;
    auVar38._24_4_ = fStack_120;
    auVar38._28_4_ = fVar371;
    auVar22 = vsubps_avx(local_d8,auVar37);
    auVar118 = vperm2f128_avx(auVar22,auVar22,1);
    auVar118 = vshufps_avx(auVar118,auVar22,0x30);
    auVar118 = vshufps_avx(auVar22,auVar118,0x29);
    auVar25 = vsubps_avx(auVar210,auVar38);
    auVar22 = vperm2f128_avx(auVar25,auVar25,1);
    auVar22 = vshufps_avx(auVar22,auVar25,0x30);
    _local_4a8 = vshufps_avx(auVar25,auVar22,0x29);
    auVar153 = _local_4a8;
    fVar369 = auVar174._0_4_;
    fVar370 = auVar174._4_4_;
    fVar392 = auVar174._8_4_;
    fVar236 = auVar328._12_4_;
    fVar259 = auVar137._0_4_;
    fVar272 = auVar137._4_4_;
    fVar275 = auVar137._8_4_;
    fVar278 = auVar137._12_4_;
    auVar106 = vshufps_avx(auVar286,auVar286,0xaa);
    fVar213 = auVar106._0_4_;
    fVar161 = auVar106._4_4_;
    fVar255 = auVar106._8_4_;
    fVar256 = auVar106._12_4_;
    fVar257 = auVar338._0_4_ * fVar213 + fVar369 * fVar312;
    fVar127 = auVar338._4_4_ * fVar161 + fVar370 * fVar214;
    fVar242 = auVar338._8_4_ * fVar255 + fVar392 * fVar235;
    fVar387 = auVar338._12_4_ * fVar256 + auVar174._12_4_ * fVar237;
    fVar240 = auVar338._16_4_ * fVar213 + fVar369 * fVar239;
    fVar258 = auVar338._20_4_ * fVar161 + fVar370 * fVar261;
    fVar241 = auVar338._24_4_ * fVar255 + fVar392 * fVar273;
    auVar106 = vshufps_avx(auVar286,auVar286,0xff);
    fVar243 = auVar106._0_4_;
    fVar234 = auVar106._4_4_;
    fVar195 = auVar106._8_4_;
    fVar212 = auVar106._12_4_;
    fVar260 = auVar338._0_4_ * fVar243 + fVar259 * fVar312;
    fVar274 = auVar338._4_4_ * fVar234 + fVar272 * fVar214;
    fVar276 = auVar338._8_4_ * fVar195 + fVar275 * fVar235;
    fVar279 = auVar338._12_4_ * fVar212 + fVar278 * fVar237;
    fVar366 = auVar338._16_4_ * fVar243 + fVar259 * fVar239;
    fVar311 = auVar338._20_4_ * fVar234 + fVar272 * fVar261;
    fVar367 = auVar338._24_4_ * fVar195 + fVar275 * fVar273;
    auVar106 = vshufps_avx(auVar220,auVar220,0xaa);
    fVar368 = auVar106._12_4_ + fVar256;
    auVar188 = vshufps_avx(auVar220,auVar220,0xff);
    fVar238 = auVar188._12_4_;
    auVar123._0_4_ =
         fVar312 * (fVar369 * auVar338._0_4_ + fVar312 * auVar328._0_4_) + auVar338._0_4_ * fVar257;
    auVar123._4_4_ =
         fVar214 * (fVar370 * auVar338._4_4_ + fVar214 * auVar328._4_4_) + auVar338._4_4_ * fVar127;
    auVar123._8_4_ =
         fVar235 * (fVar392 * auVar338._8_4_ + fVar235 * auVar328._8_4_) + auVar338._8_4_ * fVar242;
    auVar123._12_4_ =
         fVar237 * (auVar174._12_4_ * auVar338._12_4_ + fVar237 * fVar236) +
         auVar338._12_4_ * fVar387;
    auVar123._16_4_ =
         fVar239 * (fVar369 * auVar338._16_4_ + fVar239 * auVar328._0_4_) +
         auVar338._16_4_ * fVar240;
    auVar123._20_4_ =
         fVar261 * (fVar370 * auVar338._20_4_ + fVar261 * auVar328._4_4_) +
         auVar338._20_4_ * fVar258;
    auVar123._24_4_ =
         fVar273 * (fVar392 * auVar338._24_4_ + fVar273 * auVar328._8_4_) +
         auVar338._24_4_ * fVar241;
    auVar123._28_4_ = local_4a8._28_4_ + fVar236 + fVar238;
    auVar157._0_4_ =
         fVar312 * (fVar259 * auVar338._0_4_ + auVar136._0_4_ * fVar312) + auVar338._0_4_ * fVar260;
    auVar157._4_4_ =
         fVar214 * (fVar272 * auVar338._4_4_ + auVar136._4_4_ * fVar214) + auVar338._4_4_ * fVar274;
    auVar157._8_4_ =
         fVar235 * (fVar275 * auVar338._8_4_ + auVar136._8_4_ * fVar235) + auVar338._8_4_ * fVar276;
    auVar157._12_4_ =
         fVar237 * (fVar278 * auVar338._12_4_ + auVar136._12_4_ * fVar237) +
         auVar338._12_4_ * fVar279;
    auVar157._16_4_ =
         fVar239 * (fVar259 * auVar338._16_4_ + auVar136._0_4_ * fVar239) +
         auVar338._16_4_ * fVar366;
    auVar157._20_4_ =
         fVar261 * (fVar272 * auVar338._20_4_ + auVar136._4_4_ * fVar261) +
         auVar338._20_4_ * fVar311;
    auVar157._24_4_ =
         fVar273 * (fVar275 * auVar338._24_4_ + auVar136._8_4_ * fVar273) +
         auVar338._24_4_ * fVar367;
    auVar157._28_4_ = fVar236 + auVar22._28_4_ + fVar238;
    auVar22 = vperm2f128_avx(local_d8,local_d8,1);
    auVar22 = vshufps_avx(auVar22,local_d8,0x30);
    _local_328 = vshufps_avx(local_d8,auVar22,0x29);
    auVar254._0_4_ =
         auVar338._0_4_ * (auVar106._0_4_ * auVar338._0_4_ + fVar312 * fVar213) + fVar312 * fVar257;
    auVar254._4_4_ =
         auVar338._4_4_ * (auVar106._4_4_ * auVar338._4_4_ + fVar214 * fVar161) + fVar214 * fVar127;
    auVar254._8_4_ =
         auVar338._8_4_ * (auVar106._8_4_ * auVar338._8_4_ + fVar235 * fVar255) + fVar235 * fVar242;
    auVar254._12_4_ =
         auVar338._12_4_ * (auVar106._12_4_ * auVar338._12_4_ + fVar237 * fVar256) +
         fVar237 * fVar387;
    auVar254._16_4_ =
         auVar338._16_4_ * (auVar106._0_4_ * auVar338._16_4_ + fVar239 * fVar213) +
         fVar239 * fVar240;
    auVar254._20_4_ =
         auVar338._20_4_ * (auVar106._4_4_ * auVar338._20_4_ + fVar261 * fVar161) +
         fVar261 * fVar258;
    auVar254._24_4_ =
         auVar338._24_4_ * (auVar106._8_4_ * auVar338._24_4_ + fVar273 * fVar255) +
         fVar273 * fVar241;
    auVar254._28_4_ = fVar368 + fVar377 + auVar253._28_4_;
    auVar309._0_4_ =
         fVar312 * fVar260 + auVar338._0_4_ * (auVar338._0_4_ * auVar188._0_4_ + fVar312 * fVar243);
    auVar309._4_4_ =
         fVar214 * fVar274 + auVar338._4_4_ * (auVar338._4_4_ * auVar188._4_4_ + fVar214 * fVar234);
    auVar309._8_4_ =
         fVar235 * fVar276 + auVar338._8_4_ * (auVar338._8_4_ * auVar188._8_4_ + fVar235 * fVar195);
    auVar309._12_4_ =
         fVar237 * fVar279 + auVar338._12_4_ * (auVar338._12_4_ * fVar238 + fVar237 * fVar212);
    auVar309._16_4_ =
         fVar239 * fVar366 +
         auVar338._16_4_ * (auVar338._16_4_ * auVar188._0_4_ + fVar239 * fVar243);
    auVar309._20_4_ =
         fVar261 * fVar311 +
         auVar338._20_4_ * (auVar338._20_4_ * auVar188._4_4_ + fVar261 * fVar234);
    auVar309._24_4_ =
         fVar273 * fVar367 +
         auVar338._24_4_ * (auVar338._24_4_ * auVar188._8_4_ + fVar273 * fVar195);
    auVar309._28_4_ = fVar377 + fVar278 + fVar238 + fVar212;
    auVar292._0_4_ = fVar312 * auVar123._0_4_ + auVar338._0_4_ * auVar254._0_4_;
    auVar292._4_4_ = fVar214 * auVar123._4_4_ + auVar338._4_4_ * auVar254._4_4_;
    auVar292._8_4_ = fVar235 * auVar123._8_4_ + auVar338._8_4_ * auVar254._8_4_;
    auVar292._12_4_ = fVar237 * auVar123._12_4_ + auVar338._12_4_ * auVar254._12_4_;
    auVar292._16_4_ = fVar239 * auVar123._16_4_ + auVar338._16_4_ * auVar254._16_4_;
    auVar292._20_4_ = fVar261 * auVar123._20_4_ + auVar338._20_4_ * auVar254._20_4_;
    auVar292._24_4_ = fVar273 * auVar123._24_4_ + auVar338._24_4_ * auVar254._24_4_;
    auVar292._28_4_ = fVar368 + fVar238 + fVar212;
    auVar322._0_4_ = fVar312 * auVar157._0_4_ + auVar338._0_4_ * auVar309._0_4_;
    auVar322._4_4_ = fVar214 * auVar157._4_4_ + auVar338._4_4_ * auVar309._4_4_;
    auVar322._8_4_ = fVar235 * auVar157._8_4_ + auVar338._8_4_ * auVar309._8_4_;
    auVar322._12_4_ = fVar237 * auVar157._12_4_ + auVar338._12_4_ * auVar309._12_4_;
    auVar322._16_4_ = fVar239 * auVar157._16_4_ + auVar338._16_4_ * auVar309._16_4_;
    auVar322._20_4_ = fVar261 * auVar157._20_4_ + auVar338._20_4_ * auVar309._20_4_;
    auVar322._24_4_ = fVar273 * auVar157._24_4_ + auVar338._24_4_ * auVar309._24_4_;
    auVar322._28_4_ = auVar23._28_4_ + auVar338._28_4_;
    auVar23 = vsubps_avx(auVar254,auVar123);
    auVar22 = vsubps_avx(auVar309,auVar157);
    local_158 = (float)local_3e8._0_4_ * auVar23._0_4_ * 3.0;
    fStack_154 = (float)local_3e8._4_4_ * auVar23._4_4_ * 3.0;
    auVar39._4_4_ = fStack_154;
    auVar39._0_4_ = local_158;
    fStack_150 = fStack_3e0 * auVar23._8_4_ * 3.0;
    auVar39._8_4_ = fStack_150;
    fStack_14c = fStack_3dc * auVar23._12_4_ * 3.0;
    auVar39._12_4_ = fStack_14c;
    fStack_148 = (float)local_3e8._0_4_ * auVar23._16_4_ * 3.0;
    auVar39._16_4_ = fStack_148;
    fStack_144 = (float)local_3e8._4_4_ * auVar23._20_4_ * 3.0;
    auVar39._20_4_ = fStack_144;
    fStack_140 = fStack_3e0 * auVar23._24_4_ * 3.0;
    auVar39._24_4_ = fStack_140;
    auVar39._28_4_ = auVar23._28_4_;
    local_178 = (float)local_3e8._0_4_ * auVar22._0_4_ * 3.0;
    fStack_174 = (float)local_3e8._4_4_ * auVar22._4_4_ * 3.0;
    auVar40._4_4_ = fStack_174;
    auVar40._0_4_ = local_178;
    fStack_170 = fStack_3e0 * auVar22._8_4_ * 3.0;
    auVar40._8_4_ = fStack_170;
    fStack_16c = fStack_3dc * auVar22._12_4_ * 3.0;
    auVar40._12_4_ = fStack_16c;
    fStack_168 = (float)local_3e8._0_4_ * auVar22._16_4_ * 3.0;
    auVar40._16_4_ = fStack_168;
    fStack_164 = (float)local_3e8._4_4_ * auVar22._20_4_ * 3.0;
    auVar40._20_4_ = fStack_164;
    fStack_160 = fStack_3e0 * auVar22._24_4_ * 3.0;
    auVar40._24_4_ = fStack_160;
    auVar40._28_4_ = auVar254._28_4_;
    auVar22 = vperm2f128_avx(auVar292,auVar292,1);
    auVar22 = vshufps_avx(auVar22,auVar292,0x30);
    auVar26 = vshufps_avx(auVar292,auVar22,0x29);
    auVar25 = vsubps_avx(auVar292,auVar39);
    auVar22 = vperm2f128_avx(auVar25,auVar25,1);
    auVar22 = vshufps_avx(auVar22,auVar25,0x30);
    _local_3e8 = vshufps_avx(auVar25,auVar22,0x29);
    auVar154 = _local_3e8;
    auVar25 = vsubps_avx(auVar322,auVar40);
    auVar22 = vperm2f128_avx(auVar25,auVar25,1);
    auVar22 = vshufps_avx(auVar22,auVar25,0x30);
    local_b8 = vshufps_avx(auVar25,auVar22,0x29);
    auVar25 = vsubps_avx(auVar292,local_d8);
    auVar27 = vsubps_avx(auVar26,_local_328);
    fVar213 = auVar27._0_4_ + auVar25._0_4_;
    fVar243 = auVar27._4_4_ + auVar25._4_4_;
    fVar161 = auVar27._8_4_ + auVar25._8_4_;
    fVar234 = auVar27._12_4_ + auVar25._12_4_;
    fVar255 = auVar27._16_4_ + auVar25._16_4_;
    fVar195 = auVar27._20_4_ + auVar25._20_4_;
    fVar236 = auVar27._24_4_ + auVar25._24_4_;
    auVar22 = vperm2f128_avx(auVar210,auVar210,1);
    auVar22 = vshufps_avx(auVar22,auVar210,0x30);
    local_f8 = vshufps_avx(auVar210,auVar22,0x29);
    auVar22 = vperm2f128_avx(auVar322,auVar322,1);
    auVar22 = vshufps_avx(auVar22,auVar322,0x30);
    _local_488 = vshufps_avx(auVar322,auVar22,0x29);
    auVar22 = vsubps_avx(auVar322,auVar210);
    auVar28 = vsubps_avx(_local_488,local_f8);
    fVar256 = auVar28._0_4_ + auVar22._0_4_;
    fVar212 = auVar28._4_4_ + auVar22._4_4_;
    fVar238 = auVar28._8_4_ + auVar22._8_4_;
    fVar257 = auVar28._12_4_ + auVar22._12_4_;
    fVar127 = auVar28._16_4_ + auVar22._16_4_;
    fVar242 = auVar28._20_4_ + auVar22._20_4_;
    fVar387 = auVar28._24_4_ + auVar22._24_4_;
    auVar41._4_4_ = fVar243 * auVar210._4_4_;
    auVar41._0_4_ = fVar213 * auVar210._0_4_;
    auVar41._8_4_ = fVar161 * auVar210._8_4_;
    auVar41._12_4_ = fVar234 * auVar210._12_4_;
    auVar41._16_4_ = fVar255 * auVar210._16_4_;
    auVar41._20_4_ = fVar195 * auVar210._20_4_;
    auVar41._24_4_ = fVar236 * auVar210._24_4_;
    auVar41._28_4_ = auVar22._28_4_;
    auVar42._4_4_ = fVar212 * local_d8._4_4_;
    auVar42._0_4_ = fVar256 * local_d8._0_4_;
    auVar42._8_4_ = fVar238 * local_d8._8_4_;
    auVar42._12_4_ = fVar257 * local_d8._12_4_;
    auVar42._16_4_ = fVar127 * local_d8._16_4_;
    auVar42._20_4_ = fVar242 * local_d8._20_4_;
    auVar42._24_4_ = fVar387 * local_d8._24_4_;
    auVar42._28_4_ = fVar368;
    auVar29 = vsubps_avx(auVar41,auVar42);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar24._28_4_;
    local_138 = local_138 + auVar210._0_4_;
    fStack_134 = fStack_134 + auVar210._4_4_;
    fStack_130 = fStack_130 + auVar210._8_4_;
    fStack_12c = fStack_12c + auVar210._12_4_;
    fStack_128 = fStack_128 + auVar210._16_4_;
    fStack_124 = fStack_124 + auVar210._20_4_;
    fStack_120 = fStack_120 + auVar210._24_4_;
    fStack_11c = fVar371 + auVar210._28_4_;
    auVar43._4_4_ = fVar243 * fStack_134;
    auVar43._0_4_ = fVar213 * local_138;
    auVar43._8_4_ = fVar161 * fStack_130;
    auVar43._12_4_ = fVar234 * fStack_12c;
    auVar43._16_4_ = fVar255 * fStack_128;
    auVar43._20_4_ = fVar195 * fStack_124;
    auVar43._24_4_ = fVar236 * fStack_120;
    auVar43._28_4_ = fVar371;
    auVar44._4_4_ = fVar212 * fStack_114;
    auVar44._0_4_ = fVar256 * local_118;
    auVar44._8_4_ = fVar238 * fStack_110;
    auVar44._12_4_ = fVar257 * fStack_10c;
    auVar44._16_4_ = fVar127 * fStack_108;
    auVar44._20_4_ = fVar242 * fStack_104;
    auVar44._24_4_ = fVar387 * fStack_100;
    auVar44._28_4_ = fVar371 + auVar210._28_4_;
    auVar24 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar243 * (float)local_4a8._4_4_;
    auVar45._0_4_ = fVar213 * (float)local_4a8._0_4_;
    auVar45._8_4_ = fVar161 * fStack_4a0;
    auVar45._12_4_ = fVar234 * fStack_49c;
    auVar45._16_4_ = fVar255 * fStack_498;
    auVar45._20_4_ = fVar195 * fStack_494;
    auVar45._24_4_ = fVar236 * fStack_490;
    auVar45._28_4_ = fVar371;
    local_4e8._0_4_ = auVar118._0_4_;
    local_4e8._4_4_ = auVar118._4_4_;
    fStack_4e0 = auVar118._8_4_;
    fStack_4dc = auVar118._12_4_;
    fStack_4d8 = auVar118._16_4_;
    fStack_4d4 = auVar118._20_4_;
    fStack_4d0 = auVar118._24_4_;
    auVar46._4_4_ = fVar212 * (float)local_4e8._4_4_;
    auVar46._0_4_ = fVar256 * (float)local_4e8._0_4_;
    auVar46._8_4_ = fVar238 * fStack_4e0;
    auVar46._12_4_ = fVar257 * fStack_4dc;
    auVar46._16_4_ = fVar127 * fStack_4d8;
    auVar46._20_4_ = fVar242 * fStack_4d4;
    auVar46._24_4_ = fVar387 * fStack_4d0;
    auVar46._28_4_ = local_d8._28_4_;
    auVar35 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_f8._4_4_ * fVar243;
    auVar47._0_4_ = local_f8._0_4_ * fVar213;
    auVar47._8_4_ = local_f8._8_4_ * fVar161;
    auVar47._12_4_ = local_f8._12_4_ * fVar234;
    auVar47._16_4_ = local_f8._16_4_ * fVar255;
    auVar47._20_4_ = local_f8._20_4_ * fVar195;
    auVar47._24_4_ = local_f8._24_4_ * fVar236;
    auVar47._28_4_ = fVar371;
    auVar48._4_4_ = local_328._4_4_ * fVar212;
    auVar48._0_4_ = local_328._0_4_ * fVar256;
    auVar48._8_4_ = local_328._8_4_ * fVar238;
    auVar48._12_4_ = local_328._12_4_ * fVar257;
    auVar48._16_4_ = local_328._16_4_ * fVar127;
    auVar48._20_4_ = local_328._20_4_ * fVar242;
    auVar48._24_4_ = local_328._24_4_ * fVar387;
    auVar48._28_4_ = local_f8._28_4_;
    auVar36 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar322._4_4_ * fVar243;
    auVar49._0_4_ = auVar322._0_4_ * fVar213;
    auVar49._8_4_ = auVar322._8_4_ * fVar161;
    auVar49._12_4_ = auVar322._12_4_ * fVar234;
    auVar49._16_4_ = auVar322._16_4_ * fVar255;
    auVar49._20_4_ = auVar322._20_4_ * fVar195;
    auVar49._24_4_ = auVar322._24_4_ * fVar236;
    auVar49._28_4_ = fVar371;
    auVar50._4_4_ = fVar212 * auVar292._4_4_;
    auVar50._0_4_ = fVar256 * auVar292._0_4_;
    auVar50._8_4_ = fVar238 * auVar292._8_4_;
    auVar50._12_4_ = fVar257 * auVar292._12_4_;
    auVar50._16_4_ = fVar127 * auVar292._16_4_;
    auVar50._20_4_ = fVar242 * auVar292._20_4_;
    auVar50._24_4_ = fVar387 * auVar292._24_4_;
    auVar50._28_4_ = fStack_fc;
    auVar117 = vsubps_avx(auVar49,auVar50);
    local_158 = auVar292._0_4_ + local_158;
    fStack_154 = auVar292._4_4_ + fStack_154;
    fStack_150 = auVar292._8_4_ + fStack_150;
    fStack_14c = auVar292._12_4_ + fStack_14c;
    fStack_148 = auVar292._16_4_ + fStack_148;
    fStack_144 = auVar292._20_4_ + fStack_144;
    fStack_140 = auVar292._24_4_ + fStack_140;
    fStack_13c = auVar292._28_4_ + auVar23._28_4_;
    local_178 = auVar322._0_4_ + local_178;
    fStack_174 = auVar322._4_4_ + fStack_174;
    fStack_170 = auVar322._8_4_ + fStack_170;
    fStack_16c = auVar322._12_4_ + fStack_16c;
    fStack_168 = auVar322._16_4_ + fStack_168;
    fStack_164 = auVar322._20_4_ + fStack_164;
    fStack_160 = auVar322._24_4_ + fStack_160;
    fStack_15c = auVar322._28_4_ + auVar254._28_4_;
    auVar51._4_4_ = fVar243 * fStack_174;
    auVar51._0_4_ = fVar213 * local_178;
    auVar51._8_4_ = fVar161 * fStack_170;
    auVar51._12_4_ = fVar234 * fStack_16c;
    auVar51._16_4_ = fVar255 * fStack_168;
    auVar51._20_4_ = fVar195 * fStack_164;
    auVar51._24_4_ = fVar236 * fStack_160;
    auVar51._28_4_ = auVar322._28_4_ + auVar254._28_4_;
    auVar52._4_4_ = fStack_154 * fVar212;
    auVar52._0_4_ = local_158 * fVar256;
    auVar52._8_4_ = fStack_150 * fVar238;
    auVar52._12_4_ = fStack_14c * fVar257;
    auVar52._16_4_ = fStack_148 * fVar127;
    auVar52._20_4_ = fStack_144 * fVar242;
    auVar52._24_4_ = fStack_140 * fVar387;
    auVar52._28_4_ = fStack_13c;
    auVar119 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = fVar243 * local_b8._4_4_;
    auVar53._0_4_ = fVar213 * local_b8._0_4_;
    auVar53._8_4_ = fVar161 * local_b8._8_4_;
    auVar53._12_4_ = fVar234 * local_b8._12_4_;
    auVar53._16_4_ = fVar255 * local_b8._16_4_;
    auVar53._20_4_ = fVar195 * local_b8._20_4_;
    auVar53._24_4_ = fVar236 * local_b8._24_4_;
    auVar53._28_4_ = fStack_13c;
    auVar54._4_4_ = fVar212 * (float)local_3e8._4_4_;
    auVar54._0_4_ = fVar256 * (float)local_3e8._0_4_;
    auVar54._8_4_ = fVar238 * fStack_3e0;
    auVar54._12_4_ = fVar257 * fStack_3dc;
    auVar54._16_4_ = fVar127 * fStack_3d8;
    auVar54._20_4_ = fVar242 * fStack_3d4;
    auVar54._24_4_ = fVar387 * fStack_3d0;
    auVar54._28_4_ = local_b8._28_4_;
    auVar120 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar243 * local_488._4_4_;
    auVar55._0_4_ = fVar213 * local_488._0_4_;
    auVar55._8_4_ = fVar161 * local_488._8_4_;
    auVar55._12_4_ = fVar234 * local_488._12_4_;
    auVar55._16_4_ = fVar255 * local_488._16_4_;
    auVar55._20_4_ = fVar195 * local_488._20_4_;
    auVar55._24_4_ = fVar236 * local_488._24_4_;
    auVar55._28_4_ = auVar27._28_4_ + auVar25._28_4_;
    auVar56._4_4_ = auVar26._4_4_ * fVar212;
    auVar56._0_4_ = auVar26._0_4_ * fVar256;
    auVar56._8_4_ = auVar26._8_4_ * fVar238;
    auVar56._12_4_ = auVar26._12_4_ * fVar257;
    auVar56._16_4_ = auVar26._16_4_ * fVar127;
    auVar56._20_4_ = auVar26._20_4_ * fVar242;
    auVar56._24_4_ = auVar26._24_4_ * fVar387;
    auVar56._28_4_ = auVar28._28_4_ + auVar22._28_4_;
    auVar27 = vsubps_avx(auVar55,auVar56);
    auVar22 = vminps_avx(auVar29,auVar24);
    auVar118 = vmaxps_avx(auVar29,auVar24);
    auVar23 = vminps_avx(auVar35,auVar36);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar35,auVar36);
    auVar118 = vmaxps_avx(auVar118,auVar22);
    auVar24 = vminps_avx(auVar117,auVar119);
    auVar22 = vmaxps_avx(auVar117,auVar119);
    auVar25 = vminps_avx(auVar120,auVar27);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar25 = vminps_avx(auVar23,auVar25);
    auVar23 = vmaxps_avx(auVar120,auVar27);
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar118,auVar22);
    auVar118 = vcmpps_avx(auVar25,local_78,2);
    auVar22 = vcmpps_avx(auVar22,local_98,5);
    auVar118 = vandps_avx(auVar22,auVar118);
    auVar22 = local_198 & auVar118;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(_local_328,local_d8);
      auVar23 = vsubps_avx(auVar26,auVar292);
      fVar243 = auVar22._0_4_ + auVar23._0_4_;
      fVar161 = auVar22._4_4_ + auVar23._4_4_;
      fVar234 = auVar22._8_4_ + auVar23._8_4_;
      fVar255 = auVar22._12_4_ + auVar23._12_4_;
      fVar195 = auVar22._16_4_ + auVar23._16_4_;
      fVar236 = auVar22._20_4_ + auVar23._20_4_;
      fVar256 = auVar22._24_4_ + auVar23._24_4_;
      auVar25 = vsubps_avx(local_f8,auVar210);
      auVar27 = vsubps_avx(_local_488,auVar322);
      fVar212 = auVar25._0_4_ + auVar27._0_4_;
      fVar238 = auVar25._4_4_ + auVar27._4_4_;
      fVar257 = auVar25._8_4_ + auVar27._8_4_;
      fVar127 = auVar25._12_4_ + auVar27._12_4_;
      fVar242 = auVar25._16_4_ + auVar27._16_4_;
      fVar387 = auVar25._20_4_ + auVar27._20_4_;
      fVar240 = auVar25._24_4_ + auVar27._24_4_;
      fVar213 = auVar27._28_4_;
      auVar57._4_4_ = auVar210._4_4_ * fVar161;
      auVar57._0_4_ = auVar210._0_4_ * fVar243;
      auVar57._8_4_ = auVar210._8_4_ * fVar234;
      auVar57._12_4_ = auVar210._12_4_ * fVar255;
      auVar57._16_4_ = auVar210._16_4_ * fVar195;
      auVar57._20_4_ = auVar210._20_4_ * fVar236;
      auVar57._24_4_ = auVar210._24_4_ * fVar256;
      auVar57._28_4_ = auVar210._28_4_;
      auVar58._4_4_ = local_d8._4_4_ * fVar238;
      auVar58._0_4_ = local_d8._0_4_ * fVar212;
      auVar58._8_4_ = local_d8._8_4_ * fVar257;
      auVar58._12_4_ = local_d8._12_4_ * fVar127;
      auVar58._16_4_ = local_d8._16_4_ * fVar242;
      auVar58._20_4_ = local_d8._20_4_ * fVar387;
      auVar58._24_4_ = local_d8._24_4_ * fVar240;
      auVar58._28_4_ = local_d8._28_4_;
      auVar27 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar161 * fStack_134;
      auVar59._0_4_ = fVar243 * local_138;
      auVar59._8_4_ = fVar234 * fStack_130;
      auVar59._12_4_ = fVar255 * fStack_12c;
      auVar59._16_4_ = fVar195 * fStack_128;
      auVar59._20_4_ = fVar236 * fStack_124;
      auVar59._24_4_ = fVar256 * fStack_120;
      auVar59._28_4_ = auVar210._28_4_;
      auVar60._4_4_ = fVar238 * fStack_114;
      auVar60._0_4_ = fVar212 * local_118;
      auVar60._8_4_ = fVar257 * fStack_110;
      auVar60._12_4_ = fVar127 * fStack_10c;
      auVar60._16_4_ = fVar242 * fStack_108;
      auVar60._20_4_ = fVar387 * fStack_104;
      auVar60._24_4_ = fVar240 * fStack_100;
      auVar60._28_4_ = fVar213;
      auVar28 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar161 * (float)local_4a8._4_4_;
      auVar61._0_4_ = fVar243 * (float)local_4a8._0_4_;
      auVar61._8_4_ = fVar234 * fStack_4a0;
      auVar61._12_4_ = fVar255 * fStack_49c;
      auVar61._16_4_ = fVar195 * fStack_498;
      auVar61._20_4_ = fVar236 * fStack_494;
      auVar61._24_4_ = fVar256 * fStack_490;
      auVar61._28_4_ = fVar213;
      auVar62._4_4_ = fVar238 * (float)local_4e8._4_4_;
      auVar62._0_4_ = fVar212 * (float)local_4e8._0_4_;
      auVar62._8_4_ = fVar257 * fStack_4e0;
      auVar62._12_4_ = fVar127 * fStack_4dc;
      auVar62._16_4_ = fVar242 * fStack_4d8;
      auVar62._20_4_ = fVar387 * fStack_4d4;
      auVar62._24_4_ = fVar240 * fStack_4d0;
      auVar62._28_4_ = auVar24._28_4_;
      auVar29 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_f8._4_4_ * fVar161;
      auVar63._0_4_ = local_f8._0_4_ * fVar243;
      auVar63._8_4_ = local_f8._8_4_ * fVar234;
      auVar63._12_4_ = local_f8._12_4_ * fVar255;
      auVar63._16_4_ = local_f8._16_4_ * fVar195;
      auVar63._20_4_ = local_f8._20_4_ * fVar236;
      auVar63._24_4_ = local_f8._24_4_ * fVar256;
      auVar63._28_4_ = auVar24._28_4_;
      auVar64._4_4_ = local_328._4_4_ * fVar238;
      auVar64._0_4_ = local_328._0_4_ * fVar212;
      auVar64._8_4_ = local_328._8_4_ * fVar257;
      auVar64._12_4_ = local_328._12_4_ * fVar127;
      auVar64._16_4_ = local_328._16_4_ * fVar242;
      auVar64._20_4_ = local_328._20_4_ * fVar387;
      uVar88 = local_328._28_4_;
      auVar64._24_4_ = local_328._24_4_ * fVar240;
      auVar64._28_4_ = uVar88;
      auVar35 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar322._4_4_ * fVar161;
      auVar65._0_4_ = auVar322._0_4_ * fVar243;
      auVar65._8_4_ = auVar322._8_4_ * fVar234;
      auVar65._12_4_ = auVar322._12_4_ * fVar255;
      auVar65._16_4_ = auVar322._16_4_ * fVar195;
      auVar65._20_4_ = auVar322._20_4_ * fVar236;
      auVar65._24_4_ = auVar322._24_4_ * fVar256;
      auVar65._28_4_ = uVar88;
      auVar66._4_4_ = auVar292._4_4_ * fVar238;
      auVar66._0_4_ = auVar292._0_4_ * fVar212;
      auVar66._8_4_ = auVar292._8_4_ * fVar257;
      auVar66._12_4_ = auVar292._12_4_ * fVar127;
      auVar66._16_4_ = auVar292._16_4_ * fVar242;
      auVar66._20_4_ = auVar292._20_4_ * fVar387;
      auVar66._24_4_ = auVar292._24_4_ * fVar240;
      auVar66._28_4_ = auVar292._28_4_;
      auVar36 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar161 * fStack_174;
      auVar67._0_4_ = fVar243 * local_178;
      auVar67._8_4_ = fVar234 * fStack_170;
      auVar67._12_4_ = fVar255 * fStack_16c;
      auVar67._16_4_ = fVar195 * fStack_168;
      auVar67._20_4_ = fVar236 * fStack_164;
      auVar67._24_4_ = fVar256 * fStack_160;
      auVar67._28_4_ = uVar88;
      auVar68._4_4_ = fVar238 * fStack_154;
      auVar68._0_4_ = fVar212 * local_158;
      auVar68._8_4_ = fVar257 * fStack_150;
      auVar68._12_4_ = fVar127 * fStack_14c;
      auVar68._16_4_ = fVar242 * fStack_148;
      auVar68._20_4_ = fVar387 * fStack_144;
      auVar68._24_4_ = fVar240 * fStack_140;
      auVar68._28_4_ = auVar322._28_4_;
      auVar117 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar161 * local_b8._4_4_;
      auVar69._0_4_ = fVar243 * local_b8._0_4_;
      auVar69._8_4_ = fVar234 * local_b8._8_4_;
      auVar69._12_4_ = fVar255 * local_b8._12_4_;
      auVar69._16_4_ = fVar195 * local_b8._16_4_;
      auVar69._20_4_ = fVar236 * local_b8._20_4_;
      auVar69._24_4_ = fVar256 * local_b8._24_4_;
      auVar69._28_4_ = auVar322._28_4_;
      auVar70._4_4_ = (float)local_3e8._4_4_ * fVar238;
      auVar70._0_4_ = (float)local_3e8._0_4_ * fVar212;
      auVar70._8_4_ = fStack_3e0 * fVar257;
      auVar70._12_4_ = fStack_3dc * fVar127;
      auVar70._16_4_ = fStack_3d8 * fVar242;
      auVar70._20_4_ = fStack_3d4 * fVar387;
      auVar70._24_4_ = fStack_3d0 * fVar240;
      auVar70._28_4_ = local_f8._28_4_;
      auVar119 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = fVar161 * local_488._4_4_;
      auVar71._0_4_ = fVar243 * local_488._0_4_;
      auVar71._8_4_ = fVar234 * local_488._8_4_;
      auVar71._12_4_ = fVar255 * local_488._12_4_;
      auVar71._16_4_ = fVar195 * local_488._16_4_;
      auVar71._20_4_ = fVar236 * local_488._20_4_;
      auVar71._24_4_ = fVar256 * local_488._24_4_;
      auVar71._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar72._4_4_ = auVar26._4_4_ * fVar238;
      auVar72._0_4_ = auVar26._0_4_ * fVar212;
      auVar72._8_4_ = auVar26._8_4_ * fVar257;
      auVar72._12_4_ = auVar26._12_4_ * fVar127;
      auVar72._16_4_ = auVar26._16_4_ * fVar242;
      auVar72._20_4_ = auVar26._20_4_ * fVar387;
      auVar72._24_4_ = auVar26._24_4_ * fVar240;
      auVar72._28_4_ = auVar25._28_4_ + fVar213;
      auVar120 = vsubps_avx(auVar71,auVar72);
      auVar23 = vminps_avx(auVar27,auVar28);
      auVar22 = vmaxps_avx(auVar27,auVar28);
      auVar24 = vminps_avx(auVar29,auVar35);
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar29,auVar35);
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar25 = vminps_avx(auVar36,auVar117);
      auVar23 = vmaxps_avx(auVar36,auVar117);
      auVar26 = vminps_avx(auVar119,auVar120);
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(auVar119,auVar120);
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar25,local_78,2);
      auVar23 = vcmpps_avx(auVar23,local_98,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar118 = vandps_avx(local_198,auVar118);
      auVar23 = auVar118 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar118 = vandps_avx(auVar22,auVar118);
        uVar81 = vmovmskps_avx(auVar118);
        if (uVar81 != 0) {
          auStack_2b8[uVar84] = uVar81 & 0xff;
          uVar4 = vmovlps_avx(local_238);
          *(undefined8 *)(afStack_1d8 + uVar84 * 2) = uVar4;
          uVar5 = vmovlps_avx(auVar360);
          auStack_58[uVar84] = uVar5;
          uVar84 = (ulong)((int)uVar84 + 1);
        }
      }
    }
LAB_00b50f82:
    do {
      do {
        do {
          do {
            _local_3e8 = auVar154;
            _local_4a8 = auVar153;
            if ((int)uVar84 == 0) {
              fVar213 = (ray->super_RayK<1>).tfar;
              auVar126._4_4_ = fVar213;
              auVar126._0_4_ = fVar213;
              auVar126._8_4_ = fVar213;
              auVar126._12_4_ = fVar213;
              auVar126._16_4_ = fVar213;
              auVar126._20_4_ = fVar213;
              auVar126._24_4_ = fVar213;
              auVar126._28_4_ = fVar213;
              auVar118 = vcmpps_avx(local_1b8,auVar126,2);
              uVar82 = vmovmskps_avx(auVar118);
              uVar83 = (ulong)((uint)uVar83 & (uint)uVar83 + 0xff & uVar82);
              auVar106 = ZEXT816(0) << 0x40;
              goto LAB_00b4fd11;
            }
            uVar85 = (int)uVar84 - 1;
            uVar86 = (ulong)uVar85;
            uVar81 = auStack_2b8[uVar86];
            fVar213 = afStack_1d8[uVar86 * 2];
            fVar243 = afStack_1d8[uVar86 * 2 + 1];
            auVar361._8_8_ = 0;
            auVar361._0_8_ = auStack_58[uVar86];
            auVar365 = ZEXT1664(auVar361);
            uVar5 = 0;
            if (uVar81 != 0) {
              for (; (uVar81 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar81 = uVar81 - 1 & uVar81;
            auStack_2b8[uVar86] = uVar81;
            if (uVar81 == 0) {
              uVar84 = (ulong)uVar85;
            }
            auVar271 = ZEXT1664(local_448);
            auVar376 = ZEXT1664(local_458);
            auVar293 = ZEXT1664(_local_468);
            auVar310 = ZEXT1664(local_338);
            auVar323 = ZEXT1664(local_358);
            auVar339 = ZEXT1664(local_368);
            auVar354 = ZEXT1664(local_378);
            fVar234 = (float)(uVar5 + 1) * 0.14285715;
            fVar161 = (1.0 - (float)uVar5 * 0.14285715) * fVar213 +
                      fVar243 * (float)uVar5 * 0.14285715;
            fVar213 = (1.0 - fVar234) * fVar213 + fVar243 * fVar234;
            fVar243 = fVar213 - fVar161;
            if (0.16666667 <= fVar243) {
              auVar106 = vinsertps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar213),0x10);
              auVar391 = ZEXT1664(auVar106);
              auVar211 = ZEXT1664(_local_348);
              goto LAB_00b5091a;
            }
            auVar106 = vshufps_avx(auVar361,auVar361,0x50);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            auVar328 = vsubps_avx(auVar134,auVar106);
            fVar234 = auVar106._0_4_;
            fVar255 = auVar106._4_4_;
            fVar195 = auVar106._8_4_;
            fVar236 = auVar106._12_4_;
            fVar256 = auVar328._0_4_;
            fVar212 = auVar328._4_4_;
            fVar238 = auVar328._8_4_;
            fVar257 = auVar328._12_4_;
            auVar172._0_4_ = fVar234 * (float)local_348._0_4_ + fVar256 * local_448._0_4_;
            auVar172._4_4_ = fVar255 * (float)local_348._4_4_ + fVar212 * local_448._4_4_;
            auVar172._8_4_ = fVar195 * fStack_340 + fVar238 * local_448._8_4_;
            auVar172._12_4_ = fVar236 * fStack_33c + fVar257 * local_448._12_4_;
            auVar221._0_4_ = local_358._0_4_ * fVar234 + local_458._0_4_ * fVar256;
            auVar221._4_4_ = local_358._4_4_ * fVar255 + local_458._4_4_ * fVar212;
            auVar221._8_4_ = local_358._8_4_ * fVar195 + local_458._8_4_ * fVar238;
            auVar221._12_4_ = local_358._12_4_ * fVar236 + local_458._12_4_ * fVar257;
            auVar245._0_4_ = local_368._0_4_ * fVar234 + fVar256 * local_468._0_4_;
            auVar245._4_4_ = local_368._4_4_ * fVar255 + fVar212 * local_468._4_4_;
            auVar245._8_4_ = local_368._8_4_ * fVar195 + fVar238 * local_468._8_4_;
            auVar245._12_4_ = local_368._12_4_ * fVar236 + fVar257 * local_468._12_4_;
            auVar103._0_4_ = local_378._0_4_ * fVar234 + local_338._0_4_ * fVar256;
            auVar103._4_4_ = local_378._4_4_ * fVar255 + local_338._4_4_ * fVar212;
            auVar103._8_4_ = local_378._8_4_ * fVar195 + local_338._8_4_ * fVar238;
            auVar103._12_4_ = local_378._12_4_ * fVar236 + local_338._12_4_ * fVar257;
            auVar158._16_16_ = auVar172;
            auVar158._0_16_ = auVar172;
            auVar193._16_16_ = auVar221;
            auVar193._0_16_ = auVar221;
            auVar233._16_16_ = auVar245;
            auVar233._0_16_ = auVar245;
            _local_4a8 = ZEXT416((uint)fVar213);
            auVar118 = ZEXT2032(CONCAT416(fVar213,ZEXT416((uint)fVar161)));
            auVar118 = vshufps_avx(auVar118,auVar118,0);
            auVar22 = vsubps_avx(auVar193,auVar158);
            fVar234 = auVar118._0_4_;
            fVar255 = auVar118._4_4_;
            fVar195 = auVar118._8_4_;
            fVar236 = auVar118._12_4_;
            fVar256 = auVar118._16_4_;
            fVar212 = auVar118._20_4_;
            fVar238 = auVar118._24_4_;
            auVar159._0_4_ = auVar172._0_4_ + auVar22._0_4_ * fVar234;
            auVar159._4_4_ = auVar172._4_4_ + auVar22._4_4_ * fVar255;
            auVar159._8_4_ = auVar172._8_4_ + auVar22._8_4_ * fVar195;
            auVar159._12_4_ = auVar172._12_4_ + auVar22._12_4_ * fVar236;
            auVar159._16_4_ = auVar172._0_4_ + auVar22._16_4_ * fVar256;
            auVar159._20_4_ = auVar172._4_4_ + auVar22._20_4_ * fVar212;
            auVar159._24_4_ = auVar172._8_4_ + auVar22._24_4_ * fVar238;
            auVar159._28_4_ = auVar172._12_4_ + auVar22._28_4_;
            auVar118 = vsubps_avx(auVar233,auVar193);
            auVar194._0_4_ = auVar221._0_4_ + auVar118._0_4_ * fVar234;
            auVar194._4_4_ = auVar221._4_4_ + auVar118._4_4_ * fVar255;
            auVar194._8_4_ = auVar221._8_4_ + auVar118._8_4_ * fVar195;
            auVar194._12_4_ = auVar221._12_4_ + auVar118._12_4_ * fVar236;
            auVar194._16_4_ = auVar221._0_4_ + auVar118._16_4_ * fVar256;
            auVar194._20_4_ = auVar221._4_4_ + auVar118._20_4_ * fVar212;
            auVar194._24_4_ = auVar221._8_4_ + auVar118._24_4_ * fVar238;
            auVar194._28_4_ = auVar221._12_4_ + auVar118._28_4_;
            auVar106 = vsubps_avx(auVar103,auVar245);
            auVar124._0_4_ = auVar245._0_4_ + auVar106._0_4_ * fVar234;
            auVar124._4_4_ = auVar245._4_4_ + auVar106._4_4_ * fVar255;
            auVar124._8_4_ = auVar245._8_4_ + auVar106._8_4_ * fVar195;
            auVar124._12_4_ = auVar245._12_4_ + auVar106._12_4_ * fVar236;
            auVar124._16_4_ = auVar245._0_4_ + auVar106._0_4_ * fVar256;
            auVar124._20_4_ = auVar245._4_4_ + auVar106._4_4_ * fVar212;
            auVar124._24_4_ = auVar245._8_4_ + auVar106._8_4_ * fVar238;
            auVar124._28_4_ = auVar245._12_4_ + auVar106._12_4_;
            auVar118 = vsubps_avx(auVar194,auVar159);
            auVar160._0_4_ = auVar159._0_4_ + fVar234 * auVar118._0_4_;
            auVar160._4_4_ = auVar159._4_4_ + fVar255 * auVar118._4_4_;
            auVar160._8_4_ = auVar159._8_4_ + fVar195 * auVar118._8_4_;
            auVar160._12_4_ = auVar159._12_4_ + fVar236 * auVar118._12_4_;
            auVar160._16_4_ = auVar159._16_4_ + fVar256 * auVar118._16_4_;
            auVar160._20_4_ = auVar159._20_4_ + fVar212 * auVar118._20_4_;
            auVar160._24_4_ = auVar159._24_4_ + fVar238 * auVar118._24_4_;
            auVar160._28_4_ = auVar159._28_4_ + auVar118._28_4_;
            auVar118 = vsubps_avx(auVar124,auVar194);
            auVar125._0_4_ = auVar194._0_4_ + fVar234 * auVar118._0_4_;
            auVar125._4_4_ = auVar194._4_4_ + fVar255 * auVar118._4_4_;
            auVar125._8_4_ = auVar194._8_4_ + fVar195 * auVar118._8_4_;
            auVar125._12_4_ = auVar194._12_4_ + fVar236 * auVar118._12_4_;
            auVar125._16_4_ = auVar194._16_4_ + fVar256 * auVar118._16_4_;
            auVar125._20_4_ = auVar194._20_4_ + fVar212 * auVar118._20_4_;
            auVar125._24_4_ = auVar194._24_4_ + fVar238 * auVar118._24_4_;
            auVar125._28_4_ = auVar194._28_4_ + auVar118._28_4_;
            auVar118 = vsubps_avx(auVar125,auVar160);
            auVar268._0_4_ = auVar160._0_4_ + fVar234 * auVar118._0_4_;
            auVar268._4_4_ = auVar160._4_4_ + fVar255 * auVar118._4_4_;
            auVar268._8_4_ = auVar160._8_4_ + fVar195 * auVar118._8_4_;
            auVar268._12_4_ = auVar160._12_4_ + fVar236 * auVar118._12_4_;
            auVar270._16_4_ = auVar160._16_4_ + fVar256 * auVar118._16_4_;
            auVar270._0_16_ = auVar268;
            auVar270._20_4_ = auVar160._20_4_ + fVar212 * auVar118._20_4_;
            auVar270._24_4_ = auVar160._24_4_ + fVar238 * auVar118._24_4_;
            auVar270._28_4_ = auVar160._28_4_ + auVar194._28_4_;
            auVar277 = auVar270._16_16_;
            auVar136 = vshufps_avx(ZEXT416((uint)(fVar243 * 0.33333334)),
                                   ZEXT416((uint)(fVar243 * 0.33333334)),0);
            auVar222._0_4_ = auVar268._0_4_ + auVar136._0_4_ * auVar118._0_4_ * 3.0;
            auVar222._4_4_ = auVar268._4_4_ + auVar136._4_4_ * auVar118._4_4_ * 3.0;
            auVar222._8_4_ = auVar268._8_4_ + auVar136._8_4_ * auVar118._8_4_ * 3.0;
            auVar222._12_4_ = auVar268._12_4_ + auVar136._12_4_ * auVar118._12_4_ * 3.0;
            auVar188 = vshufpd_avx(auVar268,auVar268,3);
            auVar148 = vshufpd_avx(auVar277,auVar277,3);
            _local_328 = auVar188;
            auVar106 = vsubps_avx(auVar188,auVar268);
            _local_488 = auVar148;
            auVar328 = vsubps_avx(auVar148,auVar277);
            auVar104._0_4_ = auVar106._0_4_ + auVar328._0_4_;
            auVar104._4_4_ = auVar106._4_4_ + auVar328._4_4_;
            auVar104._8_4_ = auVar106._8_4_ + auVar328._8_4_;
            auVar104._12_4_ = auVar106._12_4_ + auVar328._12_4_;
            auVar106 = vmovshdup_avx(auVar268);
            auVar328 = vmovshdup_avx(auVar222);
            auVar174 = vshufps_avx(auVar104,auVar104,0);
            auVar137 = vshufps_avx(auVar104,auVar104,0x55);
            fVar234 = auVar137._0_4_;
            fVar255 = auVar137._4_4_;
            fVar195 = auVar137._8_4_;
            fVar236 = auVar137._12_4_;
            fVar256 = auVar174._0_4_;
            fVar212 = auVar174._4_4_;
            fVar238 = auVar174._8_4_;
            fVar257 = auVar174._12_4_;
            auVar105._0_4_ = fVar256 * auVar268._0_4_ + auVar106._0_4_ * fVar234;
            auVar105._4_4_ = fVar212 * auVar268._4_4_ + auVar106._4_4_ * fVar255;
            auVar105._8_4_ = fVar238 * auVar268._8_4_ + auVar106._8_4_ * fVar195;
            auVar105._12_4_ = fVar257 * auVar268._12_4_ + auVar106._12_4_ * fVar236;
            _local_3e8 = auVar222;
            auVar341._0_4_ = fVar256 * auVar222._0_4_ + auVar328._0_4_ * fVar234;
            auVar341._4_4_ = fVar212 * auVar222._4_4_ + auVar328._4_4_ * fVar255;
            auVar341._8_4_ = fVar238 * auVar222._8_4_ + auVar328._8_4_ * fVar195;
            auVar341._12_4_ = fVar257 * auVar222._12_4_ + auVar328._12_4_ * fVar236;
            auVar328 = vshufps_avx(auVar105,auVar105,0xe8);
            auVar174 = vshufps_avx(auVar341,auVar341,0xe8);
            auVar106 = vcmpps_avx(auVar328,auVar174,1);
            uVar81 = vextractps_avx(auVar106,0);
            auVar137 = auVar341;
            if ((uVar81 & 1) == 0) {
              auVar137 = auVar105;
            }
            auVar135._0_4_ = auVar136._0_4_ * auVar118._16_4_ * 3.0;
            auVar135._4_4_ = auVar136._4_4_ * auVar118._20_4_ * 3.0;
            auVar135._8_4_ = auVar136._8_4_ * auVar118._24_4_ * 3.0;
            auVar135._12_4_ = auVar136._12_4_ * 0.0;
            auVar30 = vsubps_avx(auVar277,auVar135);
            auVar136 = vmovshdup_avx(auVar30);
            auVar277 = vmovshdup_avx(auVar277);
            fVar127 = auVar30._0_4_;
            fVar242 = auVar30._4_4_;
            auVar246._0_4_ = fVar127 * fVar256 + auVar136._0_4_ * fVar234;
            auVar246._4_4_ = fVar242 * fVar212 + auVar136._4_4_ * fVar255;
            auVar246._8_4_ = auVar30._8_4_ * fVar238 + auVar136._8_4_ * fVar195;
            auVar246._12_4_ = auVar30._12_4_ * fVar257 + auVar136._12_4_ * fVar236;
            auVar389._0_4_ = fVar256 * auVar270._16_4_ + auVar277._0_4_ * fVar234;
            auVar389._4_4_ = fVar212 * auVar270._20_4_ + auVar277._4_4_ * fVar255;
            auVar389._8_4_ = fVar238 * auVar270._24_4_ + auVar277._8_4_ * fVar195;
            auVar389._12_4_ = fVar257 * auVar270._28_4_ + auVar277._12_4_ * fVar236;
            auVar277 = vshufps_avx(auVar246,auVar246,0xe8);
            auVar324 = vshufps_avx(auVar389,auVar389,0xe8);
            auVar136 = vcmpps_avx(auVar277,auVar324,1);
            uVar81 = vextractps_avx(auVar136,0);
            auVar360 = auVar389;
            if ((uVar81 & 1) == 0) {
              auVar360 = auVar246;
            }
            auVar137 = vmaxss_avx(auVar360,auVar137);
            auVar328 = vminps_avx(auVar328,auVar174);
            auVar174 = vminps_avx(auVar277,auVar324);
            auVar174 = vminps_avx(auVar328,auVar174);
            auVar106 = vshufps_avx(auVar106,auVar106,0x55);
            auVar106 = vblendps_avx(auVar106,auVar136,2);
            auVar136 = vpslld_avx(auVar106,0x1f);
            auVar106 = vshufpd_avx(auVar341,auVar341,1);
            auVar106 = vinsertps_avx(auVar106,auVar389,0x9c);
            auVar328 = vshufpd_avx(auVar105,auVar105,1);
            auVar328 = vinsertps_avx(auVar328,auVar246,0x9c);
            auVar106 = vblendvps_avx(auVar328,auVar106,auVar136);
            auVar328 = vmovshdup_avx(auVar106);
            auVar106 = vmaxss_avx(auVar328,auVar106);
            fVar195 = auVar174._0_4_;
            auVar328 = vmovshdup_avx(auVar174);
            fVar255 = auVar106._0_4_;
            fVar236 = auVar328._0_4_;
            fVar234 = auVar137._0_4_;
            auVar153 = _local_4a8;
            auVar154 = _local_3e8;
            if ((fVar195 < 0.0001) && (-0.0001 < fVar255)) break;
            if ((fVar236 < 0.0001 && -0.0001 < fVar234) || (fVar195 < 0.0001 && -0.0001 < fVar234))
            break;
            auVar136 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar106,1);
            auVar328 = vcmpps_avx(auVar328,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar328 = vandps_avx(auVar328,auVar136);
          } while ((auVar328 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar136 = vcmpps_avx(auVar174,_DAT_01f45a50,1);
          auVar328 = vcmpss_avx(auVar137,ZEXT416(0) << 0x20,1);
          auVar173._8_4_ = 0x3f800000;
          auVar173._0_8_ = 0x3f8000003f800000;
          auVar173._12_4_ = 0x3f800000;
          auVar223._8_4_ = 0xbf800000;
          auVar223._0_8_ = 0xbf800000bf800000;
          auVar223._12_4_ = 0xbf800000;
          auVar328 = vblendvps_avx(auVar173,auVar223,auVar328);
          auVar136 = vblendvps_avx(auVar173,auVar223,auVar136);
          auVar174 = vcmpss_avx(auVar136,auVar328,4);
          auVar174 = vpshufd_avx(ZEXT416(auVar174._0_4_ & 1),0x50);
          auVar174 = vpslld_avx(auVar174,0x1f);
          auVar174 = vpsrad_avx(auVar174,0x1f);
          auVar174 = vpandn_avx(auVar174,_DAT_01f7afb0);
          auVar137 = vmovshdup_avx(auVar136);
          fVar256 = auVar137._0_4_;
          if ((auVar136._0_4_ != fVar256) || (NAN(auVar136._0_4_) || NAN(fVar256))) {
            if ((fVar236 != fVar195) || (NAN(fVar236) || NAN(fVar195))) {
              fVar195 = -fVar195 / (fVar236 - fVar195);
              auVar136 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar195) * 0.0 + fVar195)));
            }
            else {
              auVar136 = ZEXT816(0x3f80000000000000);
              if ((fVar195 != 0.0) || (NAN(fVar195))) {
                auVar136 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar277 = vcmpps_avx(auVar174,auVar136,1);
            auVar137 = vblendps_avx(auVar174,auVar136,2);
            auVar136 = vblendps_avx(auVar136,auVar174,2);
            auVar174 = vblendvps_avx(auVar136,auVar137,auVar277);
          }
          auVar106 = vcmpss_avx(auVar106,ZEXT416(0) << 0x20,1);
          auVar175._8_4_ = 0x3f800000;
          auVar175._0_8_ = 0x3f8000003f800000;
          auVar175._12_4_ = 0x3f800000;
          auVar224._8_4_ = 0xbf800000;
          auVar224._0_8_ = 0xbf800000bf800000;
          auVar224._12_4_ = 0xbf800000;
          auVar106 = vblendvps_avx(auVar175,auVar224,auVar106);
          fVar195 = auVar106._0_4_;
          if ((auVar328._0_4_ != fVar195) || (NAN(auVar328._0_4_) || NAN(fVar195))) {
            if ((fVar255 != fVar234) || (NAN(fVar255) || NAN(fVar234))) {
              fVar234 = -fVar234 / (fVar255 - fVar234);
              auVar106 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar234) * 0.0 + fVar234)));
            }
            else {
              auVar106 = ZEXT816(0x3f80000000000000);
              if ((fVar234 != 0.0) || (NAN(fVar234))) {
                auVar106 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar136 = vcmpps_avx(auVar174,auVar106,1);
            auVar328 = vblendps_avx(auVar174,auVar106,2);
            auVar106 = vblendps_avx(auVar106,auVar174,2);
            auVar174 = vblendvps_avx(auVar106,auVar328,auVar136);
          }
          if ((fVar256 != fVar195) || (NAN(fVar256) || NAN(fVar195))) {
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar106 = vcmpps_avx(auVar174,auVar107,1);
            auVar328 = vinsertps_avx(auVar174,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar176._4_12_ = auVar174._4_12_;
            auVar176._0_4_ = 0x3f800000;
            auVar174 = vblendvps_avx(auVar176,auVar328,auVar106);
          }
          auVar106 = vcmpps_avx(auVar174,_DAT_01f46740,1);
          auVar74._12_4_ = 0;
          auVar74._0_12_ = auVar174._4_12_;
          auVar328 = vinsertps_avx(auVar174,ZEXT416(0x3f800000),0x10);
          auVar106 = vblendvps_avx(auVar328,auVar74 << 0x20,auVar106);
          auVar328 = vmovshdup_avx(auVar106);
        } while (auVar328._0_4_ < auVar106._0_4_);
        auVar108._0_4_ = auVar106._0_4_ + -0.1;
        auVar108._4_4_ = auVar106._4_4_ + 0.1;
        auVar108._8_4_ = auVar106._8_4_ + 0.0;
        auVar108._12_4_ = auVar106._12_4_ + 0.0;
        auVar136 = vshufpd_avx(auVar222,auVar222,3);
        register0x00001388 = 0x3f80000000000000;
        local_3e8 = 0x3f80000000000000;
        auVar106 = vcmpps_avx(auVar108,_local_3e8,1);
        auVar73._12_4_ = 0;
        auVar73._0_12_ = auVar108._4_12_;
        auVar328 = vinsertps_avx(auVar108,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar106 = vblendvps_avx(auVar328,auVar73 << 0x20,auVar106);
        auVar328 = vshufpd_avx(auVar30,auVar30,3);
        auVar174 = vshufps_avx(auVar106,auVar106,0x50);
        auVar382._8_4_ = 0x3f800000;
        auVar382._0_8_ = 0x3f8000003f800000;
        auVar382._12_4_ = 0x3f800000;
        auVar137 = vsubps_avx(auVar382,auVar174);
        local_328._0_4_ = auVar188._0_4_;
        local_328._4_4_ = auVar188._4_4_;
        fStack_320 = auVar188._8_4_;
        fStack_31c = auVar188._12_4_;
        fVar234 = auVar174._0_4_;
        fVar255 = auVar174._4_4_;
        fVar195 = auVar174._8_4_;
        fVar236 = auVar174._12_4_;
        local_488._0_4_ = auVar148._0_4_;
        local_488._4_4_ = auVar148._4_4_;
        fStack_480 = auVar148._8_4_;
        fStack_47c = auVar148._12_4_;
        fVar256 = auVar137._0_4_;
        fVar212 = auVar137._4_4_;
        fVar238 = auVar137._8_4_;
        fVar257 = auVar137._12_4_;
        auVar109._0_4_ = fVar234 * (float)local_328._0_4_ + fVar256 * auVar268._0_4_;
        auVar109._4_4_ = fVar255 * (float)local_328._4_4_ + fVar212 * auVar268._4_4_;
        auVar109._8_4_ = fVar195 * fStack_320 + fVar238 * auVar268._0_4_;
        auVar109._12_4_ = fVar236 * fStack_31c + fVar257 * auVar268._4_4_;
        auVar247._0_4_ = auVar136._0_4_ * fVar234 + fVar256 * auVar222._0_4_;
        auVar247._4_4_ = auVar136._4_4_ * fVar255 + fVar212 * auVar222._4_4_;
        auVar247._8_4_ = auVar136._8_4_ * fVar195 + fVar238 * auVar222._0_4_;
        auVar247._12_4_ = auVar136._12_4_ * fVar236 + fVar257 * auVar222._4_4_;
        auVar287._0_4_ = auVar328._0_4_ * fVar234 + fVar256 * fVar127;
        auVar287._4_4_ = auVar328._4_4_ * fVar255 + fVar212 * fVar242;
        auVar287._8_4_ = auVar328._8_4_ * fVar195 + fVar238 * fVar127;
        auVar287._12_4_ = auVar328._12_4_ * fVar236 + fVar257 * fVar242;
        auVar331._0_4_ = fVar234 * (float)local_488._0_4_ + fVar256 * auVar270._16_4_;
        auVar331._4_4_ = fVar255 * (float)local_488._4_4_ + fVar212 * auVar270._20_4_;
        auVar331._8_4_ = fVar195 * fStack_480 + fVar238 * auVar270._16_4_;
        auVar331._12_4_ = fVar236 * fStack_47c + fVar257 * auVar270._20_4_;
        auVar148 = vsubps_avx(auVar382,auVar106);
        auVar328 = vmovshdup_avx(auVar361);
        auVar188 = vmovsldup_avx(auVar361);
        auVar390._0_4_ = auVar148._0_4_ * auVar188._0_4_ + auVar106._0_4_ * auVar328._0_4_;
        auVar390._4_4_ = auVar148._4_4_ * auVar188._4_4_ + auVar106._4_4_ * auVar328._4_4_;
        auVar390._8_4_ = auVar148._8_4_ * auVar188._8_4_ + auVar106._8_4_ * auVar328._8_4_;
        auVar390._12_4_ = auVar148._12_4_ * auVar188._12_4_ + auVar106._12_4_ * auVar328._12_4_;
        _local_488 = vmovshdup_avx(auVar390);
        auVar106 = vsubps_avx(auVar247,auVar109);
        auVar177._0_4_ = auVar106._0_4_ * 3.0;
        auVar177._4_4_ = auVar106._4_4_ * 3.0;
        auVar177._8_4_ = auVar106._8_4_ * 3.0;
        auVar177._12_4_ = auVar106._12_4_ * 3.0;
        auVar106 = vsubps_avx(auVar287,auVar247);
        auVar206._0_4_ = auVar106._0_4_ * 3.0;
        auVar206._4_4_ = auVar106._4_4_ * 3.0;
        auVar206._8_4_ = auVar106._8_4_ * 3.0;
        auVar206._12_4_ = auVar106._12_4_ * 3.0;
        auVar106 = vsubps_avx(auVar331,auVar287);
        auVar302._0_4_ = auVar106._0_4_ * 3.0;
        auVar302._4_4_ = auVar106._4_4_ * 3.0;
        auVar302._8_4_ = auVar106._8_4_ * 3.0;
        auVar302._12_4_ = auVar106._12_4_ * 3.0;
        auVar328 = vminps_avx(auVar206,auVar302);
        auVar106 = vmaxps_avx(auVar206,auVar302);
        auVar328 = vminps_avx(auVar177,auVar328);
        auVar106 = vmaxps_avx(auVar177,auVar106);
        auVar188 = vshufpd_avx(auVar328,auVar328,3);
        auVar148 = vshufpd_avx(auVar106,auVar106,3);
        auVar328 = vminps_avx(auVar328,auVar188);
        auVar106 = vmaxps_avx(auVar106,auVar148);
        auVar188 = vshufps_avx(ZEXT416((uint)(1.0 / fVar243)),ZEXT416((uint)(1.0 / fVar243)),0);
        auVar303._0_4_ = auVar188._0_4_ * auVar328._0_4_;
        auVar303._4_4_ = auVar188._4_4_ * auVar328._4_4_;
        auVar303._8_4_ = auVar188._8_4_ * auVar328._8_4_;
        auVar303._12_4_ = auVar188._12_4_ * auVar328._12_4_;
        auVar315._0_4_ = auVar188._0_4_ * auVar106._0_4_;
        auVar315._4_4_ = auVar188._4_4_ * auVar106._4_4_;
        auVar315._8_4_ = auVar188._8_4_ * auVar106._8_4_;
        auVar315._12_4_ = auVar188._12_4_ * auVar106._12_4_;
        auVar137 = ZEXT416((uint)(1.0 / (local_488._0_4_ - auVar390._0_4_)));
        auVar106 = vshufpd_avx(auVar109,auVar109,3);
        auVar328 = vshufpd_avx(auVar247,auVar247,3);
        auVar188 = vshufpd_avx(auVar287,auVar287,3);
        auVar148 = vshufpd_avx(auVar331,auVar331,3);
        auVar106 = vsubps_avx(auVar106,auVar109);
        auVar136 = vsubps_avx(auVar328,auVar247);
        auVar174 = vsubps_avx(auVar188,auVar287);
        auVar148 = vsubps_avx(auVar148,auVar331);
        auVar328 = vminps_avx(auVar106,auVar136);
        auVar106 = vmaxps_avx(auVar106,auVar136);
        auVar188 = vminps_avx(auVar174,auVar148);
        auVar188 = vminps_avx(auVar328,auVar188);
        auVar328 = vmaxps_avx(auVar174,auVar148);
        auVar106 = vmaxps_avx(auVar106,auVar328);
        auVar328 = vshufps_avx(auVar137,auVar137,0);
        auVar372._0_4_ = auVar328._0_4_ * auVar188._0_4_;
        auVar372._4_4_ = auVar328._4_4_ * auVar188._4_4_;
        auVar372._8_4_ = auVar328._8_4_ * auVar188._8_4_;
        auVar372._12_4_ = auVar328._12_4_ * auVar188._12_4_;
        auVar383._0_4_ = auVar328._0_4_ * auVar106._0_4_;
        auVar383._4_4_ = auVar328._4_4_ * auVar106._4_4_;
        auVar383._8_4_ = auVar328._8_4_ * auVar106._8_4_;
        auVar383._12_4_ = auVar328._12_4_ * auVar106._12_4_;
        auVar106 = vmovsldup_avx(auVar390);
        auVar332._4_12_ = auVar106._4_12_;
        auVar332._0_4_ = fVar161;
        auVar342._4_12_ = auVar390._4_12_;
        auVar342._0_4_ = fVar213;
        auVar207._0_4_ = (fVar161 + fVar213) * 0.5;
        auVar207._4_4_ = (auVar106._4_4_ + auVar390._4_4_) * 0.5;
        auVar207._8_4_ = (auVar106._8_4_ + auVar390._8_4_) * 0.5;
        auVar207._12_4_ = (auVar106._12_4_ + auVar390._12_4_) * 0.5;
        auVar106 = vshufps_avx(auVar207,auVar207,0);
        fVar234 = auVar106._0_4_;
        fVar255 = auVar106._4_4_;
        fVar195 = auVar106._8_4_;
        fVar236 = auVar106._12_4_;
        local_4c8._0_4_ = auVar355._0_4_;
        local_4c8._4_4_ = auVar355._4_4_;
        fStack_4c0 = auVar355._8_4_;
        fStack_4bc = auVar355._12_4_;
        auVar138._0_4_ = fVar234 * (float)local_1e8._0_4_ + (float)local_4c8._0_4_;
        auVar138._4_4_ = fVar255 * (float)local_1e8._4_4_ + (float)local_4c8._4_4_;
        auVar138._8_4_ = fVar195 * fStack_1e0 + fStack_4c0;
        auVar138._12_4_ = fVar236 * fStack_1dc + fStack_4bc;
        auVar178._0_4_ = fVar234 * (float)local_1f8._0_4_ + (float)local_428._0_4_;
        auVar178._4_4_ = fVar255 * (float)local_1f8._4_4_ + (float)local_428._4_4_;
        auVar178._8_4_ = fVar195 * fStack_1f0 + fStack_420;
        auVar178._12_4_ = fVar236 * fStack_1ec + fStack_41c;
        auVar248._0_4_ = fVar234 * (float)local_208._0_4_ + (float)local_438._0_4_;
        auVar248._4_4_ = fVar255 * (float)local_208._4_4_ + (float)local_438._4_4_;
        auVar248._8_4_ = fVar195 * fStack_200 + fStack_430;
        auVar248._12_4_ = fVar236 * fStack_1fc + fStack_42c;
        auVar106 = vsubps_avx(auVar178,auVar138);
        auVar139._0_4_ = auVar138._0_4_ + fVar234 * auVar106._0_4_;
        auVar139._4_4_ = auVar138._4_4_ + fVar255 * auVar106._4_4_;
        auVar139._8_4_ = auVar138._8_4_ + fVar195 * auVar106._8_4_;
        auVar139._12_4_ = auVar138._12_4_ + fVar236 * auVar106._12_4_;
        auVar106 = vsubps_avx(auVar248,auVar178);
        auVar179._0_4_ = auVar178._0_4_ + fVar234 * auVar106._0_4_;
        auVar179._4_4_ = auVar178._4_4_ + fVar255 * auVar106._4_4_;
        auVar179._8_4_ = auVar178._8_4_ + fVar195 * auVar106._8_4_;
        auVar179._12_4_ = auVar178._12_4_ + fVar236 * auVar106._12_4_;
        auVar106 = vsubps_avx(auVar179,auVar139);
        fVar234 = auVar139._0_4_ + fVar234 * auVar106._0_4_;
        fVar255 = auVar139._4_4_ + fVar255 * auVar106._4_4_;
        auVar110._0_8_ = CONCAT44(fVar255,fVar234);
        auVar110._8_4_ = auVar139._8_4_ + fVar195 * auVar106._8_4_;
        auVar110._12_4_ = auVar139._12_4_ + fVar236 * auVar106._12_4_;
        fVar195 = auVar106._0_4_ * 3.0;
        fVar236 = auVar106._4_4_ * 3.0;
        auVar140._0_8_ = CONCAT44(fVar236,fVar195);
        auVar140._8_4_ = auVar106._8_4_ * 3.0;
        auVar140._12_4_ = auVar106._12_4_ * 3.0;
        auVar180._8_8_ = auVar110._0_8_;
        auVar180._0_8_ = auVar110._0_8_;
        auVar106 = vshufpd_avx(auVar110,auVar110,3);
        auVar328 = vshufps_avx(auVar207,auVar207,0x55);
        auVar174 = vsubps_avx(auVar106,auVar180);
        auVar362._0_4_ = auVar174._0_4_ * auVar328._0_4_ + fVar234;
        auVar362._4_4_ = auVar174._4_4_ * auVar328._4_4_ + fVar255;
        auVar362._8_4_ = auVar174._8_4_ * auVar328._8_4_ + fVar234;
        auVar362._12_4_ = auVar174._12_4_ * auVar328._12_4_ + fVar255;
        auVar181._8_8_ = auVar140._0_8_;
        auVar181._0_8_ = auVar140._0_8_;
        auVar106 = vshufpd_avx(auVar140,auVar140,1);
        auVar106 = vsubps_avx(auVar106,auVar181);
        auVar141._0_4_ = auVar106._0_4_ * auVar328._0_4_ + fVar195;
        auVar141._4_4_ = auVar106._4_4_ * auVar328._4_4_ + fVar236;
        auVar141._8_4_ = auVar106._8_4_ * auVar328._8_4_ + fVar195;
        auVar141._12_4_ = auVar106._12_4_ * auVar328._12_4_ + fVar236;
        auVar328 = vmovshdup_avx(auVar141);
        auVar249._0_8_ = auVar328._0_8_ ^ 0x8000000080000000;
        auVar249._8_4_ = auVar328._8_4_ ^ 0x80000000;
        auVar249._12_4_ = auVar328._12_4_ ^ 0x80000000;
        auVar188 = vmovshdup_avx(auVar174);
        auVar106 = vunpcklps_avx(auVar188,auVar249);
        auVar148 = vshufps_avx(auVar106,auVar249,4);
        auVar111._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
        auVar111._8_4_ = -auVar174._8_4_;
        auVar111._12_4_ = -auVar174._12_4_;
        auVar106 = vmovlhps_avx(auVar111,auVar141);
        auVar136 = vshufps_avx(auVar106,auVar141,8);
        auVar106 = ZEXT416((uint)(auVar141._0_4_ * auVar188._0_4_ - auVar174._0_4_ * auVar328._0_4_)
                          );
        auVar328 = vshufps_avx(auVar106,auVar106,0);
        auVar106 = vdivps_avx(auVar148,auVar328);
        auVar328 = vdivps_avx(auVar136,auVar328);
        auVar136 = vinsertps_avx(auVar303,auVar372,0x1c);
        auVar174 = vinsertps_avx(auVar315,auVar383,0x1c);
        auVar137 = vinsertps_avx(auVar372,auVar303,0x4c);
        auVar277 = vinsertps_avx(auVar383,auVar315,0x4c);
        auVar188 = vmovsldup_avx(auVar106);
        auVar182._0_4_ = auVar188._0_4_ * auVar136._0_4_;
        auVar182._4_4_ = auVar188._4_4_ * auVar136._4_4_;
        auVar182._8_4_ = auVar188._8_4_ * auVar136._8_4_;
        auVar182._12_4_ = auVar188._12_4_ * auVar136._12_4_;
        auVar142._0_4_ = auVar174._0_4_ * auVar188._0_4_;
        auVar142._4_4_ = auVar174._4_4_ * auVar188._4_4_;
        auVar142._8_4_ = auVar174._8_4_ * auVar188._8_4_;
        auVar142._12_4_ = auVar174._12_4_ * auVar188._12_4_;
        auVar148 = vminps_avx(auVar182,auVar142);
        auVar188 = vmaxps_avx(auVar142,auVar182);
        auVar324 = vmovsldup_avx(auVar328);
        auVar384._0_4_ = auVar137._0_4_ * auVar324._0_4_;
        auVar384._4_4_ = auVar137._4_4_ * auVar324._4_4_;
        auVar384._8_4_ = auVar137._8_4_ * auVar324._8_4_;
        auVar384._12_4_ = auVar137._12_4_ * auVar324._12_4_;
        auVar183._0_4_ = auVar277._0_4_ * auVar324._0_4_;
        auVar183._4_4_ = auVar277._4_4_ * auVar324._4_4_;
        auVar183._8_4_ = auVar277._8_4_ * auVar324._8_4_;
        auVar183._12_4_ = auVar277._12_4_ * auVar324._12_4_;
        auVar324 = vminps_avx(auVar384,auVar183);
        auVar225._0_4_ = auVar148._0_4_ + auVar324._0_4_;
        auVar225._4_4_ = auVar148._4_4_ + auVar324._4_4_;
        auVar225._8_4_ = auVar148._8_4_ + auVar324._8_4_;
        auVar225._12_4_ = auVar148._12_4_ + auVar324._12_4_;
        auVar148 = vmaxps_avx(auVar183,auVar384);
        auVar324 = vsubps_avx(auVar332,auVar207);
        auVar30 = vsubps_avx(auVar342,auVar207);
        auVar143._0_4_ = auVar188._0_4_ + auVar148._0_4_;
        auVar143._4_4_ = auVar188._4_4_ + auVar148._4_4_;
        auVar143._8_4_ = auVar188._8_4_ + auVar148._8_4_;
        auVar143._12_4_ = auVar188._12_4_ + auVar148._12_4_;
        auVar184._8_8_ = 0x3f800000;
        auVar184._0_8_ = 0x3f800000;
        auVar188 = vsubps_avx(auVar184,auVar143);
        auVar148 = vsubps_avx(auVar184,auVar225);
        fVar238 = auVar324._0_4_;
        auVar226._0_4_ = fVar238 * auVar188._0_4_;
        fVar257 = auVar324._4_4_;
        auVar226._4_4_ = fVar257 * auVar188._4_4_;
        fVar127 = auVar324._8_4_;
        auVar226._8_4_ = fVar127 * auVar188._8_4_;
        fVar242 = auVar324._12_4_;
        auVar226._12_4_ = fVar242 * auVar188._12_4_;
        fVar195 = auVar30._0_4_;
        auVar144._0_4_ = fVar195 * auVar188._0_4_;
        fVar236 = auVar30._4_4_;
        auVar144._4_4_ = fVar236 * auVar188._4_4_;
        fVar256 = auVar30._8_4_;
        auVar144._8_4_ = fVar256 * auVar188._8_4_;
        fVar212 = auVar30._12_4_;
        auVar144._12_4_ = fVar212 * auVar188._12_4_;
        auVar343._0_4_ = fVar238 * auVar148._0_4_;
        auVar343._4_4_ = fVar257 * auVar148._4_4_;
        auVar343._8_4_ = fVar127 * auVar148._8_4_;
        auVar343._12_4_ = fVar242 * auVar148._12_4_;
        auVar185._0_4_ = fVar195 * auVar148._0_4_;
        auVar185._4_4_ = fVar236 * auVar148._4_4_;
        auVar185._8_4_ = fVar256 * auVar148._8_4_;
        auVar185._12_4_ = fVar212 * auVar148._12_4_;
        auVar188 = vminps_avx(auVar226,auVar343);
        auVar148 = vminps_avx(auVar144,auVar185);
        auVar324 = vminps_avx(auVar188,auVar148);
        auVar188 = vmaxps_avx(auVar343,auVar226);
        auVar148 = vmaxps_avx(auVar185,auVar144);
        auVar30 = vshufps_avx(auVar207,auVar207,0x54);
        auVar148 = vmaxps_avx(auVar148,auVar188);
        auVar360 = vshufps_avx(auVar362,auVar362,0);
        auVar31 = vshufps_avx(auVar362,auVar362,0x55);
        auVar188 = vhaddps_avx(auVar324,auVar324);
        auVar148 = vhaddps_avx(auVar148,auVar148);
        auVar208._0_4_ = auVar360._0_4_ * auVar106._0_4_ + auVar31._0_4_ * auVar328._0_4_;
        auVar208._4_4_ = auVar360._4_4_ * auVar106._4_4_ + auVar31._4_4_ * auVar328._4_4_;
        auVar208._8_4_ = auVar360._8_4_ * auVar106._8_4_ + auVar31._8_4_ * auVar328._8_4_;
        auVar208._12_4_ = auVar360._12_4_ * auVar106._12_4_ + auVar31._12_4_ * auVar328._12_4_;
        auVar324 = vsubps_avx(auVar30,auVar208);
        fVar234 = auVar324._0_4_ + auVar188._0_4_;
        fVar255 = auVar324._0_4_ + auVar148._0_4_;
        auVar188 = vmaxss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar234));
        auVar148 = vminss_avx(ZEXT416((uint)fVar255),ZEXT416((uint)fVar213));
        auVar154 = _local_3e8;
      } while (auVar148._0_4_ < auVar188._0_4_);
      auVar188 = vmovshdup_avx(auVar106);
      auVar112._0_4_ = auVar188._0_4_ * auVar136._0_4_;
      auVar112._4_4_ = auVar188._4_4_ * auVar136._4_4_;
      auVar112._8_4_ = auVar188._8_4_ * auVar136._8_4_;
      auVar112._12_4_ = auVar188._12_4_ * auVar136._12_4_;
      auVar145._0_4_ = auVar174._0_4_ * auVar188._0_4_;
      auVar145._4_4_ = auVar174._4_4_ * auVar188._4_4_;
      auVar145._8_4_ = auVar174._8_4_ * auVar188._8_4_;
      auVar145._12_4_ = auVar174._12_4_ * auVar188._12_4_;
      auVar148 = vminps_avx(auVar112,auVar145);
      auVar188 = vmaxps_avx(auVar145,auVar112);
      auVar136 = vmovshdup_avx(auVar328);
      auVar227._0_4_ = auVar137._0_4_ * auVar136._0_4_;
      auVar227._4_4_ = auVar137._4_4_ * auVar136._4_4_;
      auVar227._8_4_ = auVar137._8_4_ * auVar136._8_4_;
      auVar227._12_4_ = auVar137._12_4_ * auVar136._12_4_;
      auVar146._0_4_ = auVar277._0_4_ * auVar136._0_4_;
      auVar146._4_4_ = auVar277._4_4_ * auVar136._4_4_;
      auVar146._8_4_ = auVar277._8_4_ * auVar136._8_4_;
      auVar146._12_4_ = auVar277._12_4_ * auVar136._12_4_;
      auVar136 = vminps_avx(auVar227,auVar146);
      auVar186._0_4_ = auVar148._0_4_ + auVar136._0_4_;
      auVar186._4_4_ = auVar148._4_4_ + auVar136._4_4_;
      auVar186._8_4_ = auVar148._8_4_ + auVar136._8_4_;
      auVar186._12_4_ = auVar148._12_4_ + auVar136._12_4_;
      auVar148 = vmaxps_avx(auVar146,auVar227);
      auVar113._0_4_ = auVar188._0_4_ + auVar148._0_4_;
      auVar113._4_4_ = auVar188._4_4_ + auVar148._4_4_;
      auVar113._8_4_ = auVar188._8_4_ + auVar148._8_4_;
      auVar113._12_4_ = auVar188._12_4_ + auVar148._12_4_;
      auVar188 = vsubps_avx(_local_3e8,auVar113);
      auVar148 = vsubps_avx(_local_3e8,auVar186);
      auVar187._0_4_ = fVar238 * auVar188._0_4_;
      auVar187._4_4_ = fVar257 * auVar188._4_4_;
      auVar187._8_4_ = fVar127 * auVar188._8_4_;
      auVar187._12_4_ = fVar242 * auVar188._12_4_;
      auVar228._0_4_ = fVar238 * auVar148._0_4_;
      auVar228._4_4_ = fVar257 * auVar148._4_4_;
      auVar228._8_4_ = fVar127 * auVar148._8_4_;
      auVar228._12_4_ = fVar242 * auVar148._12_4_;
      auVar114._0_4_ = fVar195 * auVar188._0_4_;
      auVar114._4_4_ = fVar236 * auVar188._4_4_;
      auVar114._8_4_ = fVar256 * auVar188._8_4_;
      auVar114._12_4_ = fVar212 * auVar188._12_4_;
      auVar147._0_4_ = fVar195 * auVar148._0_4_;
      auVar147._4_4_ = fVar236 * auVar148._4_4_;
      auVar147._8_4_ = fVar256 * auVar148._8_4_;
      auVar147._12_4_ = fVar212 * auVar148._12_4_;
      auVar188 = vminps_avx(auVar187,auVar228);
      auVar148 = vminps_avx(auVar114,auVar147);
      auVar188 = vminps_avx(auVar188,auVar148);
      auVar148 = vmaxps_avx(auVar228,auVar187);
      auVar136 = vmaxps_avx(auVar147,auVar114);
      auVar188 = vhaddps_avx(auVar188,auVar188);
      auVar148 = vmaxps_avx(auVar136,auVar148);
      auVar148 = vhaddps_avx(auVar148,auVar148);
      auVar136 = vmovshdup_avx(auVar324);
      auVar174 = ZEXT416((uint)(auVar136._0_4_ + auVar188._0_4_));
      auVar188 = vmaxss_avx(auVar390,auVar174);
      auVar136 = ZEXT416((uint)(auVar136._0_4_ + auVar148._0_4_));
      auVar148 = vminss_avx(auVar136,_local_488);
    } while (auVar148._0_4_ < auVar188._0_4_);
    bVar87 = 0;
    if ((fVar161 < fVar234) && (fVar255 < fVar213)) {
      auVar188 = vcmpps_avx(auVar136,_local_488,1);
      auVar148 = vcmpps_avx(auVar390,auVar174,1);
      auVar188 = vandps_avx(auVar148,auVar188);
      bVar87 = auVar188[0];
    }
    auVar316._8_4_ = 0x7fffffff;
    auVar316._0_8_ = 0x7fffffff7fffffff;
    auVar316._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar84 || fVar243 < 0.001) || (bVar87 & 1) != 0) {
      lVar90 = 0xc9;
      do {
        lVar90 = lVar90 + -1;
        if (lVar90 == 0) goto LAB_00b50f82;
        fVar243 = auVar324._0_4_;
        fVar213 = 1.0 - fVar243;
        auVar188 = ZEXT416((uint)(fVar213 * fVar213 * fVar213));
        auVar188 = vshufps_avx(auVar188,auVar188,0);
        auVar148 = ZEXT416((uint)(fVar243 * 3.0 * fVar213 * fVar213));
        auVar148 = vshufps_avx(auVar148,auVar148,0);
        auVar136 = ZEXT416((uint)(fVar213 * fVar243 * fVar243 * 3.0));
        auVar136 = vshufps_avx(auVar136,auVar136,0);
        auVar174 = ZEXT416((uint)(fVar243 * fVar243 * fVar243));
        auVar174 = vshufps_avx(auVar174,auVar174,0);
        fVar213 = (float)local_4c8._0_4_ * auVar188._0_4_ +
                  (float)local_428._0_4_ * auVar148._0_4_ +
                  (float)local_218._0_4_ * auVar174._0_4_ + (float)local_438._0_4_ * auVar136._0_4_;
        fVar243 = (float)local_4c8._4_4_ * auVar188._4_4_ +
                  (float)local_428._4_4_ * auVar148._4_4_ +
                  (float)local_218._4_4_ * auVar174._4_4_ + (float)local_438._4_4_ * auVar136._4_4_;
        auVar115._0_8_ = CONCAT44(fVar243,fVar213);
        auVar115._8_4_ =
             fStack_4c0 * auVar188._8_4_ +
             fStack_420 * auVar148._8_4_ + fStack_210 * auVar174._8_4_ + fStack_430 * auVar136._8_4_
        ;
        auVar115._12_4_ =
             fStack_4bc * auVar188._12_4_ +
             fStack_41c * auVar148._12_4_ +
             fStack_20c * auVar174._12_4_ + fStack_42c * auVar136._12_4_;
        auVar149._8_8_ = auVar115._0_8_;
        auVar149._0_8_ = auVar115._0_8_;
        auVar148 = vshufpd_avx(auVar115,auVar115,1);
        auVar188 = vmovshdup_avx(auVar324);
        auVar148 = vsubps_avx(auVar148,auVar149);
        auVar116._0_4_ = auVar188._0_4_ * auVar148._0_4_ + fVar213;
        auVar116._4_4_ = auVar188._4_4_ * auVar148._4_4_ + fVar243;
        auVar116._8_4_ = auVar188._8_4_ * auVar148._8_4_ + fVar213;
        auVar116._12_4_ = auVar188._12_4_ * auVar148._12_4_ + fVar243;
        auVar188 = vshufps_avx(auVar116,auVar116,0);
        auVar148 = vshufps_avx(auVar116,auVar116,0x55);
        auVar150._0_4_ = auVar106._0_4_ * auVar188._0_4_ + auVar328._0_4_ * auVar148._0_4_;
        auVar150._4_4_ = auVar106._4_4_ * auVar188._4_4_ + auVar328._4_4_ * auVar148._4_4_;
        auVar150._8_4_ = auVar106._8_4_ * auVar188._8_4_ + auVar328._8_4_ * auVar148._8_4_;
        auVar150._12_4_ = auVar106._12_4_ * auVar188._12_4_ + auVar328._12_4_ * auVar148._12_4_;
        auVar324 = vsubps_avx(auVar324,auVar150);
        auVar188 = vandps_avx(auVar316,auVar116);
        auVar148 = vshufps_avx(auVar188,auVar188,0xf5);
        auVar188 = vmaxss_avx(auVar148,auVar188);
      } while ((float)local_228._0_4_ <= auVar188._0_4_);
      fVar213 = auVar324._0_4_;
      if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
        auVar106 = vmovshdup_avx(auVar324);
        fVar243 = auVar106._0_4_;
        if ((0.0 <= fVar243) && (fVar243 <= 1.0)) {
          auVar106 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                   ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
          auVar277 = vinsertps_avx(auVar106,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28)
          ;
          aVar6 = (ray->super_RayK<1>).org.field_0;
          auVar106 = vsubps_avx(_local_388,(undefined1  [16])aVar6);
          auVar106 = vdpps_avx(auVar106,auVar277,0x7f);
          auVar80._4_4_ = fStack_3f4;
          auVar80._0_4_ = local_3f8;
          auVar80._8_4_ = fStack_3f0;
          auVar80._12_4_ = fStack_3ec;
          auVar328 = vsubps_avx(auVar80,(undefined1  [16])aVar6);
          auVar328 = vdpps_avx(auVar328,auVar277,0x7f);
          auVar188 = vsubps_avx(_local_398,(undefined1  [16])aVar6);
          auVar188 = vdpps_avx(auVar188,auVar277,0x7f);
          auVar77._4_4_ = fStack_404;
          auVar77._0_4_ = local_408;
          auVar77._8_4_ = fStack_400;
          auVar77._12_4_ = fStack_3fc;
          auVar148 = vsubps_avx(auVar77,(undefined1  [16])aVar6);
          auVar148 = vdpps_avx(auVar148,auVar277,0x7f);
          auVar136 = vsubps_avx(_local_3a8,(undefined1  [16])aVar6);
          auVar136 = vdpps_avx(auVar136,auVar277,0x7f);
          auVar174 = vsubps_avx(_local_3b8,(undefined1  [16])aVar6);
          auVar174 = vdpps_avx(auVar174,auVar277,0x7f);
          auVar137 = vsubps_avx(_local_2c8,(undefined1  [16])aVar6);
          auVar137 = vdpps_avx(auVar137,auVar277,0x7f);
          auVar30 = vsubps_avx(_local_3c8,(undefined1  [16])aVar6);
          auVar277 = vdpps_avx(auVar30,auVar277,0x7f);
          fVar236 = 1.0 - fVar243;
          fVar256 = 1.0 - fVar213;
          fVar161 = auVar324._4_4_;
          fVar234 = auVar324._8_4_;
          fVar255 = auVar324._12_4_;
          fVar195 = fVar256 * fVar213 * fVar213 * 3.0;
          auVar250._0_4_ = fVar213 * fVar213 * fVar213;
          auVar250._4_4_ = fVar161 * fVar161 * fVar161;
          auVar250._8_4_ = fVar234 * fVar234 * fVar234;
          auVar250._12_4_ = fVar255 * fVar255 * fVar255;
          fVar161 = fVar213 * 3.0 * fVar256 * fVar256;
          fVar234 = fVar256 * fVar256 * fVar256;
          fVar213 = (fVar236 * auVar106._0_4_ + auVar136._0_4_ * fVar243) * fVar234 +
                    fVar161 * (auVar174._0_4_ * fVar243 + fVar236 * auVar328._0_4_) +
                    fVar195 * (auVar137._0_4_ * fVar243 + fVar236 * auVar188._0_4_) +
                    auVar250._0_4_ * (fVar236 * auVar148._0_4_ + fVar243 * auVar277._0_4_);
          if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar213) &&
              (fVar243 = (ray->super_RayK<1>).tfar, fVar213 <= fVar243)) &&
             (pGVar16 = (context->scene->geometries).items[uVar82].ptr,
             (pGVar16->mask & (ray->super_RayK<1>).mask) != 0)) {
            auVar106 = vshufps_avx(auVar324,auVar324,0x55);
            auVar304._8_4_ = 0x3f800000;
            auVar304._0_8_ = 0x3f8000003f800000;
            auVar304._12_4_ = 0x3f800000;
            auVar328 = vsubps_avx(auVar304,auVar106);
            fVar255 = auVar106._0_4_;
            fVar236 = auVar106._4_4_;
            fVar212 = auVar106._8_4_;
            fVar238 = auVar106._12_4_;
            fVar257 = auVar328._0_4_;
            fVar127 = auVar328._4_4_;
            fVar242 = auVar328._8_4_;
            fVar387 = auVar328._12_4_;
            auVar317._0_4_ = fVar255 * (float)local_3a8._0_4_ + fVar257 * (float)local_388._0_4_;
            auVar317._4_4_ = fVar236 * (float)local_3a8._4_4_ + fVar127 * (float)local_388._4_4_;
            auVar317._8_4_ = fVar212 * fStack_3a0 + fVar242 * fStack_380;
            auVar317._12_4_ = fVar238 * fStack_39c + fVar387 * fStack_37c;
            auVar333._0_4_ = fVar255 * (float)local_3b8._0_4_ + fVar257 * local_3f8;
            auVar333._4_4_ = fVar236 * (float)local_3b8._4_4_ + fVar127 * fStack_3f4;
            auVar333._8_4_ = fVar212 * fStack_3b0 + fVar242 * fStack_3f0;
            auVar333._12_4_ = fVar238 * fStack_3ac + fVar387 * fStack_3ec;
            auVar344._0_4_ = fVar255 * (float)local_2c8._0_4_ + fVar257 * (float)local_398._0_4_;
            auVar344._4_4_ = fVar236 * (float)local_2c8._4_4_ + fVar127 * (float)local_398._4_4_;
            auVar344._8_4_ = fVar212 * fStack_2c0 + fVar242 * fStack_390;
            auVar344._12_4_ = fVar238 * fStack_2bc + fVar387 * fStack_38c;
            auVar288._0_4_ = fVar257 * local_408 + fVar255 * (float)local_3c8._0_4_;
            auVar288._4_4_ = fVar127 * fStack_404 + fVar236 * (float)local_3c8._4_4_;
            auVar288._8_4_ = fVar242 * fStack_400 + fVar212 * fStack_3c0;
            auVar288._12_4_ = fVar387 * fStack_3fc + fVar238 * fStack_3bc;
            auVar148 = vsubps_avx(auVar333,auVar317);
            auVar136 = vsubps_avx(auVar344,auVar333);
            auVar174 = vsubps_avx(auVar288,auVar344);
            auVar106 = vshufps_avx(auVar324,auVar324,0);
            fVar238 = auVar106._0_4_;
            fVar257 = auVar106._4_4_;
            fVar127 = auVar106._8_4_;
            fVar242 = auVar106._12_4_;
            auVar106 = vshufps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar256),0);
            fVar255 = auVar106._0_4_;
            fVar236 = auVar106._4_4_;
            fVar256 = auVar106._8_4_;
            fVar212 = auVar106._12_4_;
            auVar106 = vshufps_avx(auVar250,auVar250,0);
            auVar328 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
            auVar188 = vshufps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),0);
            auVar229._0_4_ =
                 ((auVar148._0_4_ * fVar255 + fVar238 * auVar136._0_4_) * fVar255 +
                 fVar238 * (auVar136._0_4_ * fVar255 + fVar238 * auVar174._0_4_)) * 3.0;
            auVar229._4_4_ =
                 ((auVar148._4_4_ * fVar236 + fVar257 * auVar136._4_4_) * fVar236 +
                 fVar257 * (auVar136._4_4_ * fVar236 + fVar257 * auVar174._4_4_)) * 3.0;
            auVar229._8_4_ =
                 ((auVar148._8_4_ * fVar256 + fVar127 * auVar136._8_4_) * fVar256 +
                 fVar127 * (auVar136._8_4_ * fVar256 + fVar127 * auVar174._8_4_)) * 3.0;
            auVar229._12_4_ =
                 ((auVar148._12_4_ * fVar212 + fVar242 * auVar136._12_4_) * fVar212 +
                 fVar242 * (auVar136._12_4_ * fVar212 + fVar242 * auVar174._12_4_)) * 3.0;
            auVar148 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
            auVar151._0_4_ =
                 auVar148._0_4_ * (float)local_248._0_4_ +
                 auVar188._0_4_ * (float)local_258._0_4_ +
                 auVar106._0_4_ * (float)local_278._0_4_ + auVar328._0_4_ * (float)local_268._0_4_;
            auVar151._4_4_ =
                 auVar148._4_4_ * (float)local_248._4_4_ +
                 auVar188._4_4_ * (float)local_258._4_4_ +
                 auVar106._4_4_ * (float)local_278._4_4_ + auVar328._4_4_ * (float)local_268._4_4_;
            auVar151._8_4_ =
                 auVar148._8_4_ * fStack_240 +
                 auVar188._8_4_ * fStack_250 +
                 auVar106._8_4_ * fStack_270 + auVar328._8_4_ * fStack_260;
            auVar151._12_4_ =
                 auVar148._12_4_ * fStack_23c +
                 auVar188._12_4_ * fStack_24c +
                 auVar106._12_4_ * fStack_26c + auVar328._12_4_ * fStack_25c;
            auVar106 = vshufps_avx(auVar229,auVar229,0xc9);
            auVar189._0_4_ = auVar151._0_4_ * auVar106._0_4_;
            auVar189._4_4_ = auVar151._4_4_ * auVar106._4_4_;
            auVar189._8_4_ = auVar151._8_4_ * auVar106._8_4_;
            auVar189._12_4_ = auVar151._12_4_ * auVar106._12_4_;
            auVar106 = vshufps_avx(auVar151,auVar151,0xc9);
            auVar152._0_4_ = auVar229._0_4_ * auVar106._0_4_;
            auVar152._4_4_ = auVar229._4_4_ * auVar106._4_4_;
            auVar152._8_4_ = auVar229._8_4_ * auVar106._8_4_;
            auVar152._12_4_ = auVar229._12_4_ * auVar106._12_4_;
            auVar328 = vsubps_avx(auVar152,auVar189);
            auVar106 = vshufps_avx(auVar328,auVar328,0xe9);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar16->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_2a8 = vmovlps_avx(auVar106);
              local_2a0 = auVar328._0_4_;
              local_29c = vmovlps_avx(auVar324);
              local_294 = (uint)local_410;
              local_290 = uVar82;
              local_28c = context->user->instID[0];
              local_288 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = fVar213;
              local_4ac = -1;
              local_2f8.valid = &local_4ac;
              local_2f8.geometryUserPtr = pGVar16->userPtr;
              local_2f8.context = context->user;
              local_2f8.ray = (RTCRayN *)ray;
              local_2f8.hit = (RTCHitN *)&local_2a8;
              local_2f8.N = 1;
              if ((pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar16->intersectionFilterN)(&local_2f8), *local_2f8.valid != 0)) {
                p_Var21 = context->args->filter;
                if ((p_Var21 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar16->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var21)(&local_2f8), *local_2f8.valid != 0)))) {
                  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).components[0] =
                       *(float *)local_2f8.hit;
                  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2f8.hit + 4);
                  (((Vec3f *)((long)local_2f8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2f8.hit + 8);
                  *(float *)((long)local_2f8.ray + 0x3c) = *(float *)(local_2f8.hit + 0xc);
                  *(float *)((long)local_2f8.ray + 0x40) = *(float *)(local_2f8.hit + 0x10);
                  *(float *)((long)local_2f8.ray + 0x44) = *(float *)(local_2f8.hit + 0x14);
                  *(float *)((long)local_2f8.ray + 0x48) = *(float *)(local_2f8.hit + 0x18);
                  *(float *)((long)local_2f8.ray + 0x4c) = *(float *)(local_2f8.hit + 0x1c);
                  *(float *)((long)local_2f8.ray + 0x50) = *(float *)(local_2f8.hit + 0x20);
                  auVar153 = _local_4a8;
                  auVar154 = _local_3e8;
                  goto LAB_00b50f82;
                }
              }
              (ray->super_RayK<1>).tfar = fVar243;
              auVar153 = _local_4a8;
              auVar154 = _local_3e8;
              goto LAB_00b50f82;
            }
            (ray->super_RayK<1>).tfar = fVar213;
            uVar4 = vmovlps_avx(auVar106);
            *(undefined8 *)&(ray->Ng).field_0 = uVar4;
            (ray->Ng).field_0.field_0.z = auVar328._0_4_;
            uVar4 = vmovlps_avx(auVar324);
            ray->u = (float)(int)uVar4;
            ray->v = (float)(int)((ulong)uVar4 >> 0x20);
            ray->primID = (uint)local_410;
            ray->geomID = uVar82;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_00b50f82;
    }
    auVar106 = vinsertps_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar213),0x10);
    auVar391 = ZEXT1664(auVar106);
    auVar271 = ZEXT1664(local_448);
    auVar376 = ZEXT1664(local_458);
    auVar293 = ZEXT1664(_local_468);
    auVar310 = ZEXT1664(local_338);
    auVar211 = ZEXT1664(_local_348);
    auVar323 = ZEXT1664(local_358);
    auVar339 = ZEXT1664(local_368);
    auVar354 = ZEXT1664(local_378);
    auVar365 = ZEXT1664(auVar390);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }